

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_14_dual_sse2
               (uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0,uchar *_blimit1,
               uchar *_limit1,uchar *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong *puVar18;
  ulong *puVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined6 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined4 uVar28;
  undefined6 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined4 uVar42;
  undefined6 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined4 uVar49;
  undefined6 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined4 uVar55;
  undefined6 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar139;
  short sVar140;
  short sVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  byte bVar150;
  short sVar151;
  byte bVar155;
  short sVar156;
  byte bVar160;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  ushort uVar152;
  ushort uVar153;
  ushort uVar157;
  ushort uVar158;
  short sVar161;
  ushort uVar162;
  ushort uVar163;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  byte bVar165;
  short sVar166;
  short sVar167;
  ushort uVar168;
  ushort uVar169;
  byte bVar172;
  short sVar173;
  byte bVar177;
  short sVar178;
  byte bVar182;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar147 [16];
  ulong uVar145;
  ulong uVar146;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  byte bVar149;
  byte bVar154;
  byte bVar159;
  byte bVar164;
  ulong uVar170;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar171;
  byte bVar176;
  byte bVar181;
  byte bVar186;
  undefined1 auVar148 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  ushort uVar174;
  ushort uVar175;
  ushort uVar179;
  ushort uVar180;
  short sVar183;
  ushort uVar184;
  ushort uVar185;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  __m128i alVar187;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i q3p3;
  __m128i q4p4;
  __m128i q5p5;
  __m128i q6p6;
  __m128i res_q;
  __m128i res_p;
  __m128i sum_q3;
  __m128i sum_p3;
  __m128i sum_q6;
  __m128i sum_p6;
  __m128i pixetFilter_q2q1q0;
  __m128i pixetFilter_p2p1p0;
  __m128i pixelFilter_q;
  __m128i pixelFilter_p;
  __m128i q0_16;
  __m128i q1_16;
  __m128i q2_16;
  __m128i q3_16;
  __m128i q4_16;
  __m128i q5_16;
  __m128i q6_16;
  __m128i p0_16;
  __m128i p1_16;
  __m128i p2_16;
  __m128i p3_16;
  __m128i p4_16;
  __m128i p5_16;
  __m128i p6_16;
  __m128i four;
  __m128i eight;
  __m128i work;
  __m128i flat_q0p0;
  __m128i flat_q1p1;
  __m128i flat_q2p2;
  __m128i flat2_q0p0;
  __m128i flat2_q1p1;
  __m128i flat2_q2p2;
  __m128i flat2_q3p3;
  __m128i flat2_q4p4;
  __m128i flat2_q5p5;
  __m128i work_1;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i abs_p1p0;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i qs1ps1;
  __m128i qs0ps0;
  __m128i flat2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i one;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_2;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  undefined1 local_28c8 [16];
  undefined1 local_28b8 [16];
  undefined1 local_28a8 [16];
  ulong local_2898;
  undefined8 uStack_2890;
  ulong local_2888;
  undefined8 uStack_2880;
  ulong local_2878;
  undefined8 uStack_2870;
  ulong local_2868;
  undefined8 uStack_2860;
  ulong local_2858;
  undefined8 uStack_2850;
  ulong local_2848;
  undefined8 uStack_2840;
  undefined8 local_2838;
  undefined8 uStack_2830;
  int local_2804;
  undefined8 *local_2800;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 *local_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 *local_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  undefined8 *local_2740;
  ulong local_2738;
  undefined8 uStack_2730;
  ulong *local_2720;
  undefined8 local_2718;
  undefined8 uStack_2710;
  ulong local_26f8;
  undefined8 uStack_26f0;
  ulong *local_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 *local_26c0;
  ulong local_26b8;
  undefined8 uStack_26b0;
  ulong *local_26a0;
  undefined8 local_2698;
  undefined8 uStack_2690;
  undefined8 *local_2680;
  ulong local_2678;
  undefined8 uStack_2670;
  ulong *local_2660;
  undefined8 local_2658;
  undefined8 uStack_2650;
  undefined8 *local_2640;
  ulong local_2638;
  undefined8 uStack_2630;
  ulong *local_2620;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined8 *local_2600;
  ulong local_25f8;
  undefined8 uStack_25f0;
  ulong *local_25e0;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  ulong local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  ulong local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  ulong local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  ulong local_2398;
  undefined8 uStack_2390;
  undefined8 local_2388;
  undefined8 uStack_2380;
  ulong local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  ulong local_2358;
  undefined8 uStack_2350;
  ushort local_2348;
  ushort uStack_2346;
  ushort uStack_2344;
  ushort uStack_2342;
  ushort uStack_2340;
  ushort uStack_233e;
  ushort uStack_233c;
  ushort uStack_233a;
  ushort local_2338;
  ushort uStack_2336;
  ushort uStack_2334;
  ushort uStack_2332;
  ushort uStack_2330;
  ushort uStack_232e;
  ushort uStack_232c;
  ushort uStack_232a;
  short local_2328;
  short sStack_2326;
  short sStack_2324;
  short sStack_2322;
  short sStack_2320;
  short sStack_231e;
  short sStack_231c;
  short sStack_231a;
  short local_2318;
  short sStack_2316;
  short sStack_2314;
  short sStack_2312;
  short sStack_2310;
  short sStack_230e;
  short sStack_230c;
  short sStack_230a;
  short local_2308;
  short sStack_2306;
  short sStack_2304;
  short sStack_2302;
  short sStack_2300;
  short sStack_22fe;
  short sStack_22fc;
  short sStack_22fa;
  short local_22f8;
  short sStack_22f6;
  short sStack_22f4;
  short sStack_22f2;
  short sStack_22f0;
  short sStack_22ee;
  short sStack_22ec;
  short sStack_22ea;
  short local_22e8;
  short sStack_22e6;
  short sStack_22e4;
  short sStack_22e2;
  short sStack_22e0;
  short sStack_22de;
  short sStack_22dc;
  short sStack_22da;
  short local_22d8;
  short sStack_22d6;
  short sStack_22d4;
  short sStack_22d2;
  short sStack_22d0;
  short sStack_22ce;
  short sStack_22cc;
  short sStack_22ca;
  short local_22c8;
  short sStack_22c6;
  short sStack_22c4;
  short sStack_22c2;
  short sStack_22c0;
  short sStack_22be;
  short sStack_22bc;
  short sStack_22ba;
  short local_22b8;
  short sStack_22b6;
  short sStack_22b4;
  short sStack_22b2;
  short sStack_22b0;
  short sStack_22ae;
  short sStack_22ac;
  short sStack_22aa;
  undefined1 local_22a8;
  char cStack_22a7;
  undefined1 uStack_22a6;
  char cStack_22a5;
  undefined1 uStack_22a4;
  char cStack_22a3;
  undefined1 uStack_22a2;
  char cStack_22a1;
  undefined1 uStack_22a0;
  char cStack_229f;
  undefined1 uStack_229e;
  char cStack_229d;
  undefined1 uStack_229c;
  char cStack_229b;
  undefined1 uStack_229a;
  char cStack_2299;
  undefined1 local_2298;
  char cStack_2297;
  undefined1 uStack_2296;
  char cStack_2295;
  undefined1 uStack_2294;
  char cStack_2293;
  undefined1 uStack_2292;
  char cStack_2291;
  undefined1 uStack_2290;
  char cStack_228f;
  undefined1 uStack_228e;
  char cStack_228d;
  undefined1 uStack_228c;
  char cStack_228b;
  undefined1 uStack_228a;
  char cStack_2289;
  undefined1 local_2288;
  char cStack_2287;
  undefined1 uStack_2286;
  char cStack_2285;
  undefined1 uStack_2284;
  char cStack_2283;
  undefined1 uStack_2282;
  char cStack_2281;
  undefined1 uStack_2280;
  char cStack_227f;
  undefined1 uStack_227e;
  char cStack_227d;
  undefined1 uStack_227c;
  char cStack_227b;
  undefined1 uStack_227a;
  char cStack_2279;
  undefined1 local_2278;
  char cStack_2277;
  undefined1 uStack_2276;
  char cStack_2275;
  undefined1 uStack_2274;
  char cStack_2273;
  undefined1 uStack_2272;
  char cStack_2271;
  undefined1 uStack_2270;
  char cStack_226f;
  undefined1 uStack_226e;
  char cStack_226d;
  undefined1 uStack_226c;
  char cStack_226b;
  undefined1 uStack_226a;
  char cStack_2269;
  undefined1 local_2268;
  char cStack_2267;
  undefined1 uStack_2266;
  char cStack_2265;
  undefined1 uStack_2264;
  char cStack_2263;
  undefined1 uStack_2262;
  char cStack_2261;
  undefined1 uStack_2260;
  char cStack_225f;
  undefined1 uStack_225e;
  char cStack_225d;
  undefined1 uStack_225c;
  char cStack_225b;
  undefined1 uStack_225a;
  char cStack_2259;
  undefined1 local_2258;
  char cStack_2257;
  undefined1 uStack_2256;
  char cStack_2255;
  undefined1 uStack_2254;
  char cStack_2253;
  undefined1 uStack_2252;
  char cStack_2251;
  undefined1 uStack_2250;
  char cStack_224f;
  undefined1 uStack_224e;
  char cStack_224d;
  undefined1 uStack_224c;
  char cStack_224b;
  undefined1 uStack_224a;
  char cStack_2249;
  undefined1 local_2248;
  char cStack_2247;
  undefined1 uStack_2246;
  char cStack_2245;
  undefined1 uStack_2244;
  char cStack_2243;
  undefined1 uStack_2242;
  char cStack_2241;
  undefined1 uStack_2240;
  char cStack_223f;
  undefined1 uStack_223e;
  char cStack_223d;
  undefined1 uStack_223c;
  char cStack_223b;
  undefined1 uStack_223a;
  char cStack_2239;
  undefined1 local_2238;
  char cStack_2237;
  undefined1 uStack_2236;
  char cStack_2235;
  undefined1 uStack_2234;
  char cStack_2233;
  undefined1 uStack_2232;
  char cStack_2231;
  undefined1 uStack_2230;
  char cStack_222f;
  undefined1 uStack_222e;
  char cStack_222d;
  undefined1 uStack_222c;
  char cStack_222b;
  undefined1 uStack_222a;
  char cStack_2229;
  undefined1 local_2228;
  char cStack_2227;
  undefined1 uStack_2226;
  char cStack_2225;
  undefined1 uStack_2224;
  char cStack_2223;
  undefined1 uStack_2222;
  char cStack_2221;
  undefined1 uStack_2220;
  char cStack_221f;
  undefined1 uStack_221e;
  char cStack_221d;
  undefined1 uStack_221c;
  char cStack_221b;
  undefined1 uStack_221a;
  char cStack_2219;
  undefined1 local_2218;
  char cStack_2217;
  undefined1 uStack_2216;
  char cStack_2215;
  undefined1 uStack_2214;
  char cStack_2213;
  undefined1 uStack_2212;
  char cStack_2211;
  undefined1 uStack_2210;
  char cStack_220f;
  undefined1 uStack_220e;
  char cStack_220d;
  undefined1 uStack_220c;
  char cStack_220b;
  undefined1 uStack_220a;
  char cStack_2209;
  undefined1 local_2208;
  char cStack_2207;
  undefined1 uStack_2206;
  char cStack_2205;
  undefined1 uStack_2204;
  char cStack_2203;
  undefined1 uStack_2202;
  char cStack_2201;
  undefined1 uStack_2200;
  char cStack_21ff;
  undefined1 uStack_21fe;
  char cStack_21fd;
  undefined1 uStack_21fc;
  char cStack_21fb;
  undefined1 uStack_21fa;
  char cStack_21f9;
  undefined1 local_21f8;
  char cStack_21f7;
  undefined1 uStack_21f6;
  char cStack_21f5;
  undefined1 uStack_21f4;
  char cStack_21f3;
  undefined1 uStack_21f2;
  char cStack_21f1;
  undefined1 uStack_21f0;
  char cStack_21ef;
  undefined1 uStack_21ee;
  char cStack_21ed;
  undefined1 uStack_21ec;
  char cStack_21eb;
  undefined1 uStack_21ea;
  char cStack_21e9;
  undefined1 local_21e8;
  char cStack_21e7;
  undefined1 uStack_21e6;
  char cStack_21e5;
  undefined1 uStack_21e4;
  char cStack_21e3;
  undefined1 uStack_21e2;
  char cStack_21e1;
  undefined1 uStack_21e0;
  char cStack_21df;
  undefined1 uStack_21de;
  char cStack_21dd;
  undefined1 uStack_21dc;
  char cStack_21db;
  undefined1 uStack_21da;
  char cStack_21d9;
  undefined1 local_21d8;
  char cStack_21d7;
  undefined1 uStack_21d6;
  char cStack_21d5;
  undefined1 uStack_21d4;
  char cStack_21d3;
  undefined1 uStack_21d2;
  char cStack_21d1;
  undefined1 uStack_21d0;
  char cStack_21cf;
  undefined1 uStack_21ce;
  char cStack_21cd;
  undefined1 uStack_21cc;
  char cStack_21cb;
  undefined1 uStack_21ca;
  char cStack_21c9;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  byte local_2108;
  byte bStack_2107;
  byte bStack_2106;
  byte bStack_2105;
  byte bStack_2104;
  byte bStack_2103;
  byte bStack_2102;
  byte bStack_2101;
  byte bStack_2100;
  byte bStack_20ff;
  byte bStack_20fe;
  byte bStack_20fd;
  byte bStack_20fc;
  byte bStack_20fb;
  byte bStack_20fa;
  byte bStack_20f9;
  undefined1 local_20f8;
  undefined1 uStack_20f7;
  undefined1 uStack_20f6;
  undefined1 uStack_20f5;
  undefined1 uStack_20f4;
  undefined1 uStack_20f3;
  undefined1 uStack_20f2;
  undefined1 uStack_20f1;
  undefined1 uStack_20f0;
  undefined1 uStack_20ef;
  undefined1 uStack_20ee;
  undefined1 uStack_20ed;
  undefined1 uStack_20ec;
  undefined1 uStack_20eb;
  undefined1 uStack_20ea;
  undefined1 uStack_20e9;
  ulong local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined1 local_20c8 [16];
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined1 local_2098 [12];
  uint uStack_208c;
  undefined4 local_2088 [3];
  uint uStack_207c;
  undefined4 local_2078;
  undefined4 uStack_2074;
  undefined4 uStack_2070;
  undefined4 uStack_206c;
  undefined8 local_2068;
  ulong uStack_2060;
  ulong local_2058;
  ulong uStack_2050;
  ulong local_2048;
  ulong uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  ulong local_2018;
  ulong uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fe8;
  undefined8 uStack_1fe0;
  undefined1 (*local_1fd8) [16];
  undefined1 (*local_1fd0) [16];
  undefined1 (*local_1fc8) [16];
  ulong *local_1fc0;
  ulong *local_1fb8;
  ulong *local_1fb0;
  ulong *local_1fa8;
  ulong *local_1fa0;
  ulong *local_1f98;
  undefined8 *local_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  ulong uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  ulong uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  ulong uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  ulong uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  ulong uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  ulong uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  ulong local_1e48;
  ulong local_1e38;
  ulong uStack_1e30;
  ulong local_1e28;
  ulong uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  ulong local_1df8;
  undefined8 uStack_1df0;
  ulong local_1de8;
  undefined8 uStack_1de0;
  undefined1 local_1dca;
  undefined1 local_1dc9;
  char local_1dc8;
  char cStack_1dc7;
  char cStack_1dc6;
  char cStack_1dc5;
  char cStack_1dc4;
  char cStack_1dc3;
  char cStack_1dc2;
  char cStack_1dc1;
  char cStack_1dc0;
  char cStack_1dbf;
  char cStack_1dbe;
  char cStack_1dbd;
  char cStack_1dbc;
  char cStack_1dbb;
  char cStack_1dba;
  char cStack_1db9;
  char local_1db8;
  char cStack_1db7;
  char cStack_1db6;
  char cStack_1db5;
  char cStack_1db4;
  char cStack_1db3;
  char cStack_1db2;
  char cStack_1db1;
  char cStack_1db0;
  char cStack_1daf;
  char cStack_1dae;
  char cStack_1dad;
  char cStack_1dac;
  char cStack_1dab;
  char cStack_1daa;
  char cStack_1da9;
  char local_1da8;
  char cStack_1da7;
  char cStack_1da6;
  char cStack_1da5;
  char cStack_1da4;
  char cStack_1da3;
  char cStack_1da2;
  char cStack_1da1;
  char cStack_1da0;
  char cStack_1d9f;
  char cStack_1d9e;
  char cStack_1d9d;
  char cStack_1d9c;
  char cStack_1d9b;
  char cStack_1d9a;
  char cStack_1d99;
  char local_1d98;
  char cStack_1d97;
  char cStack_1d96;
  char cStack_1d95;
  char cStack_1d94;
  char cStack_1d93;
  char cStack_1d92;
  char cStack_1d91;
  char cStack_1d90;
  char cStack_1d8f;
  char cStack_1d8e;
  char cStack_1d8d;
  char cStack_1d8c;
  char cStack_1d8b;
  char cStack_1d8a;
  char cStack_1d89;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  byte local_1ca8;
  byte bStack_1ca7;
  byte bStack_1ca6;
  byte bStack_1ca5;
  byte bStack_1ca4;
  byte bStack_1ca3;
  byte bStack_1ca2;
  byte bStack_1ca1;
  byte bStack_1ca0;
  byte bStack_1c9f;
  byte bStack_1c9e;
  byte bStack_1c9d;
  byte bStack_1c9c;
  byte bStack_1c9b;
  byte bStack_1c9a;
  byte bStack_1c99;
  byte local_1c98;
  byte bStack_1c97;
  byte bStack_1c96;
  byte bStack_1c95;
  byte bStack_1c94;
  byte bStack_1c93;
  byte bStack_1c92;
  byte bStack_1c91;
  byte bStack_1c90;
  byte bStack_1c8f;
  byte bStack_1c8e;
  byte bStack_1c8d;
  byte bStack_1c8c;
  byte bStack_1c8b;
  byte bStack_1c8a;
  byte bStack_1c89;
  byte local_1c88;
  byte bStack_1c87;
  byte bStack_1c86;
  byte bStack_1c85;
  byte bStack_1c84;
  byte bStack_1c83;
  byte bStack_1c82;
  byte bStack_1c81;
  byte bStack_1c80;
  byte bStack_1c7f;
  byte bStack_1c7e;
  byte bStack_1c7d;
  byte bStack_1c7c;
  byte bStack_1c7b;
  byte bStack_1c7a;
  byte bStack_1c79;
  byte local_1c78;
  byte bStack_1c77;
  byte bStack_1c76;
  byte bStack_1c75;
  byte bStack_1c74;
  byte bStack_1c73;
  byte bStack_1c72;
  byte bStack_1c71;
  byte bStack_1c70;
  byte bStack_1c6f;
  byte bStack_1c6e;
  byte bStack_1c6d;
  byte bStack_1c6c;
  byte bStack_1c6b;
  byte bStack_1c6a;
  byte bStack_1c69;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  byte local_1c28;
  byte bStack_1c27;
  byte bStack_1c26;
  byte bStack_1c25;
  byte bStack_1c24;
  byte bStack_1c23;
  byte bStack_1c22;
  byte bStack_1c21;
  byte bStack_1c20;
  byte bStack_1c1f;
  byte bStack_1c1e;
  byte bStack_1c1d;
  byte bStack_1c1c;
  byte bStack_1c1b;
  byte bStack_1c1a;
  byte bStack_1c19;
  byte local_1c18;
  byte bStack_1c17;
  byte bStack_1c16;
  byte bStack_1c15;
  byte bStack_1c14;
  byte bStack_1c13;
  byte bStack_1c12;
  byte bStack_1c11;
  byte bStack_1c10;
  byte bStack_1c0f;
  byte bStack_1c0e;
  byte bStack_1c0d;
  byte bStack_1c0c;
  byte bStack_1c0b;
  byte bStack_1c0a;
  byte bStack_1c09;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  byte local_1bc8;
  byte bStack_1bc7;
  byte bStack_1bc6;
  byte bStack_1bc5;
  byte bStack_1bc4;
  byte bStack_1bc3;
  byte bStack_1bc2;
  byte bStack_1bc1;
  byte bStack_1bc0;
  byte bStack_1bbf;
  byte bStack_1bbe;
  byte bStack_1bbd;
  byte bStack_1bbc;
  byte bStack_1bbb;
  byte bStack_1bba;
  byte bStack_1bb9;
  byte local_1bb8;
  byte bStack_1bb7;
  byte bStack_1bb6;
  byte bStack_1bb5;
  byte bStack_1bb4;
  byte bStack_1bb3;
  byte bStack_1bb2;
  byte bStack_1bb1;
  byte bStack_1bb0;
  byte bStack_1baf;
  byte bStack_1bae;
  byte bStack_1bad;
  byte bStack_1bac;
  byte bStack_1bab;
  byte bStack_1baa;
  byte bStack_1ba9;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  ulong local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b40;
  undefined8 uStack_1b30;
  undefined4 local_1a1c;
  ushort local_1a18;
  ushort uStack_1a16;
  ushort uStack_1a14;
  ushort uStack_1a12;
  ushort uStack_1a10;
  ushort uStack_1a0e;
  ushort uStack_1a0c;
  ushort uStack_1a0a;
  undefined4 local_19fc;
  ushort local_19f8;
  ushort uStack_19f6;
  ushort uStack_19f4;
  ushort uStack_19f2;
  ushort uStack_19f0;
  ushort uStack_19ee;
  ushort uStack_19ec;
  ushort uStack_19ea;
  undefined4 local_19dc;
  ushort local_19d8;
  ushort uStack_19d6;
  ushort uStack_19d4;
  ushort uStack_19d2;
  ushort uStack_19d0;
  ushort uStack_19ce;
  ushort uStack_19cc;
  ushort uStack_19ca;
  undefined4 local_19bc;
  ushort local_19b8;
  ushort uStack_19b6;
  ushort uStack_19b4;
  ushort uStack_19b2;
  ushort uStack_19b0;
  ushort uStack_19ae;
  ushort uStack_19ac;
  ushort uStack_19aa;
  undefined4 local_199c;
  ushort local_1998;
  ushort uStack_1996;
  ushort uStack_1994;
  ushort uStack_1992;
  ushort uStack_1990;
  ushort uStack_198e;
  ushort uStack_198c;
  ushort uStack_198a;
  undefined4 local_197c;
  ushort local_1978;
  ushort uStack_1976;
  ushort uStack_1974;
  ushort uStack_1972;
  ushort uStack_1970;
  ushort uStack_196e;
  ushort uStack_196c;
  ushort uStack_196a;
  undefined4 local_195c;
  ushort local_1958;
  ushort uStack_1956;
  ushort uStack_1954;
  ushort uStack_1952;
  ushort uStack_1950;
  ushort uStack_194e;
  ushort uStack_194c;
  ushort uStack_194a;
  undefined4 local_193c;
  ushort local_1938;
  ushort uStack_1936;
  ushort uStack_1934;
  ushort uStack_1932;
  ushort uStack_1930;
  ushort uStack_192e;
  ushort uStack_192c;
  ushort uStack_192a;
  undefined4 local_191c;
  ushort local_1918;
  ushort uStack_1916;
  ushort uStack_1914;
  ushort uStack_1912;
  ushort uStack_1910;
  ushort uStack_190e;
  ushort uStack_190c;
  ushort uStack_190a;
  undefined4 local_18fc;
  ushort local_18f8;
  ushort uStack_18f6;
  ushort uStack_18f4;
  ushort uStack_18f2;
  ushort uStack_18f0;
  ushort uStack_18ee;
  ushort uStack_18ec;
  ushort uStack_18ea;
  undefined4 local_18dc;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  ulong local_1788;
  ulong uStack_1780;
  ulong local_1778;
  ulong uStack_1770;
  ulong local_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1750;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined1 local_16d8 [16];
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  ulong local_16a8;
  ulong uStack_16a0;
  char local_1698;
  char cStack_1697;
  char cStack_1696;
  char cStack_1695;
  char cStack_1694;
  char cStack_1693;
  char cStack_1692;
  char cStack_1691;
  char cStack_1690;
  char cStack_168f;
  char cStack_168e;
  char cStack_168d;
  char cStack_168c;
  char cStack_168b;
  char cStack_168a;
  char cStack_1689;
  ulong local_1688;
  ulong uStack_1680;
  char local_1678;
  char cStack_1677;
  char cStack_1676;
  char cStack_1675;
  char cStack_1674;
  char cStack_1673;
  char cStack_1672;
  char cStack_1671;
  char cStack_1670;
  char cStack_166f;
  char cStack_166e;
  char cStack_166d;
  char cStack_166c;
  char cStack_166b;
  char cStack_166a;
  char cStack_1669;
  char local_1658;
  char cStack_1657;
  char cStack_1656;
  char cStack_1655;
  char cStack_1654;
  char cStack_1653;
  char cStack_1652;
  char cStack_1651;
  char cStack_1650;
  char cStack_164f;
  char cStack_164e;
  char cStack_164d;
  char cStack_164c;
  char cStack_164b;
  char cStack_164a;
  byte bStack_1649;
  uint local_1528;
  uint uStack_1524;
  uint uStack_1520;
  uint uStack_151c;
  uint local_1518;
  uint uStack_1514;
  uint uStack_1510;
  uint uStack_150c;
  undefined2 local_13fc;
  undefined2 local_13fa;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  ulong local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  ulong local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  ulong local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  ulong local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  ulong local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  ulong local_1328;
  undefined8 uStack_1320;
  short sStack_12c6;
  short sStack_12c4;
  short sStack_12c2;
  short sStack_12be;
  short sStack_12bc;
  short sStack_12ba;
  short sStack_12b6;
  short sStack_12b4;
  short sStack_12b2;
  short sStack_12ae;
  short sStack_12ac;
  short sStack_12aa;
  short sStack_12a6;
  short sStack_12a4;
  short sStack_12a2;
  short sStack_129e;
  short sStack_129c;
  short sStack_129a;
  short sStack_1246;
  short sStack_1244;
  short sStack_1242;
  short sStack_123e;
  short sStack_123c;
  short sStack_123a;
  short sStack_1236;
  short sStack_1234;
  short sStack_1232;
  short sStack_122e;
  short sStack_122c;
  short sStack_122a;
  short sStack_1226;
  short sStack_1224;
  short sStack_1222;
  short sStack_121e;
  short sStack_121c;
  short sStack_121a;
  short sStack_1216;
  short sStack_1214;
  short sStack_1212;
  short sStack_120e;
  short sStack_120c;
  short sStack_120a;
  short sStack_11f6;
  short sStack_11f4;
  short sStack_11f2;
  short sStack_11ee;
  short sStack_11ec;
  short sStack_11ea;
  short sStack_1186;
  short sStack_1184;
  short sStack_1182;
  short sStack_117e;
  short sStack_117c;
  short sStack_117a;
  short sStack_1176;
  short sStack_1174;
  short sStack_1172;
  short sStack_116e;
  short sStack_116c;
  short sStack_116a;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  short sStack_1106;
  short sStack_1104;
  short sStack_1102;
  short sStack_10fe;
  short sStack_10fc;
  short sStack_10fa;
  short sStack_10f6;
  short sStack_10f4;
  short sStack_10f2;
  short sStack_10ee;
  short sStack_10ec;
  short sStack_10ea;
  short sStack_10e6;
  short sStack_10e4;
  short sStack_10e2;
  short sStack_10de;
  short sStack_10dc;
  short sStack_10da;
  short sStack_10d6;
  short sStack_10d4;
  short sStack_10d2;
  short sStack_10ce;
  short sStack_10cc;
  short sStack_10ca;
  short sStack_10b6;
  short sStack_10b4;
  short sStack_10b2;
  short sStack_10ae;
  short sStack_10ac;
  short sStack_10aa;
  short sStack_1046;
  short sStack_1044;
  short sStack_1042;
  short sStack_103e;
  short sStack_103c;
  short sStack_103a;
  short sStack_1036;
  short sStack_1034;
  short sStack_1032;
  short sStack_102e;
  short sStack_102c;
  short sStack_102a;
  short sStack_1026;
  short sStack_1024;
  short sStack_1022;
  short sStack_101e;
  short sStack_101c;
  short sStack_101a;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  short sStack_fb6;
  short sStack_fb4;
  short sStack_fb2;
  short sStack_fae;
  short sStack_fac;
  short sStack_faa;
  short sStack_fa6;
  short sStack_fa4;
  short sStack_fa2;
  short sStack_f9e;
  short sStack_f9c;
  short sStack_f9a;
  short sStack_f96;
  short sStack_f94;
  short sStack_f92;
  short sStack_f8e;
  short sStack_f8c;
  short sStack_f8a;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  short sStack_f06;
  short sStack_f04;
  short sStack_f02;
  short sStack_efe;
  short sStack_efc;
  short sStack_efa;
  short sStack_ef6;
  short sStack_ef4;
  short sStack_ef2;
  short sStack_eee;
  short sStack_eec;
  short sStack_eea;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  short sStack_e76;
  short sStack_e74;
  short sStack_e72;
  short sStack_e6e;
  short sStack_e6c;
  short sStack_e6a;
  short sStack_e66;
  short sStack_e64;
  short sStack_e62;
  short sStack_e5e;
  short sStack_e5c;
  short sStack_e5a;
  short sStack_e56;
  short sStack_e54;
  short sStack_e52;
  short sStack_e4e;
  short sStack_e4c;
  short sStack_e4a;
  short sStack_e36;
  short sStack_e34;
  short sStack_e32;
  short sStack_e2e;
  short sStack_e2c;
  short sStack_e2a;
  short local_e18;
  short sStack_e16;
  short sStack_e14;
  short sStack_e12;
  short sStack_e10;
  short sStack_e0e;
  short sStack_e0c;
  short sStack_e0a;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  short local_dd8;
  short sStack_dd6;
  short sStack_dd4;
  short sStack_dd2;
  short sStack_dd0;
  short sStack_dce;
  short sStack_dcc;
  short sStack_dca;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  short local_d58;
  short sStack_d56;
  short sStack_d54;
  short sStack_d52;
  short sStack_d50;
  short sStack_d4e;
  short sStack_d4c;
  short sStack_d4a;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  short local_d18;
  short sStack_d16;
  short sStack_d14;
  short sStack_d12;
  short sStack_d10;
  short sStack_d0e;
  short sStack_d0c;
  short sStack_d0a;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  short local_cd8;
  short sStack_cd6;
  short sStack_cd4;
  short sStack_cd2;
  short sStack_cd0;
  short sStack_cce;
  short sStack_ccc;
  short sStack_cca;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  short local_cb8;
  short sStack_cb6;
  short sStack_cb4;
  short sStack_cb2;
  short sStack_cb0;
  short sStack_cae;
  short sStack_cac;
  short sStack_caa;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  short local_c98;
  short sStack_c96;
  short sStack_c94;
  short sStack_c92;
  short sStack_c90;
  short sStack_c8e;
  short sStack_c8c;
  short sStack_c8a;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  short local_c58;
  short sStack_c56;
  short sStack_c54;
  short sStack_c52;
  short sStack_c50;
  short sStack_c4e;
  short sStack_c4c;
  short sStack_c4a;
  undefined8 local_c48;
  undefined8 uStack_c40;
  short local_c38;
  short sStack_c36;
  short sStack_c34;
  short sStack_c32;
  short sStack_c30;
  short sStack_c2e;
  short sStack_c2c;
  short sStack_c2a;
  undefined8 local_c28;
  undefined8 uStack_c20;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  short local_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  short sStack_ad0;
  short sStack_ace;
  short sStack_acc;
  short sStack_aca;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  short local_ab8;
  short sStack_ab6;
  short sStack_ab4;
  short sStack_ab2;
  short sStack_ab0;
  short sStack_aae;
  short sStack_aac;
  short sStack_aaa;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  undefined8 local_a48;
  undefined8 uStack_a40;
  short local_a38;
  short sStack_a36;
  short sStack_a34;
  short sStack_a32;
  short sStack_a30;
  short sStack_a2e;
  short sStack_a2c;
  short sStack_a2a;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short sStack_930;
  short sStack_92e;
  short sStack_92c;
  short sStack_92a;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short sStack_8d0;
  short sStack_8ce;
  short sStack_8cc;
  short sStack_8ca;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined1 local_648;
  undefined1 local_647;
  undefined1 local_646;
  undefined1 local_645;
  undefined1 local_644;
  undefined1 local_643;
  undefined1 local_642;
  undefined1 local_641;
  undefined1 local_640;
  undefined1 local_63f;
  undefined1 local_63e;
  undefined1 local_63d;
  undefined1 local_63c;
  undefined1 local_63b;
  undefined1 local_63a;
  undefined1 local_639;
  ulong local_638;
  undefined8 uStack_630;
  undefined1 local_628;
  undefined1 local_627;
  undefined1 local_626;
  undefined1 local_625;
  undefined1 local_624;
  undefined1 local_623;
  undefined1 local_622;
  undefined1 local_621;
  undefined1 local_620;
  undefined1 local_61f;
  undefined1 local_61e;
  undefined1 local_61d;
  undefined1 local_61c;
  undefined1 local_61b;
  undefined1 local_61a;
  undefined1 local_619;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined4 uStack_4f0;
  uint uStack_4ec;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  uint uStack_4dc;
  ulong local_4d8;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined1 local_4b8;
  undefined1 uStack_4b7;
  undefined1 uStack_4b6;
  undefined1 uStack_4b5;
  undefined1 uStack_4b4;
  undefined1 uStack_4b3;
  undefined1 uStack_4b2;
  undefined1 uStack_4b1;
  undefined1 uStack_4b0;
  undefined1 uStack_4af;
  undefined1 uStack_4ae;
  undefined1 uStack_4ad;
  undefined1 uStack_4ac;
  undefined1 uStack_4ab;
  undefined1 uStack_4aa;
  undefined1 uStack_4a9;
  undefined8 local_4a8;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined1 *local_428;
  undefined4 *local_420;
  undefined8 *local_418;
  ulong *local_410;
  undefined4 *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  undefined1 local_369;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined8 local_288;
  ulong uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  ulong uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar138;
  
  local_2804 = (int)in_RSI;
  uVar1 = *in_RDX;
  uStack_27a0 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_27b0 = in_R9[1];
  local_27a8._0_4_ = (undefined4)uVar1;
  local_27a8._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_27b8._0_4_ = (undefined4)uVar2;
  local_27b8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_28a8._0_4_ = (undefined4)local_27a8;
  local_28a8._4_4_ = (undefined4)local_27b8;
  local_28a8._8_4_ = local_27a8._4_4_;
  local_28a8._12_4_ = local_27b8._4_4_;
  uVar3 = *in_RCX;
  uStack_27c0 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_27d0 = in_stack_00000008[1];
  local_27c8._0_4_ = (undefined4)uVar3;
  local_27c8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_27d8._0_4_ = (undefined4)uVar4;
  local_27d8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_28b8._0_4_ = (undefined4)local_27c8;
  local_28b8._4_4_ = (undefined4)local_27d8;
  local_28b8._8_4_ = local_27c8._4_4_;
  local_28b8._12_4_ = local_27d8._4_4_;
  uVar5 = *in_R8;
  uStack_27e0 = in_R8[1];
  uVar6 = *in_stack_00000010;
  uStack_27f0 = in_stack_00000010[1];
  local_27e8._0_4_ = (undefined4)uVar5;
  local_27e8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_27f8._0_4_ = (undefined4)uVar6;
  local_27f8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_28c8._0_4_ = (undefined4)local_27e8;
  local_28c8._4_4_ = (undefined4)local_27f8;
  local_28c8._8_4_ = local_27e8._4_4_;
  local_28c8._12_4_ = local_27f8._4_4_;
  local_25e0 = (ulong *)((long)in_RDI - (long)(local_2804 * 5));
  local_2858 = *local_25e0;
  uStack_25f0 = 0;
  local_2600 = (undefined8 *)((long)in_RDI + (long)(local_2804 << 2));
  uStack_2850 = *local_2600;
  uStack_2610 = 0;
  uStack_2350 = 0;
  uStack_2360 = 0;
  local_2620 = (ulong *)((long)in_RDI - (long)(local_2804 << 2));
  local_2868 = *local_2620;
  uStack_2630 = 0;
  local_2640 = (undefined8 *)((long)in_RDI + (long)(local_2804 * 3));
  uStack_2860 = *local_2640;
  uStack_2650 = 0;
  uStack_2370 = 0;
  uStack_2380 = 0;
  local_2660 = (ulong *)((long)in_RDI - (long)(local_2804 * 3));
  local_2878 = *local_2660;
  uStack_2670 = 0;
  local_2680 = (undefined8 *)((long)in_RDI + (long)(local_2804 * 2));
  uStack_2870 = *local_2680;
  uStack_2690 = 0;
  uStack_2390 = 0;
  uStack_23a0 = 0;
  local_26a0 = (ulong *)((long)in_RDI - (long)(local_2804 * 2));
  local_2888 = *local_26a0;
  uStack_26b0 = 0;
  local_26c0 = (undefined8 *)((long)in_RDI + (long)local_2804);
  local_26d8 = *local_26c0;
  uStack_26d0 = 0;
  uStack_23b0 = 0;
  uStack_23c0 = 0;
  local_26e0 = (ulong *)((long)in_RDI - (long)local_2804);
  local_2898 = *local_26e0;
  uStack_26f0 = 0;
  local_2718 = *in_RDI;
  uStack_2710 = 0;
  uStack_23d0 = 0;
  uStack_23e0 = 0;
  local_2720 = (ulong *)((long)in_RDI - (long)(local_2804 * 6));
  local_2848 = *local_2720;
  uStack_2730 = 0;
  local_2740 = (undefined8 *)((long)in_RDI + (long)(local_2804 * 5));
  uStack_2840 = *local_2740;
  uStack_2750 = 0;
  uStack_23f0 = 0;
  uStack_2400 = 0;
  local_2760 = (undefined8 *)((long)in_RDI - (long)(local_2804 * 7));
  local_2838 = *local_2760;
  uStack_2770 = 0;
  b[0] = (ulong)(uint)(local_2804 * 2);
  b[1] = (long)(local_2804 * 6);
  local_2780 = (undefined8 *)((long)in_RDI + b[1]);
  uStack_2830 = *local_2780;
  uStack_2790 = 0;
  uStack_2410 = 0;
  uStack_2420 = 0;
  local_1f90 = &local_2838;
  local_1f98 = &local_2848;
  local_1fa0 = &local_2858;
  local_1fa8 = &local_2868;
  local_1fb0 = &local_2878;
  local_1fb8 = &local_2888;
  local_1fc0 = &local_2898;
  local_1fc8 = &local_28a8;
  local_1fd0 = &local_28b8;
  local_1fd8 = &local_28c8;
  local_1f88 = 0;
  uStack_1f80 = 0;
  local_1fe8 = 0;
  uStack_1fe0 = 0;
  local_1dc9 = 1;
  local_639 = 1;
  local_63a = 1;
  local_63b = 1;
  local_63c = 1;
  local_63d = 1;
  local_63e = 1;
  local_63f = 1;
  local_640 = 1;
  local_641 = 1;
  local_642 = 1;
  local_643 = 1;
  local_644 = 1;
  local_645 = 1;
  local_646 = 1;
  local_647 = 1;
  local_648 = 1;
  local_1ff8 = 0x101010101010101;
  uStack_1ff0 = 0x101010101010101;
  uStack_2890._4_4_ = (undefined4)((ulong)local_2718 >> 0x20);
  uStack_206c = uStack_2890._4_4_;
  uStack_2880._4_4_ = (undefined4)((ulong)local_26d8 >> 0x20);
  uStack_4cc = uStack_2880._4_4_;
  local_4b8 = (undefined1)local_2888;
  uStack_4b7 = (undefined1)(local_2888 >> 8);
  uStack_4b6 = (undefined1)(local_2888 >> 0x10);
  uStack_4b5 = (undefined1)(local_2888 >> 0x18);
  _local_4c8 = CONCAT44((int)(local_2898 >> 0x20),(undefined4)local_2878);
  uStack_2070 = uStack_4c0;
  local_2068 = CONCAT44(uStack_2880._4_4_,uStack_4d0);
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  uStack_2890 = local_2718;
  uStack_2880 = local_26d8;
  local_2800 = in_RDI;
  local_27f8 = uVar6;
  local_27e8 = uVar5;
  local_27d8 = uVar4;
  local_27c8 = uVar3;
  local_27b8 = uVar2;
  local_27a8 = uVar1;
  local_2798 = uStack_2830;
  local_2778 = local_2838;
  local_2758 = uStack_2840;
  local_2738 = local_2848;
  local_26f8 = local_2898;
  local_26b8 = local_2888;
  local_2698 = uStack_2870;
  local_2678 = local_2878;
  local_2658 = uStack_2860;
  local_2638 = local_2868;
  local_2618 = uStack_2850;
  local_25f8 = local_2858;
  local_2428 = uStack_2830;
  local_2418 = local_2838;
  local_2408 = uStack_2840;
  local_23f8 = local_2848;
  local_23e8 = local_2718;
  local_23d8 = local_2898;
  local_23c8 = local_26d8;
  local_23b8 = local_2888;
  local_23a8 = uStack_2870;
  local_2398 = local_2878;
  local_2388 = uStack_2860;
  local_2378 = local_2868;
  local_2368 = uStack_2850;
  local_2358 = local_2858;
  uStack_2060 = local_2888;
  local_1df8 = local_2888;
  uStack_1df0 = local_26d8;
  local_1de8 = local_2898;
  uStack_1de0 = local_2718;
  local_658 = local_1ff8;
  uStack_650 = uStack_1ff0;
  local_4d8 = local_2888;
  uStack_4bc = uStack_206c;
  alVar187 = abs_diff(a,b);
  alVar187[0] = alVar187[1];
  uStack_20d0 = 0;
  local_1dca = 0xfe;
  local_619 = 0xfe;
  local_61a = 0xfe;
  local_61b = 0xfe;
  local_61c = 0xfe;
  local_61d = 0xfe;
  local_61e = 0xfe;
  local_61f = 0xfe;
  local_620 = 0xfe;
  local_621 = 0xfe;
  local_622 = 0xfe;
  local_623 = 0xfe;
  local_624 = 0xfe;
  local_625 = 0xfe;
  local_626 = 0xfe;
  local_627 = 0xfe;
  local_628 = 0xfe;
  local_20e8 = 0xfefefefefefefefe;
  uStack_20e0 = 0xfefefefefefefefe;
  local_20f8 = 0xff;
  uStack_20f7 = 0xff;
  uStack_20f6 = 0xff;
  uStack_20f5 = 0xff;
  uStack_20f4 = 0xff;
  uStack_20f3 = 0xff;
  uStack_20f2 = 0xff;
  uStack_20f1 = 0xff;
  uStack_20f0 = 0xff;
  uStack_20ef = 0xff;
  uStack_20ee = 0xff;
  uStack_20ed = 0xff;
  uStack_20ec = 0xff;
  uStack_20eb = 0xff;
  uStack_20ea = 0xff;
  uStack_20e9 = 0xff;
  alVar187[1] = b[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_20d8 = extraout_XMM0_Qb;
  local_20a8 = extraout_XMM0_Qa;
  uStack_20a0 = extraout_XMM0_Qb;
  local_638 = local_20e8;
  uStack_630 = uStack_20e0;
  alVar187 = abs_diff(a_00,alVar187);
  b_00[0] = alVar187[1];
  local_1e18 = local_1fe8;
  uStack_1e10 = uStack_1fe0;
  local_1b78 = local_20a8;
  uVar17 = local_1b78;
  uStack_1b70 = uStack_20a0;
  uVar20 = uStack_1b70;
  local_1b88 = local_20d8;
  uVar6 = local_1b88;
  uStack_1b80 = uStack_20d0;
  uVar7 = uStack_1b80;
  local_1b78._0_1_ = (byte)local_20a8;
  local_1b78._1_1_ = (byte)((ulong)local_20a8 >> 8);
  local_1b78._2_1_ = (byte)((ulong)local_20a8 >> 0x10);
  local_1b78._3_1_ = (byte)((ulong)local_20a8 >> 0x18);
  local_1b78._4_1_ = (byte)((ulong)local_20a8 >> 0x20);
  local_1b78._5_1_ = (byte)((ulong)local_20a8 >> 0x28);
  local_1b78._6_1_ = (byte)((ulong)local_20a8 >> 0x30);
  local_1b78._7_1_ = (byte)((ulong)local_20a8 >> 0x38);
  uStack_1b70._0_1_ = (byte)uStack_20a0;
  uStack_1b70._1_1_ = (byte)((ulong)uStack_20a0 >> 8);
  uStack_1b70._2_1_ = (byte)((ulong)uStack_20a0 >> 0x10);
  uStack_1b70._3_1_ = (byte)((ulong)uStack_20a0 >> 0x18);
  uStack_1b70._4_1_ = (byte)((ulong)uStack_20a0 >> 0x20);
  uStack_1b70._5_1_ = (byte)((ulong)uStack_20a0 >> 0x28);
  uStack_1b70._6_1_ = (byte)((ulong)uStack_20a0 >> 0x30);
  uStack_1b70._7_1_ = (byte)((ulong)uStack_20a0 >> 0x38);
  local_1b88._0_1_ = (byte)local_20d8;
  local_1b88._1_1_ = (byte)((ulong)local_20d8 >> 8);
  local_1b88._2_1_ = (byte)((ulong)local_20d8 >> 0x10);
  local_1b88._3_1_ = (byte)((ulong)local_20d8 >> 0x18);
  local_1b88._4_1_ = (byte)((ulong)local_20d8 >> 0x20);
  local_1b88._5_1_ = (byte)((ulong)local_20d8 >> 0x28);
  local_1b88._6_1_ = (byte)((ulong)local_20d8 >> 0x30);
  local_1b88._7_1_ = (byte)((ulong)local_20d8 >> 0x38);
  uStack_1b80._0_1_ = (byte)uStack_20d0;
  uStack_1b80._1_1_ = (byte)((ulong)uStack_20d0 >> 8);
  uStack_1b80._2_1_ = (byte)((ulong)uStack_20d0 >> 0x10);
  uStack_1b80._3_1_ = (byte)((ulong)uStack_20d0 >> 0x18);
  uStack_1b80._4_1_ = (byte)((ulong)uStack_20d0 >> 0x20);
  uStack_1b80._5_1_ = (byte)((ulong)uStack_20d0 >> 0x28);
  uStack_1b80._6_1_ = (byte)((ulong)uStack_20d0 >> 0x30);
  uStack_1b80._7_1_ = (byte)((ulong)uStack_20d0 >> 0x38);
  local_2028._0_2_ =
       CONCAT11((local_1b78._1_1_ < local_1b88._1_1_) * local_1b88._1_1_ |
                (local_1b78._1_1_ >= local_1b88._1_1_) * local_1b78._1_1_,
                ((byte)local_1b78 < (byte)local_1b88) * (byte)local_1b88 |
                ((byte)local_1b78 >= (byte)local_1b88) * (byte)local_1b78);
  local_2028._0_3_ =
       CONCAT12((local_1b78._2_1_ < local_1b88._2_1_) * local_1b88._2_1_ |
                (local_1b78._2_1_ >= local_1b88._2_1_) * local_1b78._2_1_,(undefined2)local_2028);
  local_2028._0_4_ =
       CONCAT13((local_1b78._3_1_ < local_1b88._3_1_) * local_1b88._3_1_ |
                (local_1b78._3_1_ >= local_1b88._3_1_) * local_1b78._3_1_,(undefined3)local_2028);
  local_2028._0_5_ =
       CONCAT14((local_1b78._4_1_ < local_1b88._4_1_) * local_1b88._4_1_ |
                (local_1b78._4_1_ >= local_1b88._4_1_) * local_1b78._4_1_,(undefined4)local_2028);
  local_2028._0_6_ =
       CONCAT15((local_1b78._5_1_ < local_1b88._5_1_) * local_1b88._5_1_ |
                (local_1b78._5_1_ >= local_1b88._5_1_) * local_1b78._5_1_,(undefined5)local_2028);
  local_2028._0_7_ =
       CONCAT16((local_1b78._6_1_ < local_1b88._6_1_) * local_1b88._6_1_ |
                (local_1b78._6_1_ >= local_1b88._6_1_) * local_1b78._6_1_,(undefined6)local_2028);
  local_2028 = CONCAT17((local_1b78._7_1_ < local_1b88._7_1_) * local_1b88._7_1_ |
                        (local_1b78._7_1_ >= local_1b88._7_1_) * local_1b78._7_1_,
                        (undefined7)local_2028);
  uStack_2020._0_1_ =
       ((byte)uStack_1b70 < (byte)uStack_1b80) * (byte)uStack_1b80 |
       ((byte)uStack_1b70 >= (byte)uStack_1b80) * (byte)uStack_1b70;
  uStack_2020._1_1_ =
       (uStack_1b70._1_1_ < uStack_1b80._1_1_) * uStack_1b80._1_1_ |
       (uStack_1b70._1_1_ >= uStack_1b80._1_1_) * uStack_1b70._1_1_;
  uStack_2020._2_1_ =
       (uStack_1b70._2_1_ < uStack_1b80._2_1_) * uStack_1b80._2_1_ |
       (uStack_1b70._2_1_ >= uStack_1b80._2_1_) * uStack_1b70._2_1_;
  uStack_2020._3_1_ =
       (uStack_1b70._3_1_ < uStack_1b80._3_1_) * uStack_1b80._3_1_ |
       (uStack_1b70._3_1_ >= uStack_1b80._3_1_) * uStack_1b70._3_1_;
  uStack_2020._4_1_ =
       (uStack_1b70._4_1_ < uStack_1b80._4_1_) * uStack_1b80._4_1_ |
       (uStack_1b70._4_1_ >= uStack_1b80._4_1_) * uStack_1b70._4_1_;
  uStack_2020._5_1_ =
       (uStack_1b70._5_1_ < uStack_1b80._5_1_) * uStack_1b80._5_1_ |
       (uStack_1b70._5_1_ >= uStack_1b80._5_1_) * uStack_1b70._5_1_;
  uStack_2020._6_1_ =
       (uStack_1b70._6_1_ < uStack_1b80._6_1_) * uStack_1b80._6_1_ |
       (uStack_1b70._6_1_ >= uStack_1b80._6_1_) * uStack_1b70._6_1_;
  uStack_2020._7_1_ =
       (uStack_1b70._7_1_ < uStack_1b80._7_1_) * uStack_1b80._7_1_ |
       (uStack_1b70._7_1_ >= uStack_1b80._7_1_) * uStack_1b70._7_1_;
  local_16c8 = *(undefined8 *)*local_1fd8;
  uStack_16c0 = *(undefined8 *)(*local_1fd8 + 8);
  local_16b8 = local_2028;
  uStack_16b0 = uStack_2020;
  auVar122._8_8_ = uStack_2020;
  auVar122._0_8_ = local_2028;
  auVar147 = psubusb(auVar122,*local_1fd8);
  local_2018 = auVar147._0_8_;
  uStack_2010 = auVar147._8_8_;
  local_1cf8 = local_2018;
  uVar8 = local_1cf8;
  uStack_1cf0 = uStack_2010;
  uVar5 = uStack_1cf0;
  local_1d08 = local_1fe8;
  uVar3 = local_1d08;
  uStack_1d00 = uStack_1fe0;
  uVar4 = uStack_1d00;
  local_1cf8._0_1_ = auVar147[0];
  local_1cf8._1_1_ = auVar147[1];
  local_1cf8._2_1_ = auVar147[2];
  local_1cf8._3_1_ = auVar147[3];
  local_1cf8._4_1_ = auVar147[4];
  local_1cf8._5_1_ = auVar147[5];
  local_1cf8._6_1_ = auVar147[6];
  local_1cf8._7_1_ = auVar147[7];
  uStack_1cf0._0_1_ = auVar147[8];
  uStack_1cf0._1_1_ = auVar147[9];
  uStack_1cf0._2_1_ = auVar147[10];
  uStack_1cf0._3_1_ = auVar147[0xb];
  uStack_1cf0._4_1_ = auVar147[0xc];
  uStack_1cf0._5_1_ = auVar147[0xd];
  uStack_1cf0._6_1_ = auVar147[0xe];
  uStack_1cf0._7_1_ = auVar147[0xf];
  local_1d08._0_1_ = (char)local_1fe8;
  local_1d08._1_1_ = (char)((ulong)local_1fe8 >> 8);
  local_1d08._2_1_ = (char)((ulong)local_1fe8 >> 0x10);
  local_1d08._3_1_ = (char)((ulong)local_1fe8 >> 0x18);
  local_1d08._4_1_ = (char)((ulong)local_1fe8 >> 0x20);
  local_1d08._5_1_ = (char)((ulong)local_1fe8 >> 0x28);
  local_1d08._6_1_ = (char)((ulong)local_1fe8 >> 0x30);
  local_1d08._7_1_ = (char)((ulong)local_1fe8 >> 0x38);
  uStack_1d00._0_1_ = (char)uStack_1fe0;
  uStack_1d00._1_1_ = (char)((ulong)uStack_1fe0 >> 8);
  uStack_1d00._2_1_ = (char)((ulong)uStack_1fe0 >> 0x10);
  uStack_1d00._3_1_ = (char)((ulong)uStack_1fe0 >> 0x18);
  uStack_1d00._4_1_ = (char)((ulong)uStack_1fe0 >> 0x20);
  uStack_1d00._5_1_ = (char)((ulong)uStack_1fe0 >> 0x28);
  uStack_1d00._6_1_ = (char)((ulong)uStack_1fe0 >> 0x30);
  uStack_1d00._7_1_ = (char)((ulong)uStack_1fe0 >> 0x38);
  local_1678 = -((char)local_1cf8 == (char)local_1d08);
  cStack_1677 = -(local_1cf8._1_1_ == local_1d08._1_1_);
  cStack_1676 = -(local_1cf8._2_1_ == local_1d08._2_1_);
  cStack_1675 = -(local_1cf8._3_1_ == local_1d08._3_1_);
  cStack_1674 = -(local_1cf8._4_1_ == local_1d08._4_1_);
  cStack_1673 = -(local_1cf8._5_1_ == local_1d08._5_1_);
  cStack_1672 = -(local_1cf8._6_1_ == local_1d08._6_1_);
  cStack_1671 = -(local_1cf8._7_1_ == local_1d08._7_1_);
  cStack_1670 = -((char)uStack_1cf0 == (char)uStack_1d00);
  cStack_166f = -(uStack_1cf0._1_1_ == uStack_1d00._1_1_);
  cStack_166e = -(uStack_1cf0._2_1_ == uStack_1d00._2_1_);
  cStack_166d = -(uStack_1cf0._3_1_ == uStack_1d00._3_1_);
  cStack_166c = -(uStack_1cf0._4_1_ == uStack_1d00._4_1_);
  cStack_166b = -(uStack_1cf0._5_1_ == uStack_1d00._5_1_);
  cStack_166a = -(uStack_1cf0._6_1_ == uStack_1d00._6_1_);
  cStack_1669 = -(uStack_1cf0._7_1_ == uStack_1d00._7_1_);
  local_1688 = CONCAT17(uStack_20f1,
                        CONCAT16(uStack_20f2,
                                 CONCAT15(uStack_20f3,
                                          CONCAT14(uStack_20f4,
                                                   CONCAT13(uStack_20f5,
                                                            CONCAT12(uStack_20f6,
                                                                     CONCAT11(uStack_20f7,local_20f8
                                                                             )))))));
  uStack_1680 = CONCAT17(uStack_20e9,
                         CONCAT16(uStack_20ea,
                                  CONCAT15(uStack_20eb,
                                           CONCAT14(uStack_20ec,
                                                    CONCAT13(uStack_20ed,
                                                             CONCAT12(uStack_20ee,
                                                                      CONCAT11(uStack_20ef,
                                                                               uStack_20f0)))))));
  local_1e38 = CONCAT17(cStack_1671,
                        CONCAT16(cStack_1672,
                                 CONCAT15(cStack_1673,
                                          CONCAT14(cStack_1674,
                                                   CONCAT13(cStack_1675,
                                                            CONCAT12(cStack_1676,
                                                                     CONCAT11(cStack_1677,local_1678
                                                                             ))))))) ^ local_1688;
  uStack_1e30 = CONCAT17(cStack_1669,
                         CONCAT16(cStack_166a,
                                  CONCAT15(cStack_166b,
                                           CONCAT14(cStack_166c,
                                                    CONCAT13(cStack_166d,
                                                             CONCAT12(cStack_166e,
                                                                      CONCAT11(cStack_166f,
                                                                               cStack_1670))))))) ^
                uStack_1680;
  uStack_1b30 = local_1fe8;
  uStack_1b40 = local_1fe8;
  auVar116._8_8_ = local_1fe8;
  auVar116._0_8_ = extraout_XMM0_Qa_00;
  auVar148._8_8_ = local_1fe8;
  auVar148._0_8_ = extraout_XMM0_Qa_00;
  local_20c8 = paddusb(auVar116,auVar148);
  uStack_1750 = 0;
  local_1768 = local_20e8;
  uStack_1760 = uStack_20e0;
  uVar145 = extraout_XMM0_Qb_00 & local_20e8;
  uStack_18d0 = 0;
  local_18dc = 1;
  local_18d8._0_2_ = (ushort)uVar145;
  local_18d8._2_2_ = (ushort)(uVar145 >> 0x10);
  local_18d8._4_2_ = (ushort)(uVar145 >> 0x20);
  local_20b8 = CONCAT26((ushort)(uVar145 >> 0x31),
                        CONCAT24(local_18d8._4_2_ >> 1,
                                 CONCAT22(local_18d8._2_2_ >> 1,(ushort)local_18d8 >> 1)));
  uStack_20b0 = 0;
  local_1b58 = local_20c8._0_8_;
  uStack_1b50 = local_20c8._8_8_;
  local_1b68 = local_20b8;
  uStack_1b60 = 0;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_20b8;
  local_16d8 = paddusb(local_20c8,auVar147);
  local_16e8 = *(undefined8 *)*local_1fc8;
  uStack_16e0 = *(undefined8 *)(*local_1fc8 + 8);
  auVar147 = psubusb(local_16d8,*local_1fc8);
  local_2008 = auVar147._0_8_;
  uStack_2000 = auVar147._8_8_;
  local_1d18 = local_2008;
  uVar1 = local_1d18;
  uStack_1d10 = uStack_2000;
  uVar2 = uStack_1d10;
  local_1d28 = local_1fe8;
  uStack_1d20 = uStack_1fe0;
  local_1d18._0_1_ = auVar147[0];
  local_1d18._1_1_ = auVar147[1];
  local_1d18._2_1_ = auVar147[2];
  local_1d18._3_1_ = auVar147[3];
  local_1d18._4_1_ = auVar147[4];
  local_1d18._5_1_ = auVar147[5];
  local_1d18._6_1_ = auVar147[6];
  local_1d18._7_1_ = auVar147[7];
  uStack_1d10._0_1_ = auVar147[8];
  uStack_1d10._1_1_ = auVar147[9];
  uStack_1d10._2_1_ = auVar147[10];
  uStack_1d10._3_1_ = auVar147[0xb];
  uStack_1d10._4_1_ = auVar147[0xc];
  uStack_1d10._5_1_ = auVar147[0xd];
  uStack_1d10._6_1_ = auVar147[0xe];
  uStack_1d10._7_1_ = auVar147[0xf];
  local_1698 = -((char)local_1d18 == (char)local_1d08);
  cStack_1697 = -(local_1d18._1_1_ == local_1d08._1_1_);
  cStack_1696 = -(local_1d18._2_1_ == local_1d08._2_1_);
  cStack_1695 = -(local_1d18._3_1_ == local_1d08._3_1_);
  cStack_1694 = -(local_1d18._4_1_ == local_1d08._4_1_);
  cStack_1693 = -(local_1d18._5_1_ == local_1d08._5_1_);
  cStack_1692 = -(local_1d18._6_1_ == local_1d08._6_1_);
  cStack_1691 = -(local_1d18._7_1_ == local_1d08._7_1_);
  cStack_1690 = -((char)uStack_1d10 == (char)uStack_1d00);
  cStack_168f = -(uStack_1d10._1_1_ == uStack_1d00._1_1_);
  cStack_168e = -(uStack_1d10._2_1_ == uStack_1d00._2_1_);
  cStack_168d = -(uStack_1d10._3_1_ == uStack_1d00._3_1_);
  cStack_168c = -(uStack_1d10._4_1_ == uStack_1d00._4_1_);
  cStack_168b = -(uStack_1d10._5_1_ == uStack_1d00._5_1_);
  cStack_168a = -(uStack_1d10._6_1_ == uStack_1d00._6_1_);
  cStack_1689 = -(uStack_1d10._7_1_ == uStack_1d00._7_1_);
  local_16a8 = CONCAT17(uStack_20f1,
                        CONCAT16(uStack_20f2,
                                 CONCAT15(uStack_20f3,
                                          CONCAT14(uStack_20f4,
                                                   CONCAT13(uStack_20f5,
                                                            CONCAT12(uStack_20f6,
                                                                     CONCAT11(uStack_20f7,local_20f8
                                                                             )))))));
  uStack_16a0 = CONCAT17(uStack_20e9,
                         CONCAT16(uStack_20ea,
                                  CONCAT15(uStack_20eb,
                                           CONCAT14(uStack_20ec,
                                                    CONCAT13(uStack_20ed,
                                                             CONCAT12(uStack_20ee,
                                                                      CONCAT11(uStack_20ef,
                                                                               uStack_20f0)))))));
  uVar146 = CONCAT17(cStack_1691,
                     CONCAT16(cStack_1692,
                              CONCAT15(cStack_1693,
                                       CONCAT14(cStack_1694,
                                                CONCAT13(cStack_1695,
                                                         CONCAT12(cStack_1696,
                                                                  CONCAT11(cStack_1697,local_1698)))
                                               )))) ^ local_16a8;
  uVar170 = CONCAT17(cStack_1689,
                     CONCAT16(cStack_168a,
                              CONCAT15(cStack_168b,
                                       CONCAT14(cStack_168c,
                                                CONCAT13(cStack_168d,
                                                         CONCAT12(cStack_168e,
                                                                  CONCAT11(cStack_168f,cStack_1690))
                                                        ))))) ^ uStack_16a0;
  local_1b98 = local_20a8;
  uStack_1b90 = uStack_20a0;
  local_1ba8._0_1_ = (byte)uVar146;
  local_1ba8._1_1_ = (byte)(uVar146 >> 8);
  local_1ba8._2_1_ = (byte)(uVar146 >> 0x10);
  local_1ba8._3_1_ = (byte)(uVar146 >> 0x18);
  local_1ba8._4_1_ = (byte)(uVar146 >> 0x20);
  local_1ba8._5_1_ = (byte)(uVar146 >> 0x28);
  local_1ba8._6_1_ = (byte)(uVar146 >> 0x30);
  local_1ba8._7_1_ = (byte)(uVar146 >> 0x38);
  uStack_1ba0._0_1_ = (byte)uVar170;
  uStack_1ba0._1_1_ = (byte)(uVar170 >> 8);
  uStack_1ba0._2_1_ = (byte)(uVar170 >> 0x10);
  uStack_1ba0._3_1_ = (byte)(uVar170 >> 0x18);
  uStack_1ba0._4_1_ = (byte)(uVar170 >> 0x20);
  uStack_1ba0._5_1_ = (byte)(uVar170 >> 0x28);
  uStack_1ba0._6_1_ = (byte)(uVar170 >> 0x30);
  uStack_1ba0._7_1_ = (byte)(uVar170 >> 0x38);
  local_2008._1_1_ =
       (local_1b78._1_1_ < local_1ba8._1_1_) * local_1ba8._1_1_ |
       (local_1b78._1_1_ >= local_1ba8._1_1_) * local_1b78._1_1_;
  local_2008._0_1_ =
       ((byte)local_1b78 < (byte)local_1ba8) * (byte)local_1ba8 |
       ((byte)local_1b78 >= (byte)local_1ba8) * (byte)local_1b78;
  local_2008._2_1_ =
       (local_1b78._2_1_ < local_1ba8._2_1_) * local_1ba8._2_1_ |
       (local_1b78._2_1_ >= local_1ba8._2_1_) * local_1b78._2_1_;
  local_2008._3_1_ =
       (local_1b78._3_1_ < local_1ba8._3_1_) * local_1ba8._3_1_ |
       (local_1b78._3_1_ >= local_1ba8._3_1_) * local_1b78._3_1_;
  local_2008._4_1_ =
       (local_1b78._4_1_ < local_1ba8._4_1_) * local_1ba8._4_1_ |
       (local_1b78._4_1_ >= local_1ba8._4_1_) * local_1b78._4_1_;
  local_2008._5_1_ =
       (local_1b78._5_1_ < local_1ba8._5_1_) * local_1ba8._5_1_ |
       (local_1b78._5_1_ >= local_1ba8._5_1_) * local_1b78._5_1_;
  local_2008._6_1_ =
       (local_1b78._6_1_ < local_1ba8._6_1_) * local_1ba8._6_1_ |
       (local_1b78._6_1_ >= local_1ba8._6_1_) * local_1b78._6_1_;
  local_2008._7_1_ =
       (local_1b78._7_1_ < local_1ba8._7_1_) * local_1ba8._7_1_ |
       (local_1b78._7_1_ >= local_1ba8._7_1_) * local_1b78._7_1_;
  uStack_2000._0_1_ =
       ((byte)uStack_1b70 < (byte)uStack_1ba0) * (byte)uStack_1ba0 |
       ((byte)uStack_1b70 >= (byte)uStack_1ba0) * (byte)uStack_1b70;
  uStack_2000._1_1_ =
       (uStack_1b70._1_1_ < uStack_1ba0._1_1_) * uStack_1ba0._1_1_ |
       (uStack_1b70._1_1_ >= uStack_1ba0._1_1_) * uStack_1b70._1_1_;
  uStack_2000._2_1_ =
       (uStack_1b70._2_1_ < uStack_1ba0._2_1_) * uStack_1ba0._2_1_ |
       (uStack_1b70._2_1_ >= uStack_1ba0._2_1_) * uStack_1b70._2_1_;
  uStack_2000._3_1_ =
       (uStack_1b70._3_1_ < uStack_1ba0._3_1_) * uStack_1ba0._3_1_ |
       (uStack_1b70._3_1_ >= uStack_1ba0._3_1_) * uStack_1b70._3_1_;
  uStack_2000._4_1_ =
       (uStack_1b70._4_1_ < uStack_1ba0._4_1_) * uStack_1ba0._4_1_ |
       (uStack_1b70._4_1_ >= uStack_1ba0._4_1_) * uStack_1b70._4_1_;
  uStack_2000._5_1_ =
       (uStack_1b70._5_1_ < uStack_1ba0._5_1_) * uStack_1ba0._5_1_ |
       (uStack_1b70._5_1_ >= uStack_1ba0._5_1_) * uStack_1b70._5_1_;
  uStack_2000._6_1_ =
       (uStack_1b70._6_1_ < uStack_1ba0._6_1_) * uStack_1ba0._6_1_ |
       (uStack_1b70._6_1_ >= uStack_1ba0._6_1_) * uStack_1b70._6_1_;
  uStack_2000._7_1_ =
       (uStack_1b70._7_1_ < uStack_1ba0._7_1_) * uStack_1ba0._7_1_ |
       (uStack_1b70._7_1_ >= uStack_1ba0._7_1_) * uStack_1b70._7_1_;
  b_00[1] = b[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  local_1e28 = local_1e38;
  uStack_1e20 = uStack_1e30;
  local_1d18 = uVar1;
  uStack_1d10 = uVar2;
  local_1d08 = uVar3;
  uStack_1d00 = uVar4;
  local_1cf8 = uVar8;
  uStack_1cf0 = uVar5;
  local_1ba8 = uVar146;
  uStack_1ba0 = uVar170;
  local_1b88 = uVar6;
  uStack_1b80 = uVar7;
  local_1b78 = uVar17;
  uStack_1b70 = uVar20;
  local_18d8 = uVar145;
  local_2018 = local_1e38;
  uStack_2010 = local_1e38;
  alVar187 = abs_diff(a_01,b_00);
  b_01[0] = alVar187[1];
  b_01[1] = b[1];
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  alVar187 = abs_diff(a_02,b_01);
  b_02[0] = alVar187[1];
  local_1bb8 = (byte)extraout_XMM0_Qa_01;
  bStack_1bb7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_1bb6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_1bb5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_1bb4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_1bb3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_1bb2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_1bb1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_1bb0 = (byte)extraout_XMM0_Qb_01;
  bStack_1baf = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_1bae = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_1bad = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_1bac = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_1bab = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_1baa = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_1ba9 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_1bc8 = (byte)extraout_XMM0_Qa_02;
  bStack_1bc7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_1bc6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_1bc5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_1bc4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_1bc3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_1bc2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_1bc1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_1bc0 = (byte)extraout_XMM0_Qb_02;
  bStack_1bbf = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_1bbe = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_1bbd = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_1bbc = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_1bbb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_1bba = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_1bb9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_2108 = (local_1bb8 < local_1bc8) * local_1bc8 | (local_1bb8 >= local_1bc8) * local_1bb8;
  bStack_2107 = (bStack_1bb7 < bStack_1bc7) * bStack_1bc7 |
                (bStack_1bb7 >= bStack_1bc7) * bStack_1bb7;
  bStack_2106 = (bStack_1bb6 < bStack_1bc6) * bStack_1bc6 |
                (bStack_1bb6 >= bStack_1bc6) * bStack_1bb6;
  bStack_2105 = (bStack_1bb5 < bStack_1bc5) * bStack_1bc5 |
                (bStack_1bb5 >= bStack_1bc5) * bStack_1bb5;
  bStack_2104 = (bStack_1bb4 < bStack_1bc4) * bStack_1bc4 |
                (bStack_1bb4 >= bStack_1bc4) * bStack_1bb4;
  bStack_2103 = (bStack_1bb3 < bStack_1bc3) * bStack_1bc3 |
                (bStack_1bb3 >= bStack_1bc3) * bStack_1bb3;
  bStack_2102 = (bStack_1bb2 < bStack_1bc2) * bStack_1bc2 |
                (bStack_1bb2 >= bStack_1bc2) * bStack_1bb2;
  bStack_2101 = (bStack_1bb1 < bStack_1bc1) * bStack_1bc1 |
                (bStack_1bb1 >= bStack_1bc1) * bStack_1bb1;
  bStack_2100 = (bStack_1bb0 < bStack_1bc0) * bStack_1bc0 |
                (bStack_1bb0 >= bStack_1bc0) * bStack_1bb0;
  bStack_20ff = (bStack_1baf < bStack_1bbf) * bStack_1bbf |
                (bStack_1baf >= bStack_1bbf) * bStack_1baf;
  bStack_20fe = (bStack_1bae < bStack_1bbe) * bStack_1bbe |
                (bStack_1bae >= bStack_1bbe) * bStack_1bae;
  bStack_20fd = (bStack_1bad < bStack_1bbd) * bStack_1bbd |
                (bStack_1bad >= bStack_1bbd) * bStack_1bad;
  bStack_20fc = (bStack_1bac < bStack_1bbc) * bStack_1bbc |
                (bStack_1bac >= bStack_1bbc) * bStack_1bac;
  bStack_20fb = (bStack_1bab < bStack_1bbb) * bStack_1bbb |
                (bStack_1bab >= bStack_1bbb) * bStack_1bab;
  bStack_20fa = (bStack_1baa < bStack_1bba) * bStack_1bba |
                (bStack_1baa >= bStack_1bba) * bStack_1baa;
  bStack_20f9 = (bStack_1ba9 < bStack_1bb9) * bStack_1bb9 |
                (bStack_1ba9 >= bStack_1bb9) * bStack_1ba9;
  local_1bd8 = CONCAT17(bStack_2101,
                        CONCAT16(bStack_2102,
                                 CONCAT15(bStack_2103,
                                          CONCAT14(bStack_2104,
                                                   CONCAT13(bStack_2105,
                                                            CONCAT12(bStack_2106,
                                                                     CONCAT11(bStack_2107,local_2108
                                                                             )))))));
  uStack_1bd0 = CONCAT17(bStack_20f9,
                         CONCAT16(bStack_20fa,
                                  CONCAT15(bStack_20fb,
                                           CONCAT14(bStack_20fc,
                                                    CONCAT13(bStack_20fd,
                                                             CONCAT12(bStack_20fe,
                                                                      CONCAT11(bStack_20ff,
                                                                               bStack_2100)))))));
  local_1be8 = local_2008;
  uVar5 = local_1be8;
  uStack_1be0 = uStack_2000;
  uVar6 = uStack_1be0;
  local_1be8._0_1_ = (byte)local_2008;
  local_1be8._1_1_ = local_2008._1_1_;
  local_1be8._2_1_ = local_2008._2_1_;
  local_1be8._3_1_ = local_2008._3_1_;
  local_1be8._4_1_ = local_2008._4_1_;
  local_1be8._5_1_ = local_2008._5_1_;
  local_1be8._6_1_ = local_2008._6_1_;
  local_1be8._7_1_ = local_2008._7_1_;
  uStack_1be0._0_1_ = local_2008._8_1_;
  uStack_1be0._1_1_ = local_2008._9_1_;
  uStack_1be0._2_1_ = local_2008._10_1_;
  uStack_1be0._3_1_ = local_2008._11_1_;
  uStack_1be0._4_1_ = local_2008._12_1_;
  uStack_1be0._5_1_ = local_2008._13_1_;
  uStack_1be0._6_1_ = local_2008._14_1_;
  uStack_1be0._7_1_ = local_2008._15_1_;
  bVar139 = (local_2108 < (byte)local_1be8) * (byte)local_1be8 |
            (local_2108 >= (byte)local_1be8) * local_2108;
  bVar149 = (bStack_2107 < local_1be8._1_1_) * local_1be8._1_1_ |
            (bStack_2107 >= local_1be8._1_1_) * bStack_2107;
  bVar150 = (bStack_2106 < local_1be8._2_1_) * local_1be8._2_1_ |
            (bStack_2106 >= local_1be8._2_1_) * bStack_2106;
  bVar154 = (bStack_2105 < local_1be8._3_1_) * local_1be8._3_1_ |
            (bStack_2105 >= local_1be8._3_1_) * bStack_2105;
  bVar155 = (bStack_2104 < local_1be8._4_1_) * local_1be8._4_1_ |
            (bStack_2104 >= local_1be8._4_1_) * bStack_2104;
  bVar159 = (bStack_2103 < local_1be8._5_1_) * local_1be8._5_1_ |
            (bStack_2103 >= local_1be8._5_1_) * bStack_2103;
  bVar160 = (bStack_2102 < local_1be8._6_1_) * local_1be8._6_1_ |
            (bStack_2102 >= local_1be8._6_1_) * bStack_2102;
  bVar164 = (bStack_2101 < local_1be8._7_1_) * local_1be8._7_1_ |
            (bStack_2101 >= local_1be8._7_1_) * bStack_2101;
  bVar165 = (bStack_2100 < (byte)uStack_1be0) * (byte)uStack_1be0 |
            (bStack_2100 >= (byte)uStack_1be0) * bStack_2100;
  bVar171 = (bStack_20ff < uStack_1be0._1_1_) * uStack_1be0._1_1_ |
            (bStack_20ff >= uStack_1be0._1_1_) * bStack_20ff;
  bVar172 = (bStack_20fe < uStack_1be0._2_1_) * uStack_1be0._2_1_ |
            (bStack_20fe >= uStack_1be0._2_1_) * bStack_20fe;
  bVar176 = (bStack_20fd < uStack_1be0._3_1_) * uStack_1be0._3_1_ |
            (bStack_20fd >= uStack_1be0._3_1_) * bStack_20fd;
  bVar177 = (bStack_20fc < uStack_1be0._4_1_) * uStack_1be0._4_1_ |
            (bStack_20fc >= uStack_1be0._4_1_) * bStack_20fc;
  bVar181 = (bStack_20fb < uStack_1be0._5_1_) * uStack_1be0._5_1_ |
            (bStack_20fb >= uStack_1be0._5_1_) * bStack_20fb;
  bVar182 = (bStack_20fa < uStack_1be0._6_1_) * uStack_1be0._6_1_ |
            (bStack_20fa >= uStack_1be0._6_1_) * bStack_20fa;
  bVar186 = (bStack_20f9 < uStack_1be0._7_1_) * uStack_1be0._7_1_ |
            (bStack_20f9 >= uStack_1be0._7_1_) * bStack_20f9;
  local_2008._0_2_ = CONCAT11(bVar149,bVar139);
  local_2008._0_3_ = CONCAT12(bVar150,(undefined2)local_2008);
  local_2008._0_4_ = CONCAT13(bVar154,(undefined3)local_2008);
  local_2008._0_5_ = CONCAT14(bVar155,(undefined4)local_2008);
  local_2008._0_6_ = CONCAT15(bVar159,(undefined5)local_2008);
  local_2008._0_7_ = CONCAT16(bVar160,(undefined6)local_2008);
  local_2008 = CONCAT17(bVar164,(undefined7)local_2008);
  uStack_2000._0_1_ = bVar165;
  uStack_2000._1_1_ = bVar171;
  uStack_2000._2_1_ = bVar172;
  uStack_2000._3_1_ = bVar176;
  uStack_2000._4_1_ = bVar177;
  uStack_2000._5_1_ = bVar181;
  uStack_2000._6_1_ = bVar182;
  uStack_2000._7_1_ = bVar186;
  local_1bf8 = local_2008;
  uStack_1bf0 = uStack_2000;
  local_1c08 = uStack_2000;
  uStack_1c00 = 0;
  local_2008._0_2_ =
       CONCAT11((bVar149 < bVar171) * bVar171 | (bVar149 >= bVar171) * bVar149,
                (bVar139 < bVar165) * bVar165 | (bVar139 >= bVar165) * bVar139);
  local_2008._0_3_ =
       CONCAT12((bVar150 < bVar172) * bVar172 | (bVar150 >= bVar172) * bVar150,
                (undefined2)local_2008);
  local_2008._0_4_ =
       CONCAT13((bVar154 < bVar176) * bVar176 | (bVar154 >= bVar176) * bVar154,
                (undefined3)local_2008);
  local_2008._0_5_ =
       CONCAT14((bVar155 < bVar177) * bVar177 | (bVar155 >= bVar177) * bVar155,
                (undefined4)local_2008);
  local_2008._0_6_ =
       CONCAT15((bVar159 < bVar181) * bVar181 | (bVar159 >= bVar181) * bVar159,
                (undefined5)local_2008);
  local_2008._0_7_ =
       CONCAT16((bVar160 < bVar182) * bVar182 | (bVar160 >= bVar182) * bVar160,
                (undefined6)local_2008);
  local_2008 = CONCAT17((bVar164 < bVar186) * bVar186 | (bVar164 >= bVar186) * bVar164,
                        (undefined7)local_2008);
  local_1708 = *(undefined8 *)*local_1fd0;
  uStack_1700 = *(undefined8 *)(*local_1fd0 + 8);
  local_16f8 = local_2008;
  uStack_16f0 = uStack_2000;
  auVar121._8_8_ = uStack_2000;
  auVar121._0_8_ = local_2008;
  auVar147 = psubusb(auVar121,*local_1fd0);
  local_2008 = auVar147._0_8_;
  uStack_2000 = auVar147._8_8_;
  local_1d38 = local_2008;
  uVar3 = local_1d38;
  uStack_1d30 = uStack_2000;
  uVar4 = uStack_1d30;
  local_1d48 = local_1fe8;
  uVar1 = local_1d48;
  uStack_1d40 = uStack_1fe0;
  uVar2 = uStack_1d40;
  local_1d38._0_1_ = auVar147[0];
  local_1d38._1_1_ = auVar147[1];
  local_1d38._2_1_ = auVar147[2];
  local_1d38._3_1_ = auVar147[3];
  local_1d38._4_1_ = auVar147[4];
  local_1d38._5_1_ = auVar147[5];
  local_1d38._6_1_ = auVar147[6];
  local_1d38._7_1_ = auVar147[7];
  uStack_1d30._0_1_ = auVar147[8];
  uStack_1d30._1_1_ = auVar147[9];
  uStack_1d30._2_1_ = auVar147[10];
  uStack_1d30._3_1_ = auVar147[0xb];
  uStack_1d30._4_1_ = auVar147[0xc];
  uStack_1d30._5_1_ = auVar147[0xd];
  uStack_1d30._6_1_ = auVar147[0xe];
  uStack_1d30._7_1_ = auVar147[0xf];
  local_1d48._0_1_ = (char)local_1fe8;
  local_1d48._1_1_ = (char)((ulong)local_1fe8 >> 8);
  local_1d48._2_1_ = (char)((ulong)local_1fe8 >> 0x10);
  local_1d48._3_1_ = (char)((ulong)local_1fe8 >> 0x18);
  local_1d48._4_1_ = (char)((ulong)local_1fe8 >> 0x20);
  local_1d48._5_1_ = (char)((ulong)local_1fe8 >> 0x28);
  local_1d48._6_1_ = (char)((ulong)local_1fe8 >> 0x30);
  local_1d48._7_1_ = (char)((ulong)local_1fe8 >> 0x38);
  uStack_1d40._0_1_ = (char)uStack_1fe0;
  uStack_1d40._1_1_ = (char)((ulong)uStack_1fe0 >> 8);
  uStack_1d40._2_1_ = (char)((ulong)uStack_1fe0 >> 0x10);
  uStack_1d40._3_1_ = (char)((ulong)uStack_1fe0 >> 0x18);
  uStack_1d40._4_1_ = (char)((ulong)uStack_1fe0 >> 0x20);
  uStack_1d40._5_1_ = (char)((ulong)uStack_1fe0 >> 0x28);
  uStack_1d40._6_1_ = (char)((ulong)uStack_1fe0 >> 0x30);
  uStack_1d40._7_1_ = (char)((ulong)uStack_1fe0 >> 0x38);
  local_2008._0_2_ =
       CONCAT11(-(local_1d38._1_1_ == local_1d48._1_1_),-((char)local_1d38 == (char)local_1d48));
  local_2008._0_3_ = CONCAT12(-(local_1d38._2_1_ == local_1d48._2_1_),(undefined2)local_2008);
  local_2008._0_4_ = CONCAT13(-(local_1d38._3_1_ == local_1d48._3_1_),(undefined3)local_2008);
  local_2008._0_5_ = CONCAT14(-(local_1d38._4_1_ == local_1d48._4_1_),(undefined4)local_2008);
  local_2008._0_6_ = CONCAT15(-(local_1d38._5_1_ == local_1d48._5_1_),(undefined5)local_2008);
  local_2008._0_7_ = CONCAT16(-(local_1d38._6_1_ == local_1d48._6_1_),(undefined6)local_2008);
  local_2008 = CONCAT17(-(local_1d38._7_1_ == local_1d48._7_1_),(undefined7)local_2008);
  uStack_2000._0_1_ = -((char)uStack_1d30 == (char)uStack_1d40);
  uStack_2000._1_1_ = -(uStack_1d30._1_1_ == uStack_1d40._1_1_);
  uStack_2000._2_1_ = -(uStack_1d30._2_1_ == uStack_1d40._2_1_);
  uStack_2000._3_1_ = -(uStack_1d30._3_1_ == uStack_1d40._3_1_);
  uStack_2000._4_1_ = -(uStack_1d30._4_1_ == uStack_1d40._4_1_);
  uStack_2000._5_1_ = -(uStack_1d30._5_1_ == uStack_1d40._5_1_);
  uStack_2000._6_1_ = -(uStack_1d30._6_1_ == uStack_1d40._6_1_);
  uStack_2000._7_1_ = -(uStack_1d30._7_1_ == uStack_1d40._7_1_);
  local_400 = &local_2068;
  local_408 = &local_2078;
  local_410 = &local_2018;
  local_418 = &local_2008;
  local_420 = local_2088;
  local_428 = local_2098;
  local_bd = 3;
  local_be = 3;
  local_bf = 3;
  local_c0 = 3;
  local_c1 = 3;
  local_c2 = 3;
  local_c3 = 3;
  local_c4 = 3;
  local_c5 = 4;
  local_c6 = 4;
  local_c7 = 4;
  local_c8 = 4;
  local_c9 = 4;
  local_ca = 4;
  local_cb = 4;
  local_cc = 4;
  local_438 = 0x404040404040404;
  uStack_430 = 0x303030303030303;
  local_369 = 0x80;
  local_e9 = 0x80;
  local_ea = 0x80;
  local_eb = 0x80;
  local_ec = 0x80;
  local_ed = 0x80;
  local_ee = 0x80;
  local_ef = 0x80;
  local_f0 = 0x80;
  local_f1 = 0x80;
  local_f2 = 0x80;
  local_f3 = 0x80;
  local_f4 = 0x80;
  local_f5 = 0x80;
  local_f6 = 0x80;
  local_f7 = 0x80;
  local_f8 = 0x80;
  local_448 = 0x8080808080808080;
  uStack_440 = 0x8080808080808080;
  local_4b8 = 0xff;
  uStack_4b7 = 0xff;
  uStack_4b6 = 0xff;
  uStack_4b5 = 0xff;
  uStack_4b4 = 0xff;
  uStack_4b3 = 0xff;
  uStack_4b2 = 0xff;
  uStack_4b1 = 0xff;
  uStack_4b0 = 0xff;
  uStack_4af = 0xff;
  uStack_4ae = 0xff;
  uStack_4ad = 0xff;
  uStack_4ac = 0xff;
  uStack_4ab = 0xff;
  uStack_4aa = 0xff;
  uStack_4a9 = 0xff;
  local_298 = local_2068;
  uStack_290 = uStack_2060;
  local_1d8 = local_2068 ^ 0x8080808080808080;
  uStack_1d0 = uStack_2060 ^ 0x8080808080808080;
  uStack_2b0 = CONCAT44(uStack_206c,uStack_2070);
  local_1e8 = CONCAT44(uStack_2074,local_2078) ^ 0x8080808080808080;
  uStack_270 = uStack_2b0 ^ 0x8080808080808080;
  auVar130._8_8_ = uStack_1d0;
  auVar130._0_8_ = local_1d8;
  auVar129._8_8_ = uStack_270;
  auVar129._0_8_ = local_1e8;
  local_478 = psubsb(auVar130,auVar129);
  local_328 = local_2018;
  uStack_320 = uStack_2010;
  local_318 = local_478._8_8_;
  uStack_310 = 0;
  local_1f8 = local_478._8_8_ & local_2018;
  uStack_1f0 = 0;
  local_208 = local_478._0_8_;
  uStack_200 = local_478._8_8_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_1f8;
  auVar147 = psubsb(auVar128,local_478);
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_218 = local_458;
  uStack_210 = uStack_450;
  local_228 = local_478._0_8_;
  uStack_220 = local_478._8_8_;
  auVar147 = psubsb(auVar147,local_478);
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_238 = local_458;
  uStack_230 = uStack_450;
  local_248 = local_478._0_8_;
  uStack_240 = local_478._8_8_;
  auVar147 = psubsb(auVar147,local_478);
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_348 = local_2008;
  uStack_340 = uStack_2000;
  local_338 = local_458;
  uStack_330 = uStack_450;
  local_398 = local_458 & local_2008;
  uStack_390 = uStack_450 & uStack_2000;
  auVar134._8_8_ = local_398;
  auVar134._0_8_ = local_398;
  auVar133._8_8_ = 0x303030303030303;
  auVar133._0_8_ = 0x404040404040404;
  auVar147 = paddsb(auVar134,auVar133);
  local_468 = auVar147._0_8_;
  uStack_460 = auVar147._8_8_;
  local_158 = local_468;
  uStack_150 = uStack_460;
  uVar20 = uStack_150;
  local_168 = local_468;
  uStack_160 = uStack_460;
  uStack_150._0_1_ = auVar147[8];
  uStack_150._1_1_ = auVar147[9];
  uStack_150._2_1_ = auVar147[10];
  uStack_150._3_1_ = auVar147[0xb];
  uStack_150._4_1_ = auVar147[0xc];
  uStack_150._5_1_ = auVar147[0xd];
  uStack_150._6_1_ = auVar147[0xe];
  uStack_150._7_1_ = auVar147[0xf];
  local_458._0_2_ = CONCAT11((undefined1)uStack_150,(undefined1)uStack_150);
  local_458._0_3_ = CONCAT12(uStack_150._1_1_,(undefined2)local_458);
  local_458._0_4_ = CONCAT13(uStack_150._1_1_,(undefined3)local_458);
  local_458._0_5_ = CONCAT14(uStack_150._2_1_,(undefined4)local_458);
  local_458._0_6_ = CONCAT15(uStack_150._2_1_,(undefined5)local_458);
  local_458._0_7_ = CONCAT16(uStack_150._3_1_,(undefined6)local_458);
  local_458 = CONCAT17(uStack_150._3_1_,(undefined7)local_458);
  uStack_450._0_1_ = uStack_150._4_1_;
  uStack_450._1_1_ = uStack_150._4_1_;
  uStack_450._2_1_ = uStack_150._5_1_;
  uStack_450._3_1_ = uStack_150._5_1_;
  uStack_450._4_1_ = uStack_150._6_1_;
  uStack_450._5_1_ = uStack_150._6_1_;
  uStack_450._6_1_ = uStack_150._7_1_;
  uStack_450._7_1_ = uStack_150._7_1_;
  local_3c8 = local_468;
  uVar17 = local_3c8;
  uStack_3c0 = uStack_460;
  local_3d8 = local_468;
  uStack_3d0 = uStack_460;
  local_3c8._0_1_ = auVar147[0];
  local_3c8._1_1_ = auVar147[1];
  local_3c8._2_1_ = auVar147[2];
  local_3c8._3_1_ = auVar147[3];
  local_3c8._4_1_ = auVar147[4];
  local_3c8._5_1_ = auVar147[5];
  local_3c8._6_1_ = auVar147[6];
  local_3c8._7_1_ = auVar147[7];
  local_468._0_2_ = CONCAT11((undefined1)local_3c8,(undefined1)local_3c8);
  local_468._0_3_ = CONCAT12(local_3c8._1_1_,(undefined2)local_468);
  local_468._0_4_ = CONCAT13(local_3c8._1_1_,(undefined3)local_468);
  local_468._0_5_ = CONCAT14(local_3c8._2_1_,(undefined4)local_468);
  local_468._0_6_ = CONCAT15(local_3c8._2_1_,(undefined5)local_468);
  local_468._0_7_ = CONCAT16(local_3c8._3_1_,(undefined6)local_468);
  local_468 = CONCAT17(local_3c8._3_1_,(undefined7)local_468);
  uStack_460._0_1_ = local_3c8._4_1_;
  uStack_460._1_1_ = local_3c8._4_1_;
  uStack_460._2_1_ = local_3c8._5_1_;
  uStack_460._3_1_ = local_3c8._5_1_;
  uStack_460._4_1_ = local_3c8._6_1_;
  uStack_460._5_1_ = local_3c8._6_1_;
  uStack_460._6_1_ = local_3c8._7_1_;
  uStack_460._7_1_ = local_3c8._7_1_;
  local_78 = local_468;
  uStack_70 = uStack_460;
  local_7c = 0xb;
  auVar137._8_8_ = uStack_460;
  auVar137._0_8_ = local_468;
  auVar147 = psraw(auVar137,ZEXT416(0xb));
  local_98 = local_458;
  uStack_90 = uStack_450;
  local_9c = 0xb;
  auVar136._8_8_ = uStack_450;
  auVar136._0_8_ = local_458;
  auVar148 = psraw(auVar136,ZEXT416(0xb));
  local_468 = auVar147._0_8_;
  uStack_460 = auVar147._8_8_;
  local_458 = auVar148._0_8_;
  uStack_450 = auVar148._8_8_;
  local_118 = local_468;
  uStack_110 = uStack_460;
  local_128 = local_458;
  uStack_120 = uStack_450;
  auVar148 = packsswb(auVar147,auVar148);
  local_468 = auVar148._0_8_;
  uStack_460 = auVar148._8_8_;
  uStack_3a0 = uStack_460;
  local_268 = 0xffffffffffffffff;
  uStack_260 = 0xffffffffffffffff;
  local_258 = local_468;
  uStack_250 = uStack_460;
  auVar127._8_8_ = 0xffffffffffffffff;
  auVar127._0_8_ = 0xffffffffffffffff;
  auVar147 = psubsb(auVar148,auVar127);
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_3e8 = local_458;
  uVar7 = local_3e8;
  uStack_3e0 = uStack_450;
  local_3f8 = local_458;
  uStack_3f0 = uStack_450;
  local_3e8._0_1_ = auVar147[0];
  local_3e8._1_1_ = auVar147[1];
  local_3e8._2_1_ = auVar147[2];
  local_3e8._3_1_ = auVar147[3];
  local_3e8._4_1_ = auVar147[4];
  local_3e8._5_1_ = auVar147[5];
  local_3e8._6_1_ = auVar147[6];
  local_3e8._7_1_ = auVar147[7];
  local_458._0_2_ = CONCAT11((undefined1)local_3e8,(undefined1)local_3e8);
  local_458._0_3_ = CONCAT12(local_3e8._1_1_,(undefined2)local_458);
  local_458._0_4_ = CONCAT13(local_3e8._1_1_,(undefined3)local_458);
  local_458._0_5_ = CONCAT14(local_3e8._2_1_,(undefined4)local_458);
  local_458._0_6_ = CONCAT15(local_3e8._2_1_,(undefined5)local_458);
  local_458._0_7_ = CONCAT16(local_3e8._3_1_,(undefined6)local_458);
  local_458 = CONCAT17(local_3e8._3_1_,(undefined7)local_458);
  uStack_450._0_1_ = local_3e8._4_1_;
  uStack_450._1_1_ = local_3e8._4_1_;
  uStack_450._2_1_ = local_3e8._5_1_;
  uStack_450._3_1_ = local_3e8._5_1_;
  uStack_450._4_1_ = local_3e8._6_1_;
  uStack_450._5_1_ = local_3e8._6_1_;
  uStack_450._6_1_ = local_3e8._7_1_;
  uStack_450._7_1_ = local_3e8._7_1_;
  local_b8 = local_458;
  uStack_b0 = uStack_450;
  local_bc = 9;
  auVar135._8_8_ = uStack_450;
  auVar135._0_8_ = local_458;
  auVar147 = psraw(auVar135,ZEXT416(9));
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_138 = local_458;
  uStack_130 = uStack_450;
  local_148 = local_458;
  uStack_140 = uStack_450;
  auVar147 = packsswb(auVar147,auVar147);
  local_178 = local_2018;
  uStack_170 = uStack_2010;
  local_458 = auVar147._0_8_;
  uStack_450 = auVar147._8_8_;
  local_188 = local_458;
  uStack_180 = uStack_450;
  local_3b8 = ~local_2018 & local_458;
  uStack_3b0 = ~uStack_2010 & uStack_450;
  uStack_450 = uStack_3b0;
  local_458 = local_3b8;
  auVar147 = _local_458;
  uStack_460._4_4_ = auVar148._12_4_;
  uVar21 = uStack_460._4_4_;
  local_458._0_4_ = (undefined4)local_3b8;
  uStack_450._4_4_ = (undefined4)(uStack_3b0 >> 0x20);
  uStack_4c = uStack_460._4_4_;
  local_48 = CONCAT44(local_48._4_4_,(undefined4)local_458);
  uStack_5c = uStack_450._4_4_;
  _local_58 = CONCAT44(auVar148._4_4_,0x80808080);
  uStack_4a0 = uStack_50;
  uStack_49c = uStack_460._4_4_;
  local_498._4_4_ = uStack_450._4_4_;
  local_498._0_4_ = uStack_60;
  local_3a8 = local_468;
  uStack_460 = local_3b8;
  local_278 = local_498._0_8_;
  local_288 = local_468;
  auVar126._8_8_ = uStack_270;
  auVar126._0_8_ = local_498._0_8_;
  auVar125._8_8_ = local_3b8;
  auVar125._0_8_ = local_468;
  local_498 = psubsb(auVar126,auVar125);
  uStack_1c0 = CONCAT44(uVar21,uStack_50);
  local_1c8 = local_4a8;
  auVar132._8_8_ = uStack_1d0;
  auVar132._0_8_ = local_1d8;
  auVar131._8_8_ = uStack_1c0;
  auVar131._0_8_ = local_4a8;
  local_488 = paddsb(auVar132,auVar131);
  local_2d8 = local_498._0_8_;
  uStack_2d0 = local_498._8_8_;
  uStack_2040 = local_498._0_8_ ^ 0x8080808080808080;
  uStack_207c = local_498._12_4_ ^ 0x80808080;
  local_2088[0] = (undefined4)uStack_2040;
  local_2f8 = local_488._0_8_;
  uStack_2f0 = local_488._8_8_;
  local_308 = 0x8080808080808080;
  uStack_300 = 0x8080808080808080;
  local_1e48 = local_488._0_8_ ^ 0x8080808080808080;
  uStack_208c = local_488._12_4_ ^ 0x80808080;
  uStack_4dc = uStack_208c;
  local_4d8 = CONCAT44(local_4d8._4_4_,local_2088[0]);
  uStack_4ec = uStack_207c;
  _local_4e8 = CONCAT44((int)(local_1e48 >> 0x20),local_2078);
  uStack_2050 = CONCAT44(local_488._12_4_,uStack_4e0) ^ 0x8080808000000000;
  local_2048 = CONCAT44(local_498._12_4_,uStack_4f0) ^ 0x8080808000000000;
  b_02[1] = b[1];
  a_03[1] = in_RSI;
  a_03[0] = (longlong)in_RDI;
  local_1d48 = uVar1;
  uStack_1d40 = uVar2;
  local_1d38 = uVar3;
  uStack_1d30 = uVar4;
  local_1be8 = uVar5;
  uStack_1be0 = uVar6;
  _local_458 = auVar147;
  local_3e8 = uVar7;
  local_3c8 = uVar17;
  local_388 = local_398;
  uStack_380 = uStack_390;
  local_368 = local_448;
  uStack_360 = uStack_440;
  local_358 = local_448;
  uStack_350 = uStack_440;
  local_2e8 = local_448;
  uStack_2e0 = uStack_440;
  local_2c8 = local_448;
  uStack_2c0 = uStack_440;
  local_2a8 = local_448;
  uStack_2a0 = uStack_440;
  uStack_280 = local_3b8;
  uStack_1e0 = uStack_270;
  local_1b8 = local_1d8;
  uStack_1b0 = uStack_1d0;
  local_1a8 = local_438;
  uStack_1a0 = uStack_430;
  local_198 = local_398;
  uStack_190 = local_398;
  uStack_150 = uVar20;
  local_108 = local_448;
  uStack_100 = uStack_440;
  local_e8 = local_438;
  uStack_e0 = uStack_430;
  local_68 = local_3b8;
  alVar187 = abs_diff(a_03,b_02);
  b_03[0] = alVar187[1];
  b_03[1] = b[1];
  a_04[1] = in_RSI;
  a_04[0] = (longlong)in_RDI;
  alVar187 = abs_diff(a_04,b_03);
  b_04[0] = alVar187[1];
  local_1c18 = (byte)extraout_XMM0_Qa_03;
  bStack_1c17 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_1c16 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_1c15 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_1c14 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_1c13 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_1c12 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_1c11 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_1c10 = (byte)extraout_XMM0_Qb_03;
  bStack_1c0f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_1c0e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_1c0d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_1c0c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_1c0b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_1c0a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_1c09 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_1c28 = (byte)extraout_XMM0_Qa_04;
  bStack_1c27 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_1c26 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_1c25 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_1c24 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_1c23 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_1c22 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_1c21 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_1c20 = (byte)extraout_XMM0_Qb_04;
  bStack_1c1f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_1c1e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_1c1d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_1c1c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_1c1b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_1c1a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_1c19 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  bVar139 = (local_1c18 < local_1c28) * local_1c28 | (local_1c18 >= local_1c28) * local_1c18;
  bVar149 = (bStack_1c17 < bStack_1c27) * bStack_1c27 | (bStack_1c17 >= bStack_1c27) * bStack_1c17;
  bVar150 = (bStack_1c16 < bStack_1c26) * bStack_1c26 | (bStack_1c16 >= bStack_1c26) * bStack_1c16;
  bVar154 = (bStack_1c15 < bStack_1c25) * bStack_1c25 | (bStack_1c15 >= bStack_1c25) * bStack_1c15;
  bVar155 = (bStack_1c14 < bStack_1c24) * bStack_1c24 | (bStack_1c14 >= bStack_1c24) * bStack_1c14;
  bVar159 = (bStack_1c13 < bStack_1c23) * bStack_1c23 | (bStack_1c13 >= bStack_1c23) * bStack_1c13;
  bVar160 = (bStack_1c12 < bStack_1c22) * bStack_1c22 | (bStack_1c12 >= bStack_1c22) * bStack_1c12;
  bVar164 = (bStack_1c11 < bStack_1c21) * bStack_1c21 | (bStack_1c11 >= bStack_1c21) * bStack_1c11;
  bVar165 = (bStack_1c10 < bStack_1c20) * bStack_1c20 | (bStack_1c10 >= bStack_1c20) * bStack_1c10;
  bVar171 = (bStack_1c0f < bStack_1c1f) * bStack_1c1f | (bStack_1c0f >= bStack_1c1f) * bStack_1c0f;
  bVar172 = (bStack_1c0e < bStack_1c1e) * bStack_1c1e | (bStack_1c0e >= bStack_1c1e) * bStack_1c0e;
  bVar176 = (bStack_1c0d < bStack_1c1d) * bStack_1c1d | (bStack_1c0d >= bStack_1c1d) * bStack_1c0d;
  bVar177 = (bStack_1c0c < bStack_1c1c) * bStack_1c1c | (bStack_1c0c >= bStack_1c1c) * bStack_1c0c;
  bVar181 = (bStack_1c0b < bStack_1c1b) * bStack_1c1b | (bStack_1c0b >= bStack_1c1b) * bStack_1c0b;
  bVar182 = (bStack_1c0a < bStack_1c1a) * bStack_1c1a | (bStack_1c0a >= bStack_1c1a) * bStack_1c0a;
  bVar186 = (bStack_1c09 < bStack_1c19) * bStack_1c19 | (bStack_1c09 >= bStack_1c19) * bStack_1c09;
  local_2028._0_2_ = CONCAT11(bVar149,bVar139);
  local_2028._0_3_ = CONCAT12(bVar150,(undefined2)local_2028);
  local_2028._0_4_ = CONCAT13(bVar154,(undefined3)local_2028);
  local_2028._0_5_ = CONCAT14(bVar155,(undefined4)local_2028);
  local_2028._0_6_ = CONCAT15(bVar159,(undefined5)local_2028);
  local_2028._0_7_ = CONCAT16(bVar160,(undefined6)local_2028);
  local_2028 = CONCAT17(bVar164,(undefined7)local_2028);
  uStack_2020._0_1_ = bVar165;
  uStack_2020._1_1_ = bVar171;
  uStack_2020._2_1_ = bVar172;
  uStack_2020._3_1_ = bVar176;
  uStack_2020._4_1_ = bVar177;
  uStack_2020._5_1_ = bVar181;
  uStack_2020._6_1_ = bVar182;
  uStack_2020._7_1_ = bVar186;
  local_1c38 = local_20a8;
  uVar5 = local_1c38;
  uStack_1c30 = uStack_20a0;
  uVar6 = uStack_1c30;
  local_1c48 = local_2028;
  uStack_1c40 = uStack_2020;
  local_1c38._0_1_ = (byte)local_20a8;
  local_1c38._1_1_ = (byte)((ulong)local_20a8 >> 8);
  local_1c38._2_1_ = (byte)((ulong)local_20a8 >> 0x10);
  local_1c38._3_1_ = (byte)((ulong)local_20a8 >> 0x18);
  local_1c38._4_1_ = (byte)((ulong)local_20a8 >> 0x20);
  local_1c38._5_1_ = (byte)((ulong)local_20a8 >> 0x28);
  local_1c38._6_1_ = (byte)((ulong)local_20a8 >> 0x30);
  local_1c38._7_1_ = (byte)((ulong)local_20a8 >> 0x38);
  uStack_1c30._0_1_ = (byte)uStack_20a0;
  uStack_1c30._1_1_ = (byte)((ulong)uStack_20a0 >> 8);
  uStack_1c30._2_1_ = (byte)((ulong)uStack_20a0 >> 0x10);
  uStack_1c30._3_1_ = (byte)((ulong)uStack_20a0 >> 0x18);
  uStack_1c30._4_1_ = (byte)((ulong)uStack_20a0 >> 0x20);
  uStack_1c30._5_1_ = (byte)((ulong)uStack_20a0 >> 0x28);
  uStack_1c30._6_1_ = (byte)((ulong)uStack_20a0 >> 0x30);
  uStack_1c30._7_1_ = (byte)((ulong)uStack_20a0 >> 0x38);
  bVar139 = ((byte)local_1c38 < bVar139) * bVar139 |
            ((byte)local_1c38 >= bVar139) * (byte)local_1c38;
  bVar149 = (local_1c38._1_1_ < bVar149) * bVar149 |
            (local_1c38._1_1_ >= bVar149) * local_1c38._1_1_;
  bVar150 = (local_1c38._2_1_ < bVar150) * bVar150 |
            (local_1c38._2_1_ >= bVar150) * local_1c38._2_1_;
  bVar154 = (local_1c38._3_1_ < bVar154) * bVar154 |
            (local_1c38._3_1_ >= bVar154) * local_1c38._3_1_;
  bVar155 = (local_1c38._4_1_ < bVar155) * bVar155 |
            (local_1c38._4_1_ >= bVar155) * local_1c38._4_1_;
  bVar159 = (local_1c38._5_1_ < bVar159) * bVar159 |
            (local_1c38._5_1_ >= bVar159) * local_1c38._5_1_;
  bVar160 = (local_1c38._6_1_ < bVar160) * bVar160 |
            (local_1c38._6_1_ >= bVar160) * local_1c38._6_1_;
  bVar164 = (local_1c38._7_1_ < bVar164) * bVar164 |
            (local_1c38._7_1_ >= bVar164) * local_1c38._7_1_;
  bVar165 = ((byte)uStack_1c30 < bVar165) * bVar165 |
            ((byte)uStack_1c30 >= bVar165) * (byte)uStack_1c30;
  bVar171 = (uStack_1c30._1_1_ < bVar171) * bVar171 |
            (uStack_1c30._1_1_ >= bVar171) * uStack_1c30._1_1_;
  bVar172 = (uStack_1c30._2_1_ < bVar172) * bVar172 |
            (uStack_1c30._2_1_ >= bVar172) * uStack_1c30._2_1_;
  bVar176 = (uStack_1c30._3_1_ < bVar176) * bVar176 |
            (uStack_1c30._3_1_ >= bVar176) * uStack_1c30._3_1_;
  bVar177 = (uStack_1c30._4_1_ < bVar177) * bVar177 |
            (uStack_1c30._4_1_ >= bVar177) * uStack_1c30._4_1_;
  bVar181 = (uStack_1c30._5_1_ < bVar181) * bVar181 |
            (uStack_1c30._5_1_ >= bVar181) * uStack_1c30._5_1_;
  bVar182 = (uStack_1c30._6_1_ < bVar182) * bVar182 |
            (uStack_1c30._6_1_ >= bVar182) * uStack_1c30._6_1_;
  bVar186 = (uStack_1c30._7_1_ < bVar186) * bVar186 |
            (uStack_1c30._7_1_ >= bVar186) * uStack_1c30._7_1_;
  local_2028._0_2_ = CONCAT11(bVar149,bVar139);
  local_2028._0_3_ = CONCAT12(bVar150,(undefined2)local_2028);
  local_2028._0_4_ = CONCAT13(bVar154,(undefined3)local_2028);
  local_2028._0_5_ = CONCAT14(bVar155,(undefined4)local_2028);
  local_2028._0_6_ = CONCAT15(bVar159,(undefined5)local_2028);
  local_2028._0_7_ = CONCAT16(bVar160,(undefined6)local_2028);
  local_2028 = CONCAT17(bVar164,(undefined7)local_2028);
  uStack_2020._0_1_ = bVar165;
  uStack_2020._1_1_ = bVar171;
  uStack_2020._2_1_ = bVar172;
  uStack_2020._3_1_ = bVar176;
  uStack_2020._4_1_ = bVar177;
  uStack_2020._5_1_ = bVar181;
  uStack_2020._6_1_ = bVar182;
  uStack_2020._7_1_ = bVar186;
  local_1c58 = local_2028;
  uStack_1c50 = uStack_2020;
  local_1c68 = uStack_2020;
  uStack_1c60 = 0;
  local_2028._0_2_ =
       CONCAT11((bVar149 < bVar171) * bVar171 | (bVar149 >= bVar171) * bVar149,
                (bVar139 < bVar165) * bVar165 | (bVar139 >= bVar165) * bVar139);
  local_2028._0_3_ =
       CONCAT12((bVar150 < bVar172) * bVar172 | (bVar150 >= bVar172) * bVar150,
                (undefined2)local_2028);
  local_2028._0_4_ =
       CONCAT13((bVar154 < bVar176) * bVar176 | (bVar154 >= bVar176) * bVar154,
                (undefined3)local_2028);
  local_2028._0_5_ =
       CONCAT14((bVar155 < bVar177) * bVar177 | (bVar155 >= bVar177) * bVar155,
                (undefined4)local_2028);
  local_2028._0_6_ =
       CONCAT15((bVar159 < bVar181) * bVar181 | (bVar159 >= bVar181) * bVar159,
                (undefined5)local_2028);
  local_2028._0_7_ =
       CONCAT16((bVar160 < bVar182) * bVar182 | (bVar160 >= bVar182) * bVar160,
                (undefined6)local_2028);
  local_2028 = CONCAT17((bVar164 < bVar186) * bVar186 | (bVar164 >= bVar186) * bVar164,
                        (undefined7)local_2028);
  local_1718 = local_2028;
  uStack_1710 = uStack_2020;
  local_1728 = local_1ff8;
  uStack_1720 = uStack_1ff0;
  auVar120._8_8_ = uStack_2020;
  auVar120._0_8_ = local_2028;
  auVar119._8_8_ = uStack_1ff0;
  auVar119._0_8_ = local_1ff8;
  auVar147 = psubusb(auVar120,auVar119);
  local_2028 = auVar147._0_8_;
  uStack_2020 = auVar147._8_8_;
  local_1d58 = local_2028;
  uVar3 = local_1d58;
  uStack_1d50 = uStack_2020;
  uVar4 = uStack_1d50;
  local_1d68 = local_1fe8;
  uVar1 = local_1d68;
  uStack_1d60 = uStack_1fe0;
  uVar2 = uStack_1d60;
  local_1d58._0_1_ = auVar147[0];
  local_1d58._1_1_ = auVar147[1];
  local_1d58._2_1_ = auVar147[2];
  local_1d58._3_1_ = auVar147[3];
  local_1d58._4_1_ = auVar147[4];
  local_1d58._5_1_ = auVar147[5];
  local_1d58._6_1_ = auVar147[6];
  local_1d58._7_1_ = auVar147[7];
  uStack_1d50._0_1_ = auVar147[8];
  uStack_1d50._1_1_ = auVar147[9];
  uStack_1d50._2_1_ = auVar147[10];
  uStack_1d50._3_1_ = auVar147[0xb];
  uStack_1d50._4_1_ = auVar147[0xc];
  uStack_1d50._5_1_ = auVar147[0xd];
  uStack_1d50._6_1_ = auVar147[0xe];
  uStack_1d50._7_1_ = auVar147[0xf];
  local_1d68._0_1_ = (char)local_1fe8;
  local_1d68._1_1_ = (char)((ulong)local_1fe8 >> 8);
  local_1d68._2_1_ = (char)((ulong)local_1fe8 >> 0x10);
  local_1d68._3_1_ = (char)((ulong)local_1fe8 >> 0x18);
  local_1d68._4_1_ = (char)((ulong)local_1fe8 >> 0x20);
  local_1d68._5_1_ = (char)((ulong)local_1fe8 >> 0x28);
  local_1d68._6_1_ = (char)((ulong)local_1fe8 >> 0x30);
  local_1d68._7_1_ = (char)((ulong)local_1fe8 >> 0x38);
  uStack_1d60._0_1_ = (char)uStack_1fe0;
  uStack_1d60._1_1_ = (char)((ulong)uStack_1fe0 >> 8);
  uStack_1d60._2_1_ = (char)((ulong)uStack_1fe0 >> 0x10);
  uStack_1d60._3_1_ = (char)((ulong)uStack_1fe0 >> 0x18);
  uStack_1d60._4_1_ = (char)((ulong)uStack_1fe0 >> 0x20);
  uStack_1d60._5_1_ = (char)((ulong)uStack_1fe0 >> 0x28);
  uStack_1d60._6_1_ = (char)((ulong)uStack_1fe0 >> 0x30);
  uStack_1d60._7_1_ = (char)((ulong)uStack_1fe0 >> 0x38);
  local_2028._0_2_ =
       CONCAT11(-(local_1d58._1_1_ == local_1d68._1_1_),-((char)local_1d58 == (char)local_1d68));
  local_2028._0_3_ = CONCAT12(-(local_1d58._2_1_ == local_1d68._2_1_),(undefined2)local_2028);
  local_2028._0_4_ = CONCAT13(-(local_1d58._3_1_ == local_1d68._3_1_),(undefined3)local_2028);
  local_2028._0_5_ = CONCAT14(-(local_1d58._4_1_ == local_1d68._4_1_),(undefined4)local_2028);
  local_2028._0_6_ = CONCAT15(-(local_1d58._5_1_ == local_1d68._5_1_),(undefined5)local_2028);
  local_2028._0_7_ = CONCAT16(-(local_1d58._6_1_ == local_1d68._6_1_),(undefined6)local_2028);
  local_2028 = CONCAT17(-(local_1d58._7_1_ == local_1d68._7_1_),(undefined7)local_2028);
  uStack_2020._0_1_ = -((char)uStack_1d50 == (char)uStack_1d60);
  uStack_2020._1_1_ = -(uStack_1d50._1_1_ == uStack_1d60._1_1_);
  uStack_2020._2_1_ = -(uStack_1d50._2_1_ == uStack_1d60._2_1_);
  uStack_2020._3_1_ = -(uStack_1d50._3_1_ == uStack_1d60._3_1_);
  uStack_2020._4_1_ = -(uStack_1d50._4_1_ == uStack_1d60._4_1_);
  uStack_2020._5_1_ = -(uStack_1d50._5_1_ == uStack_1d60._5_1_);
  uStack_2020._6_1_ = -(uStack_1d50._6_1_ == uStack_1d60._6_1_);
  uStack_2020._7_1_ = -(uStack_1d50._7_1_ == uStack_1d60._7_1_);
  local_1778 = local_2028;
  uStack_1770 = uStack_2020;
  local_1788 = local_2008;
  uStack_1780 = uStack_2000;
  local_2028 = local_2028 & local_2008;
  uStack_2020 = uStack_2020 & uStack_2000;
  local_1d88 = local_1fe8;
  uStack_1d80 = uStack_1fe0;
  local_1d78._0_1_ = (char)local_2028;
  local_1d78._1_1_ = (char)(local_2028 >> 8);
  local_1d78._2_1_ = (char)(local_2028 >> 0x10);
  local_1d78._3_1_ = (char)(local_2028 >> 0x18);
  local_1d78._4_1_ = (char)(local_2028 >> 0x20);
  local_1d78._5_1_ = (char)(local_2028 >> 0x28);
  local_1d78._6_1_ = (char)(local_2028 >> 0x30);
  local_1d78._7_1_ = (char)(local_2028 >> 0x38);
  uStack_1d70._0_1_ = (char)uStack_2020;
  uStack_1d70._1_1_ = (char)(uStack_2020 >> 8);
  uStack_1d70._2_1_ = (char)(uStack_2020 >> 0x10);
  uStack_1d70._3_1_ = (char)(uStack_2020 >> 0x18);
  uStack_1d70._4_1_ = (char)(uStack_2020 >> 0x20);
  uStack_1d70._5_1_ = (char)(uStack_2020 >> 0x28);
  uStack_1d70._6_1_ = (char)(uStack_2020 >> 0x30);
  uStack_1d70._7_1_ = (char)(uStack_2020 >> 0x38);
  local_1658 = -((char)local_1d78 == (char)local_1d68);
  cStack_1657 = -(local_1d78._1_1_ == local_1d68._1_1_);
  cStack_1656 = -(local_1d78._2_1_ == local_1d68._2_1_);
  cStack_1655 = -(local_1d78._3_1_ == local_1d68._3_1_);
  cStack_1654 = -(local_1d78._4_1_ == local_1d68._4_1_);
  cStack_1653 = -(local_1d78._5_1_ == local_1d68._5_1_);
  cStack_1652 = -(local_1d78._6_1_ == local_1d68._6_1_);
  cStack_1651 = -(local_1d78._7_1_ == local_1d68._7_1_);
  cStack_1650 = -((char)uStack_1d70 == (char)uStack_1d60);
  cStack_164f = -(uStack_1d70._1_1_ == uStack_1d60._1_1_);
  cStack_164e = -(uStack_1d70._2_1_ == uStack_1d60._2_1_);
  cStack_164d = -(uStack_1d70._3_1_ == uStack_1d60._3_1_);
  cStack_164c = -(uStack_1d70._4_1_ == uStack_1d60._4_1_);
  cStack_164b = -(uStack_1d70._5_1_ == uStack_1d60._5_1_);
  cStack_164a = -(uStack_1d70._6_1_ == uStack_1d60._6_1_);
  bStack_1649 = -(uStack_1d70._7_1_ == uStack_1d60._7_1_);
  auVar124[1] = cStack_1657;
  auVar124[0] = local_1658;
  auVar124[2] = cStack_1656;
  auVar124[3] = cStack_1655;
  auVar124[4] = cStack_1654;
  auVar124[5] = cStack_1653;
  auVar124[6] = cStack_1652;
  auVar124[7] = cStack_1651;
  auVar124[8] = cStack_1650;
  auVar124[9] = cStack_164f;
  auVar124[10] = cStack_164e;
  auVar124[0xb] = cStack_164d;
  auVar124[0xc] = cStack_164c;
  auVar124[0xd] = cStack_164b;
  auVar124[0xe] = cStack_164a;
  auVar124[0xf] = bStack_1649;
  uVar144 = (ushort)(SUB161(auVar124 >> 7,0) & 1) | (ushort)(SUB161(auVar124 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar124 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar124 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar124 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar124 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar124 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar124 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar124 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar124 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar124 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar124 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar124 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar124 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar124 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1649 >> 7) << 0xf;
  if (uVar144 == 0xffff) {
    *local_1fc0 = local_2048;
    local_1fc0[1] = uStack_2040;
    *local_1fb8 = local_2058;
    local_1fb8[1] = uStack_2050;
  }
  else {
    local_13fa = 8;
    local_2a = 8;
    local_2c = 8;
    local_2e = 8;
    local_30 = 8;
    local_32 = 8;
    local_34 = 8;
    local_36 = 8;
    local_38 = 8;
    local_21b8 = 0x8000800080008;
    uStack_21b0 = 0x8000800080008;
    local_13fc = 4;
    local_2 = 4;
    local_4 = 4;
    local_6 = 4;
    local_8 = 4;
    local_a = 4;
    local_c = 4;
    local_e = 4;
    local_10 = 4;
    local_21c8 = 0x4000400040004;
    uStack_21c0 = 0x4000400040004;
    uVar7 = *local_1f90;
    uStack_1ea0 = local_1f90[1];
    local_1eb8 = local_1fe8;
    uStack_1eb0 = uStack_1fe0;
    local_1ea8._0_1_ = (undefined1)uVar7;
    local_1ea8._1_1_ = (undefined1)((ulong)uVar7 >> 8);
    local_1ea8._2_1_ = (undefined1)((ulong)uVar7 >> 0x10);
    local_1ea8._3_1_ = (undefined1)((ulong)uVar7 >> 0x18);
    local_1ea8._4_1_ = (undefined1)((ulong)uVar7 >> 0x20);
    local_1ea8._5_1_ = (undefined1)((ulong)uVar7 >> 0x28);
    local_1ea8._6_1_ = (undefined1)((ulong)uVar7 >> 0x30);
    local_1ea8._7_1_ = (undefined1)((ulong)uVar7 >> 0x38);
    local_21d8 = (undefined1)local_1ea8;
    cStack_21d7 = (char)local_1d68;
    uStack_21d6 = local_1ea8._1_1_;
    cStack_21d5 = local_1d68._1_1_;
    uStack_21d4 = local_1ea8._2_1_;
    cStack_21d3 = local_1d68._2_1_;
    uStack_21d2 = local_1ea8._3_1_;
    cStack_21d1 = local_1d68._3_1_;
    uStack_21d0 = local_1ea8._4_1_;
    cStack_21cf = local_1d68._4_1_;
    uStack_21ce = local_1ea8._5_1_;
    cStack_21cd = local_1d68._5_1_;
    uStack_21cc = local_1ea8._6_1_;
    cStack_21cb = local_1d68._6_1_;
    uStack_21ca = local_1ea8._7_1_;
    cStack_21c9 = local_1d68._7_1_;
    uVar8 = *local_1f98;
    uStack_1ec0 = local_1f98[1];
    local_1ed8 = local_1fe8;
    uStack_1ed0 = uStack_1fe0;
    local_1ec8._0_1_ = (undefined1)uVar8;
    local_1ec8._1_1_ = (undefined1)(uVar8 >> 8);
    local_1ec8._2_1_ = (undefined1)(uVar8 >> 0x10);
    local_1ec8._3_1_ = (undefined1)(uVar8 >> 0x18);
    local_1ec8._4_1_ = (undefined1)(uVar8 >> 0x20);
    local_1ec8._5_1_ = (undefined1)(uVar8 >> 0x28);
    local_1ec8._6_1_ = (undefined1)(uVar8 >> 0x30);
    local_1ec8._7_1_ = (undefined1)(uVar8 >> 0x38);
    local_21e8 = (undefined1)local_1ec8;
    cStack_21e7 = (char)local_1d68;
    uStack_21e6 = local_1ec8._1_1_;
    cStack_21e5 = local_1d68._1_1_;
    uStack_21e4 = local_1ec8._2_1_;
    cStack_21e3 = local_1d68._2_1_;
    uStack_21e2 = local_1ec8._3_1_;
    cStack_21e1 = local_1d68._3_1_;
    uStack_21e0 = local_1ec8._4_1_;
    cStack_21df = local_1d68._4_1_;
    uStack_21de = local_1ec8._5_1_;
    cStack_21dd = local_1d68._5_1_;
    uStack_21dc = local_1ec8._6_1_;
    cStack_21db = local_1d68._6_1_;
    uStack_21da = local_1ec8._7_1_;
    cStack_21d9 = local_1d68._7_1_;
    uVar145 = *local_1fa0;
    uStack_1ee0 = local_1fa0[1];
    local_1ef8 = local_1fe8;
    uStack_1ef0 = uStack_1fe0;
    local_1ee8._0_1_ = (undefined1)uVar145;
    local_1ee8._1_1_ = (undefined1)(uVar145 >> 8);
    local_1ee8._2_1_ = (undefined1)(uVar145 >> 0x10);
    local_1ee8._3_1_ = (undefined1)(uVar145 >> 0x18);
    local_1ee8._4_1_ = (undefined1)(uVar145 >> 0x20);
    local_1ee8._5_1_ = (undefined1)(uVar145 >> 0x28);
    local_1ee8._6_1_ = (undefined1)(uVar145 >> 0x30);
    local_1ee8._7_1_ = (undefined1)(uVar145 >> 0x38);
    local_21f8 = (undefined1)local_1ee8;
    cStack_21f7 = (char)local_1d68;
    uStack_21f6 = local_1ee8._1_1_;
    cStack_21f5 = local_1d68._1_1_;
    uStack_21f4 = local_1ee8._2_1_;
    cStack_21f3 = local_1d68._2_1_;
    uStack_21f2 = local_1ee8._3_1_;
    cStack_21f1 = local_1d68._3_1_;
    uStack_21f0 = local_1ee8._4_1_;
    cStack_21ef = local_1d68._4_1_;
    uStack_21ee = local_1ee8._5_1_;
    cStack_21ed = local_1d68._5_1_;
    uStack_21ec = local_1ee8._6_1_;
    cStack_21eb = local_1d68._6_1_;
    uStack_21ea = local_1ee8._7_1_;
    cStack_21e9 = local_1d68._7_1_;
    uVar146 = *local_1fa8;
    uStack_1f00 = local_1fa8[1];
    local_1f18 = local_1fe8;
    uStack_1f10 = uStack_1fe0;
    local_1f08._0_1_ = (undefined1)uVar146;
    local_1f08._1_1_ = (undefined1)(uVar146 >> 8);
    local_1f08._2_1_ = (undefined1)(uVar146 >> 0x10);
    local_1f08._3_1_ = (undefined1)(uVar146 >> 0x18);
    local_1f08._4_1_ = (undefined1)(uVar146 >> 0x20);
    local_1f08._5_1_ = (undefined1)(uVar146 >> 0x28);
    local_1f08._6_1_ = (undefined1)(uVar146 >> 0x30);
    local_1f08._7_1_ = (undefined1)(uVar146 >> 0x38);
    local_2208 = (undefined1)local_1f08;
    cStack_2207 = (char)local_1d68;
    uStack_2206 = local_1f08._1_1_;
    cStack_2205 = local_1d68._1_1_;
    uStack_2204 = local_1f08._2_1_;
    cStack_2203 = local_1d68._2_1_;
    uStack_2202 = local_1f08._3_1_;
    cStack_2201 = local_1d68._3_1_;
    uStack_2200 = local_1f08._4_1_;
    cStack_21ff = local_1d68._4_1_;
    uStack_21fe = local_1f08._5_1_;
    cStack_21fd = local_1d68._5_1_;
    uStack_21fc = local_1f08._6_1_;
    cStack_21fb = local_1d68._6_1_;
    uStack_21fa = local_1f08._7_1_;
    cStack_21f9 = local_1d68._7_1_;
    uVar170 = *local_1fb0;
    uStack_1f20 = local_1fb0[1];
    local_1f38 = local_1fe8;
    uStack_1f30 = uStack_1fe0;
    local_1f28._0_1_ = (undefined1)uVar170;
    local_1f28._1_1_ = (undefined1)(uVar170 >> 8);
    local_1f28._2_1_ = (undefined1)(uVar170 >> 0x10);
    local_1f28._3_1_ = (undefined1)(uVar170 >> 0x18);
    local_1f28._4_1_ = (undefined1)(uVar170 >> 0x20);
    local_1f28._5_1_ = (undefined1)(uVar170 >> 0x28);
    local_1f28._6_1_ = (undefined1)(uVar170 >> 0x30);
    local_1f28._7_1_ = (undefined1)(uVar170 >> 0x38);
    local_2218 = (undefined1)local_1f28;
    cStack_2217 = (char)local_1d68;
    uStack_2216 = local_1f28._1_1_;
    cStack_2215 = local_1d68._1_1_;
    uStack_2214 = local_1f28._2_1_;
    cStack_2213 = local_1d68._2_1_;
    uStack_2212 = local_1f28._3_1_;
    cStack_2211 = local_1d68._3_1_;
    uStack_2210 = local_1f28._4_1_;
    cStack_220f = local_1d68._4_1_;
    uStack_220e = local_1f28._5_1_;
    cStack_220d = local_1d68._5_1_;
    uStack_220c = local_1f28._6_1_;
    cStack_220b = local_1d68._6_1_;
    uStack_220a = local_1f28._7_1_;
    cStack_2209 = local_1d68._7_1_;
    uVar9 = *local_1fb8;
    uStack_1f40 = local_1fb8[1];
    local_1f58 = local_1fe8;
    uStack_1f50 = uStack_1fe0;
    local_1f48._0_1_ = (undefined1)uVar9;
    local_1f48._1_1_ = (undefined1)(uVar9 >> 8);
    local_1f48._2_1_ = (undefined1)(uVar9 >> 0x10);
    local_1f48._3_1_ = (undefined1)(uVar9 >> 0x18);
    local_1f48._4_1_ = (undefined1)(uVar9 >> 0x20);
    local_1f48._5_1_ = (undefined1)(uVar9 >> 0x28);
    local_1f48._6_1_ = (undefined1)(uVar9 >> 0x30);
    local_1f48._7_1_ = (undefined1)(uVar9 >> 0x38);
    local_2228 = (undefined1)local_1f48;
    cStack_2227 = (char)local_1d68;
    uStack_2226 = local_1f48._1_1_;
    cStack_2225 = local_1d68._1_1_;
    uStack_2224 = local_1f48._2_1_;
    cStack_2223 = local_1d68._2_1_;
    uStack_2222 = local_1f48._3_1_;
    cStack_2221 = local_1d68._3_1_;
    uStack_2220 = local_1f48._4_1_;
    cStack_221f = local_1d68._4_1_;
    uStack_221e = local_1f48._5_1_;
    cStack_221d = local_1d68._5_1_;
    uStack_221c = local_1f48._6_1_;
    cStack_221b = local_1d68._6_1_;
    uStack_221a = local_1f48._7_1_;
    cStack_2219 = local_1d68._7_1_;
    uVar10 = *local_1fc0;
    uStack_1f60 = local_1fc0[1];
    local_1f78 = local_1fe8;
    uStack_1f70 = uStack_1fe0;
    local_1f68._0_1_ = (undefined1)uVar10;
    local_1f68._1_1_ = (undefined1)(uVar10 >> 8);
    local_1f68._2_1_ = (undefined1)(uVar10 >> 0x10);
    local_1f68._3_1_ = (undefined1)(uVar10 >> 0x18);
    local_1f68._4_1_ = (undefined1)(uVar10 >> 0x20);
    local_1f68._5_1_ = (undefined1)(uVar10 >> 0x28);
    local_1f68._6_1_ = (undefined1)(uVar10 >> 0x30);
    local_1f68._7_1_ = (undefined1)(uVar10 >> 0x38);
    local_2238 = (undefined1)local_1f68;
    cStack_2237 = (char)local_1d68;
    uStack_2236 = local_1f68._1_1_;
    cStack_2235 = local_1d68._1_1_;
    uStack_2234 = local_1f68._2_1_;
    cStack_2233 = local_1d68._2_1_;
    uStack_2232 = local_1f68._3_1_;
    cStack_2231 = local_1d68._3_1_;
    uStack_2230 = local_1f68._4_1_;
    cStack_222f = local_1d68._4_1_;
    uStack_222e = local_1f68._5_1_;
    cStack_222d = local_1d68._5_1_;
    uStack_222c = local_1f68._6_1_;
    cStack_222b = local_1d68._6_1_;
    uStack_222a = local_1f68._7_1_;
    cStack_2229 = local_1d68._7_1_;
    local_1328 = *local_1fc0;
    uVar11 = local_1fc0[1];
    local_1338 = local_1fe8;
    uStack_1330 = uStack_1fe0;
    uStack_1320._0_1_ = (undefined1)uVar11;
    uStack_1320._1_1_ = (undefined1)(uVar11 >> 8);
    uStack_1320._2_1_ = (undefined1)(uVar11 >> 0x10);
    uStack_1320._3_1_ = (undefined1)(uVar11 >> 0x18);
    uStack_1320._4_1_ = (undefined1)(uVar11 >> 0x20);
    uStack_1320._5_1_ = (undefined1)(uVar11 >> 0x28);
    uStack_1320._6_1_ = (undefined1)(uVar11 >> 0x30);
    uStack_1320._7_1_ = (undefined1)(uVar11 >> 0x38);
    local_22a8 = (undefined1)uStack_1320;
    cStack_22a7 = (char)uStack_1d60;
    uStack_22a6 = uStack_1320._1_1_;
    cStack_22a5 = uStack_1d60._1_1_;
    uStack_22a4 = uStack_1320._2_1_;
    cStack_22a3 = uStack_1d60._2_1_;
    uStack_22a2 = uStack_1320._3_1_;
    cStack_22a1 = uStack_1d60._3_1_;
    uStack_22a0 = uStack_1320._4_1_;
    cStack_229f = uStack_1d60._4_1_;
    uStack_229e = uStack_1320._5_1_;
    cStack_229d = uStack_1d60._5_1_;
    uStack_229c = uStack_1320._6_1_;
    cStack_229b = uStack_1d60._6_1_;
    uStack_229a = uStack_1320._7_1_;
    cStack_2299 = uStack_1d60._7_1_;
    local_1348 = *local_1fb8;
    uVar12 = local_1fb8[1];
    local_1358 = local_1fe8;
    uStack_1350 = uStack_1fe0;
    uStack_1340._0_1_ = (undefined1)uVar12;
    uStack_1340._1_1_ = (undefined1)(uVar12 >> 8);
    uStack_1340._2_1_ = (undefined1)(uVar12 >> 0x10);
    uStack_1340._3_1_ = (undefined1)(uVar12 >> 0x18);
    uStack_1340._4_1_ = (undefined1)(uVar12 >> 0x20);
    uStack_1340._5_1_ = (undefined1)(uVar12 >> 0x28);
    uStack_1340._6_1_ = (undefined1)(uVar12 >> 0x30);
    uStack_1340._7_1_ = (undefined1)(uVar12 >> 0x38);
    local_2298 = (undefined1)uStack_1340;
    cStack_2297 = (char)uStack_1d60;
    uStack_2296 = uStack_1340._1_1_;
    cStack_2295 = uStack_1d60._1_1_;
    uStack_2294 = uStack_1340._2_1_;
    cStack_2293 = uStack_1d60._2_1_;
    uStack_2292 = uStack_1340._3_1_;
    cStack_2291 = uStack_1d60._3_1_;
    uStack_2290 = uStack_1340._4_1_;
    cStack_228f = uStack_1d60._4_1_;
    uStack_228e = uStack_1340._5_1_;
    cStack_228d = uStack_1d60._5_1_;
    uStack_228c = uStack_1340._6_1_;
    cStack_228b = uStack_1d60._6_1_;
    uStack_228a = uStack_1340._7_1_;
    cStack_2289 = uStack_1d60._7_1_;
    local_1368 = *local_1fb0;
    uVar13 = local_1fb0[1];
    local_1378 = local_1fe8;
    uStack_1370 = uStack_1fe0;
    uStack_1360._0_1_ = (undefined1)uVar13;
    uStack_1360._1_1_ = (undefined1)(uVar13 >> 8);
    uStack_1360._2_1_ = (undefined1)(uVar13 >> 0x10);
    uStack_1360._3_1_ = (undefined1)(uVar13 >> 0x18);
    uStack_1360._4_1_ = (undefined1)(uVar13 >> 0x20);
    uStack_1360._5_1_ = (undefined1)(uVar13 >> 0x28);
    uStack_1360._6_1_ = (undefined1)(uVar13 >> 0x30);
    uStack_1360._7_1_ = (undefined1)(uVar13 >> 0x38);
    local_2288 = (undefined1)uStack_1360;
    cStack_2287 = (char)uStack_1d60;
    uStack_2286 = uStack_1360._1_1_;
    cStack_2285 = uStack_1d60._1_1_;
    uStack_2284 = uStack_1360._2_1_;
    cStack_2283 = uStack_1d60._2_1_;
    uStack_2282 = uStack_1360._3_1_;
    cStack_2281 = uStack_1d60._3_1_;
    uStack_2280 = uStack_1360._4_1_;
    cStack_227f = uStack_1d60._4_1_;
    uStack_227e = uStack_1360._5_1_;
    cStack_227d = uStack_1d60._5_1_;
    uStack_227c = uStack_1360._6_1_;
    cStack_227b = uStack_1d60._6_1_;
    uStack_227a = uStack_1360._7_1_;
    cStack_2279 = uStack_1d60._7_1_;
    local_1388 = *local_1fa8;
    uVar14 = local_1fa8[1];
    local_1398 = local_1fe8;
    uStack_1390 = uStack_1fe0;
    uStack_1380._0_1_ = (undefined1)uVar14;
    uStack_1380._1_1_ = (undefined1)(uVar14 >> 8);
    uStack_1380._2_1_ = (undefined1)(uVar14 >> 0x10);
    uStack_1380._3_1_ = (undefined1)(uVar14 >> 0x18);
    uStack_1380._4_1_ = (undefined1)(uVar14 >> 0x20);
    uStack_1380._5_1_ = (undefined1)(uVar14 >> 0x28);
    uStack_1380._6_1_ = (undefined1)(uVar14 >> 0x30);
    uStack_1380._7_1_ = (undefined1)(uVar14 >> 0x38);
    local_2278 = (undefined1)uStack_1380;
    cStack_2277 = (char)uStack_1d60;
    uStack_2276 = uStack_1380._1_1_;
    cStack_2275 = uStack_1d60._1_1_;
    uStack_2274 = uStack_1380._2_1_;
    cStack_2273 = uStack_1d60._2_1_;
    uStack_2272 = uStack_1380._3_1_;
    cStack_2271 = uStack_1d60._3_1_;
    uStack_2270 = uStack_1380._4_1_;
    cStack_226f = uStack_1d60._4_1_;
    uStack_226e = uStack_1380._5_1_;
    cStack_226d = uStack_1d60._5_1_;
    uStack_226c = uStack_1380._6_1_;
    cStack_226b = uStack_1d60._6_1_;
    uStack_226a = uStack_1380._7_1_;
    cStack_2269 = uStack_1d60._7_1_;
    local_13a8 = *local_1fa0;
    uVar15 = local_1fa0[1];
    local_13b8 = local_1fe8;
    uStack_13b0 = uStack_1fe0;
    uStack_13a0._0_1_ = (undefined1)uVar15;
    uStack_13a0._1_1_ = (undefined1)(uVar15 >> 8);
    uStack_13a0._2_1_ = (undefined1)(uVar15 >> 0x10);
    uStack_13a0._3_1_ = (undefined1)(uVar15 >> 0x18);
    uStack_13a0._4_1_ = (undefined1)(uVar15 >> 0x20);
    uStack_13a0._5_1_ = (undefined1)(uVar15 >> 0x28);
    uStack_13a0._6_1_ = (undefined1)(uVar15 >> 0x30);
    uStack_13a0._7_1_ = (undefined1)(uVar15 >> 0x38);
    local_2268 = (undefined1)uStack_13a0;
    cStack_2267 = (char)uStack_1d60;
    uStack_2266 = uStack_13a0._1_1_;
    cStack_2265 = uStack_1d60._1_1_;
    uStack_2264 = uStack_13a0._2_1_;
    cStack_2263 = uStack_1d60._2_1_;
    uStack_2262 = uStack_13a0._3_1_;
    cStack_2261 = uStack_1d60._3_1_;
    uStack_2260 = uStack_13a0._4_1_;
    cStack_225f = uStack_1d60._4_1_;
    uStack_225e = uStack_13a0._5_1_;
    cStack_225d = uStack_1d60._5_1_;
    uStack_225c = uStack_13a0._6_1_;
    cStack_225b = uStack_1d60._6_1_;
    uStack_225a = uStack_13a0._7_1_;
    cStack_2259 = uStack_1d60._7_1_;
    local_13c8 = *local_1f98;
    uVar16 = local_1f98[1];
    local_13d8 = local_1fe8;
    uStack_13d0 = uStack_1fe0;
    uStack_13c0._0_1_ = (undefined1)uVar16;
    uStack_13c0._1_1_ = (undefined1)(uVar16 >> 8);
    uStack_13c0._2_1_ = (undefined1)(uVar16 >> 0x10);
    uStack_13c0._3_1_ = (undefined1)(uVar16 >> 0x18);
    uStack_13c0._4_1_ = (undefined1)(uVar16 >> 0x20);
    uStack_13c0._5_1_ = (undefined1)(uVar16 >> 0x28);
    uStack_13c0._6_1_ = (undefined1)(uVar16 >> 0x30);
    uStack_13c0._7_1_ = (undefined1)(uVar16 >> 0x38);
    local_2258 = (undefined1)uStack_13c0;
    cStack_2257 = (char)uStack_1d60;
    uStack_2256 = uStack_13c0._1_1_;
    cStack_2255 = uStack_1d60._1_1_;
    uStack_2254 = uStack_13c0._2_1_;
    cStack_2253 = uStack_1d60._2_1_;
    uStack_2252 = uStack_13c0._3_1_;
    cStack_2251 = uStack_1d60._3_1_;
    uStack_2250 = uStack_13c0._4_1_;
    cStack_224f = uStack_1d60._4_1_;
    uStack_224e = uStack_13c0._5_1_;
    cStack_224d = uStack_1d60._5_1_;
    uStack_224c = uStack_13c0._6_1_;
    cStack_224b = uStack_1d60._6_1_;
    uStack_224a = uStack_13c0._7_1_;
    cStack_2249 = uStack_1d60._7_1_;
    local_13e8 = *local_1f90;
    uVar17 = local_1f90[1];
    local_13f8 = local_1fe8;
    uStack_13f0 = uStack_1fe0;
    uStack_13e0._0_1_ = (undefined1)uVar17;
    uStack_13e0._1_1_ = (undefined1)((ulong)uVar17 >> 8);
    uStack_13e0._2_1_ = (undefined1)((ulong)uVar17 >> 0x10);
    uStack_13e0._3_1_ = (undefined1)((ulong)uVar17 >> 0x18);
    uStack_13e0._4_1_ = (undefined1)((ulong)uVar17 >> 0x20);
    uStack_13e0._5_1_ = (undefined1)((ulong)uVar17 >> 0x28);
    uStack_13e0._6_1_ = (undefined1)((ulong)uVar17 >> 0x30);
    uStack_13e0._7_1_ = (undefined1)((ulong)uVar17 >> 0x38);
    local_2248 = (undefined1)uStack_13e0;
    cStack_2247 = (char)uStack_1d60;
    uStack_2246 = uStack_13e0._1_1_;
    cStack_2245 = uStack_1d60._1_1_;
    uStack_2244 = uStack_13e0._2_1_;
    cStack_2243 = uStack_1d60._2_1_;
    uStack_2242 = uStack_13e0._3_1_;
    cStack_2241 = uStack_1d60._3_1_;
    uStack_2240 = uStack_13e0._4_1_;
    cStack_223f = uStack_1d60._4_1_;
    uStack_223e = uStack_13e0._5_1_;
    cStack_223d = uStack_1d60._5_1_;
    uStack_223c = uStack_13e0._6_1_;
    cStack_223b = uStack_1d60._6_1_;
    uStack_223a = uStack_13e0._7_1_;
    cStack_2239 = uStack_1d60._7_1_;
    uVar49 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1ec8._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1ec8)));
    uVar50 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1ec8._2_1_,uVar49));
    uVar110 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1ec8._3_1_,uVar50));
    uVar55 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1ec8._5_1_,CONCAT11(local_1d68._4_1_,local_1ec8._4_1_)));
    uVar56 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1ec8._6_1_,uVar55));
    uVar112 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1ec8._7_1_,uVar56));
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1ee8._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1ee8)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1ee8._2_1_,uVar35));
    uVar108 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1ee8._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1ee8._5_1_,CONCAT11(local_1d68._4_1_,local_1ee8._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1ee8._6_1_,uVar42));
    uVar109 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1ee8._7_1_,uVar43));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f08._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f08)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f08._2_1_,uVar21));
    uVar102 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f08._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f08._5_1_,CONCAT11(local_1d68._4_1_,local_1f08._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f08._6_1_,uVar28));
    uVar105 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f08._7_1_,uVar29));
    local_828._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_828._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_828._6_2_ = (short)((ulong)uVar108 >> 0x30);
    uStack_820._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_820._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_820._6_2_ = (short)((ulong)uVar109 >> 0x30);
    local_838._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_838._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_838._6_2_ = (short)((ulong)uVar102 >> 0x30);
    uStack_830._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_830._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_830._6_2_ = (short)((ulong)uVar105 >> 0x30);
    local_858 = CONCAT11((char)local_1d68,(undefined1)local_1ee8) +
                CONCAT11((char)local_1d68,(undefined1)local_1f08);
    sStack_856 = local_828._2_2_ + local_838._2_2_;
    sStack_854 = local_828._4_2_ + local_838._4_2_;
    sStack_852 = local_828._6_2_ + local_838._6_2_;
    sStack_850 = CONCAT11(local_1d68._4_1_,local_1ee8._4_1_) +
                 CONCAT11(local_1d68._4_1_,local_1f08._4_1_);
    sStack_84e = uStack_820._2_2_ + uStack_830._2_2_;
    sStack_84c = uStack_820._4_2_ + uStack_830._4_2_;
    sStack_84a = uStack_820._6_2_ + uStack_830._6_2_;
    local_848._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_848._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_848._6_2_ = (short)((ulong)uVar110 >> 0x30);
    uStack_840._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_840._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_840._6_2_ = (short)((ulong)uVar112 >> 0x30);
    local_998 = CONCAT11((char)local_1d68,(undefined1)local_1ec8) + local_858;
    sStack_990 = CONCAT11(local_1d68._4_1_,local_1ec8._4_1_) + sStack_850;
    uVar49 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_13c0._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_13c0)
                              ));
    uVar50 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_13c0._2_1_,uVar49));
    uVar68 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_13c0._3_1_,uVar50));
    uVar55 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_13c0._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_13c0._4_1_)));
    uVar56 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_13c0._6_1_,uVar55));
    uVar70 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_13c0._7_1_,uVar56));
    uVar35 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_13a0._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_13a0)
                              ));
    uVar36 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_13a0._2_1_,uVar35));
    uVar66 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_13a0._3_1_,uVar36));
    uVar42 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_13a0._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_13a0._4_1_)));
    uVar43 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_13a0._6_1_,uVar42));
    uVar67 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_13a0._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1380._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1380)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1380._2_1_,uVar21));
    uVar60 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1380._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1380._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1380._6_1_,uVar28));
    uVar63 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1380._7_1_,uVar29));
    local_868._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_868._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_868._6_2_ = (short)((ulong)uVar66 >> 0x30);
    uStack_860._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_860._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_860._6_2_ = (short)((ulong)uVar67 >> 0x30);
    local_878._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_878._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_878._6_2_ = (short)((ulong)uVar60 >> 0x30);
    uStack_870._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_870._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_870._6_2_ = (short)((ulong)uVar63 >> 0x30);
    local_898 = CONCAT11((char)uStack_1d60,(undefined1)uStack_13a0) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1380);
    sStack_896 = local_868._2_2_ + local_878._2_2_;
    sStack_894 = local_868._4_2_ + local_878._4_2_;
    sStack_892 = local_868._6_2_ + local_878._6_2_;
    sStack_890 = CONCAT11(uStack_1d60._4_1_,uStack_13a0._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_);
    sStack_88e = uStack_860._2_2_ + uStack_870._2_2_;
    sStack_88c = uStack_860._4_2_ + uStack_870._4_2_;
    sStack_88a = uStack_860._6_2_ + uStack_870._6_2_;
    local_888._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_888._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_888._6_2_ = (short)((ulong)uVar68 >> 0x30);
    uStack_880._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_880._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_880._6_2_ = (short)((ulong)uVar70 >> 0x30);
    sVar140 = CONCAT11((char)uStack_1d60,(undefined1)uStack_13c0) + local_898;
    sVar166 = CONCAT11(uStack_1d60._4_1_,uStack_13c0._4_1_) + sStack_890;
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f68._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f68)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f68._2_1_,uVar21));
    uVar74 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f68._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f68._5_1_,CONCAT11(local_1d68._4_1_,local_1f68._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f68._6_1_,uVar28));
    uVar79 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f68._7_1_,uVar29));
    uVar49 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f28._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f28)));
    uVar50 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f28._2_1_,uVar49));
    uVar94 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f28._3_1_,uVar50));
    uVar55 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f28._5_1_,CONCAT11(local_1d68._4_1_,local_1f28._4_1_)));
    uVar56 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f28._6_1_,uVar55));
    uVar98 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f28._7_1_,uVar56));
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f48._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f48)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f48._2_1_,uVar35));
    uVar84 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f48._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f48._5_1_,CONCAT11(local_1d68._4_1_,local_1f48._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f48._6_1_,uVar42));
    uVar89 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f48._7_1_,uVar43));
    local_8a8._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_8a8._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_8a8._6_2_ = (short)((ulong)uVar94 >> 0x30);
    uStack_8a0._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_8a0._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_8a0._6_2_ = (short)((ulong)uVar98 >> 0x30);
    local_8b8._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_8b8._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)uVar84 >> 0x30);
    uStack_8b0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_8b0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)uVar89 >> 0x30);
    local_8d8 = CONCAT11((char)local_1d68,(undefined1)local_1f28) +
                CONCAT11((char)local_1d68,(undefined1)local_1f48);
    sStack_8d6 = local_8a8._2_2_ + local_8b8._2_2_;
    sStack_8d4 = local_8a8._4_2_ + local_8b8._4_2_;
    sStack_8d2 = local_8a8._6_2_ + local_8b8._6_2_;
    sStack_8d0 = CONCAT11(local_1d68._4_1_,local_1f28._4_1_) +
                 CONCAT11(local_1d68._4_1_,local_1f48._4_1_);
    sStack_8ce = uStack_8a0._2_2_ + uStack_8b0._2_2_;
    sStack_8cc = uStack_8a0._4_2_ + uStack_8b0._4_2_;
    sStack_8ca = uStack_8a0._6_2_ + uStack_8b0._6_2_;
    local_8c8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_8c8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_8c8._6_2_ = (short)((ulong)uVar74 >> 0x30);
    uStack_8c0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_8c0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_8c0._6_2_ = (short)((ulong)uVar79 >> 0x30);
    local_9d8 = CONCAT11((char)local_1d68,(undefined1)local_1f68) + local_8d8;
    local_8c8._2_2_ = local_8c8._2_2_ + sStack_8d6;
    local_8c8._4_2_ = local_8c8._4_2_ + sStack_8d4;
    local_8c8._6_2_ = local_8c8._6_2_ + sStack_8d2;
    sStack_9d0 = CONCAT11(local_1d68._4_1_,local_1f68._4_1_) + sStack_8d0;
    uStack_8c0._2_2_ = uStack_8c0._2_2_ + sStack_8ce;
    uStack_8c0._4_2_ = uStack_8c0._4_2_ + sStack_8cc;
    uStack_8c0._6_2_ = uStack_8c0._6_2_ + sStack_8ca;
    local_8e8 = CONCAT26(local_848._6_2_ + sStack_852,
                         CONCAT24(local_848._4_2_ + sStack_854,
                                  CONCAT22(local_848._2_2_ + sStack_856,local_998)));
    uStack_8e0 = CONCAT26(uStack_840._6_2_ + sStack_84a,
                          CONCAT24(uStack_840._4_2_ + sStack_84c,
                                   CONCAT22(uStack_840._2_2_ + sStack_84e,sStack_990)));
    local_8f8 = CONCAT26(local_8c8._6_2_,
                         CONCAT24(local_8c8._4_2_,CONCAT22(local_8c8._2_2_,local_9d8)));
    uStack_8f0 = CONCAT26(uStack_8c0._6_2_,
                          CONCAT24(uStack_8c0._4_2_,CONCAT22(uStack_8c0._2_2_,sStack_9d0)));
    local_998 = local_998 + local_9d8;
    sStack_996 = local_848._2_2_ + sStack_856 + local_8c8._2_2_;
    sStack_994 = local_848._4_2_ + sStack_854 + local_8c8._4_2_;
    sStack_992 = local_848._6_2_ + sStack_852 + local_8c8._6_2_;
    sStack_990 = sStack_990 + sStack_9d0;
    sStack_98e = uStack_840._2_2_ + sStack_84e + uStack_8c0._2_2_;
    sStack_98c = uStack_840._4_2_ + sStack_84c + uStack_8c0._4_2_;
    sStack_98a = uStack_840._6_2_ + sStack_84a + uStack_8c0._6_2_;
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1320._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1320)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1320._2_1_,uVar21));
    uVar20 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1320._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1320._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1320._6_1_,uVar28));
    uVar27 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1320._7_1_,uVar29));
    uVar49 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1360._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1360)
                              ));
    uVar50 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1360._2_1_,uVar49));
    uVar48 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1360._3_1_,uVar50));
    uVar55 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1360._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_)));
    uVar56 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1360._6_1_,uVar55));
    uVar54 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1360._7_1_,uVar56));
    uVar35 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1340._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1340)
                              ));
    uVar36 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1340._2_1_,uVar35));
    uVar34 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1340._3_1_,uVar36));
    uVar42 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1340._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_)));
    uVar43 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1340._6_1_,uVar42));
    uVar41 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1340._7_1_,uVar43));
    local_908._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_908._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_908._6_2_ = (short)((ulong)uVar48 >> 0x30);
    uStack_900._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_900._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_900._6_2_ = (short)((ulong)uVar54 >> 0x30);
    local_918._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_918._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_918._6_2_ = (short)((ulong)uVar34 >> 0x30);
    uStack_910._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_910._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_910._6_2_ = (short)((ulong)uVar41 >> 0x30);
    local_938 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1360) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1340);
    sStack_936 = local_908._2_2_ + local_918._2_2_;
    sStack_934 = local_908._4_2_ + local_918._4_2_;
    sStack_932 = local_908._6_2_ + local_918._6_2_;
    sStack_930 = CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_);
    sStack_92e = uStack_900._2_2_ + uStack_910._2_2_;
    sStack_92c = uStack_900._4_2_ + uStack_910._4_2_;
    sStack_92a = uStack_900._6_2_ + uStack_910._6_2_;
    local_928._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_928._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_928._6_2_ = (short)((ulong)uVar20 >> 0x30);
    uStack_920._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_920._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_920._6_2_ = (short)((ulong)uVar27 >> 0x30);
    sVar141 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1320) + local_938;
    local_928._2_2_ = local_928._2_2_ + sStack_936;
    local_928._4_2_ = local_928._4_2_ + sStack_934;
    local_928._6_2_ = local_928._6_2_ + sStack_932;
    sVar167 = CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_) + sStack_930;
    uStack_920._2_2_ = uStack_920._2_2_ + sStack_92e;
    uStack_920._4_2_ = uStack_920._4_2_ + sStack_92c;
    uStack_920._6_2_ = uStack_920._6_2_ + sStack_92a;
    local_948 = CONCAT26(local_888._6_2_ + sStack_892,
                         CONCAT24(local_888._4_2_ + sStack_894,
                                  CONCAT22(local_888._2_2_ + sStack_896,sVar140)));
    uStack_940 = CONCAT26(uStack_880._6_2_ + sStack_88a,
                          CONCAT24(uStack_880._4_2_ + sStack_88c,
                                   CONCAT22(uStack_880._2_2_ + sStack_88e,sVar166)));
    local_958 = CONCAT26(local_928._6_2_,CONCAT24(local_928._4_2_,CONCAT22(local_928._2_2_,sVar141))
                        );
    uStack_950 = CONCAT26(uStack_920._6_2_,
                          CONCAT24(uStack_920._4_2_,CONCAT22(uStack_920._2_2_,sVar167)));
    sVar140 = sVar140 + sVar141;
    sVar151 = local_888._2_2_ + sStack_896 + local_928._2_2_;
    sVar156 = local_888._4_2_ + sStack_894 + local_928._4_2_;
    sVar161 = local_888._6_2_ + sStack_892 + local_928._6_2_;
    sVar166 = sVar166 + sVar167;
    sVar173 = uStack_880._2_2_ + sStack_88e + uStack_920._2_2_;
    sVar178 = uStack_880._4_2_ + sStack_88c + uStack_920._4_2_;
    sVar183 = uStack_880._6_2_ + sStack_88a + uStack_920._6_2_;
    local_968 = CONCAT26(sStack_992,CONCAT24(sStack_994,CONCAT22(sStack_996,local_998)));
    uStack_960 = CONCAT26(sStack_98a,CONCAT24(sStack_98c,CONCAT22(sStack_98e,sStack_990)));
    local_978 = CONCAT26(sVar161,CONCAT24(sVar156,CONCAT22(sVar151,sVar140)));
    uStack_970 = CONCAT26(sVar183,CONCAT24(sVar178,CONCAT22(sVar173,sVar166)));
    local_998 = local_998 + sVar140;
    sStack_996 = sStack_996 + sVar151;
    sStack_994 = sStack_994 + sVar156;
    sStack_992 = sStack_992 + sVar161;
    sStack_990 = sStack_990 + sVar166;
    sStack_98e = sStack_98e + sVar173;
    sStack_98c = sStack_98c + sVar178;
    sStack_98a = sStack_98a + sVar183;
    local_22b8 = local_998 + 8;
    sStack_22b6 = sStack_996 + 8;
    sStack_22b4 = sStack_994 + 8;
    sStack_22b2 = sStack_992 + 8;
    sStack_22b0 = sStack_990 + 8;
    sStack_22ae = sStack_98e + 8;
    sStack_22ac = sStack_98c + 8;
    sStack_22aa = sStack_98a + 8;
    local_9a8 = CONCAT26(local_8c8._6_2_,
                         CONCAT24(local_8c8._4_2_,CONCAT22(local_8c8._2_2_,local_9d8)));
    uStack_9a0 = CONCAT26(uStack_8c0._6_2_,
                          CONCAT24(uStack_8c0._4_2_,CONCAT22(uStack_8c0._2_2_,sStack_9d0)));
    local_9b8 = CONCAT26(local_928._6_2_,CONCAT24(local_928._4_2_,CONCAT22(local_928._2_2_,sVar141))
                        );
    uStack_9b0 = CONCAT26(uStack_920._6_2_,
                          CONCAT24(uStack_920._4_2_,CONCAT22(uStack_920._2_2_,sVar167)));
    local_9d8 = local_9d8 + sVar141;
    sStack_9d6 = local_8c8._2_2_ + local_928._2_2_;
    sStack_9d4 = local_8c8._4_2_ + local_928._4_2_;
    sStack_9d2 = local_8c8._6_2_ + local_928._6_2_;
    sStack_9d0 = sStack_9d0 + sVar167;
    sStack_9ce = uStack_8c0._2_2_ + uStack_920._2_2_;
    sStack_9cc = uStack_8c0._4_2_ + uStack_920._4_2_;
    sStack_9ca = uStack_8c0._6_2_ + uStack_920._6_2_;
    local_22d8 = local_9d8 + 4;
    sStack_22d6 = sStack_9d6 + 4;
    sStack_22d4 = sStack_9d4 + 4;
    sStack_22d2 = sStack_9d2 + 4;
    sStack_22d0 = sStack_9d0 + 4;
    sStack_22ce = sStack_9ce + 4;
    sStack_22cc = sStack_9cc + 4;
    sStack_22ca = sStack_9ca + 4;
    local_a48 = CONCAT26(sStack_22b2,CONCAT24(sStack_22b4,CONCAT22(sStack_22b6,local_22b8)));
    uStack_a40 = CONCAT26(sStack_22aa,CONCAT24(sStack_22ac,CONCAT22(sStack_22ae,sStack_22b0)));
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1ea8._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1ea8)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1ea8._2_1_,uVar35));
    uVar114 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1ea8._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1ea8._5_1_,CONCAT11(local_1d68._4_1_,local_1ea8._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1ea8._6_1_,uVar42));
    uVar115 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1ea8._7_1_,uVar43));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f68._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f68)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f68._2_1_,uVar21));
    uVar75 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f68._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f68._5_1_,CONCAT11(local_1d68._4_1_,local_1f68._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f68._6_1_,uVar28));
    uVar80 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f68._7_1_,uVar29));
    local_9e8._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_9e8._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_9e8._6_2_ = (short)((ulong)uVar114 >> 0x30);
    uStack_9e0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_9e0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_9e0._6_2_ = (short)((ulong)uVar115 >> 0x30);
    local_9f8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_9f8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_9f8._6_2_ = (short)((ulong)uVar75 >> 0x30);
    uStack_9f0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_9f0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_9f0._6_2_ = (short)((ulong)uVar80 >> 0x30);
    local_a28 = CONCAT11((char)local_1d68,(undefined1)local_1ea8) +
                CONCAT11((char)local_1d68,(undefined1)local_1f68);
    sStack_a26 = local_9e8._2_2_ + local_9f8._2_2_;
    sStack_a24 = local_9e8._4_2_ + local_9f8._4_2_;
    sStack_a22 = local_9e8._6_2_ + local_9f8._6_2_;
    sStack_a20 = CONCAT11(local_1d68._4_1_,local_1ea8._4_1_) +
                 CONCAT11(local_1d68._4_1_,local_1f68._4_1_);
    sStack_a1e = uStack_9e0._2_2_ + uStack_9f0._2_2_;
    sStack_a1c = uStack_9e0._4_2_ + uStack_9f0._4_2_;
    sStack_a1a = uStack_9e0._6_2_ + uStack_9f0._6_2_;
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f48._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f48)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f48._2_1_,uVar35));
    uVar85 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f48._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f48._5_1_,CONCAT11(local_1d68._4_1_,local_1f48._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f48._6_1_,uVar42));
    uVar90 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f48._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1320._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1320)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1320._2_1_,uVar21));
    uVar23 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1320._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1320._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1320._6_1_,uVar28));
    uVar30 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1320._7_1_,uVar29));
    local_a08._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_a08._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_a08._6_2_ = (short)((ulong)uVar85 >> 0x30);
    uStack_a00._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_a00._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_a00._6_2_ = (short)((ulong)uVar90 >> 0x30);
    local_a18._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_a18._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_a18._6_2_ = (short)((ulong)uVar23 >> 0x30);
    uStack_a10._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_a10._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_a10._6_2_ = (short)((ulong)uVar30 >> 0x30);
    local_a38 = CONCAT11((char)local_1d68,(undefined1)local_1f48) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1320);
    sStack_a36 = local_a08._2_2_ + local_a18._2_2_;
    sStack_a34 = local_a08._4_2_ + local_a18._4_2_;
    sStack_a32 = local_a08._6_2_ + local_a18._6_2_;
    sStack_a30 = CONCAT11(local_1d68._4_1_,local_1f48._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_);
    sStack_a2e = uStack_a00._2_2_ + uStack_a10._2_2_;
    sStack_a2c = uStack_a00._4_2_ + uStack_a10._4_2_;
    sStack_a2a = uStack_a00._6_2_ + uStack_a10._6_2_;
    local_a58 = local_a28 + local_a38;
    sStack_a56 = sStack_a26 + sStack_a36;
    sStack_a54 = sStack_a24 + sStack_a34;
    sStack_a52 = sStack_a22 + sStack_a32;
    sStack_a50 = sStack_a20 + sStack_a30;
    sStack_a4e = sStack_a1e + sStack_a2e;
    sStack_a4c = sStack_a1c + sStack_a2c;
    sStack_a4a = sStack_a1a + sStack_a2a;
    local_18f8 = local_22b8 + local_a58;
    uStack_18f6 = sStack_22b6 + sStack_a56;
    uStack_18f4 = sStack_22b4 + sStack_a54;
    uStack_18f2 = sStack_22b2 + sStack_a52;
    uStack_18f0 = sStack_22b0 + sStack_a50;
    uStack_18ee = sStack_22ae + sStack_a4e;
    uStack_18ec = sStack_22ac + sStack_a4c;
    uStack_18ea = sStack_22aa + sStack_a4a;
    local_18fc = 4;
    uVar142 = local_18f8 >> 4;
    uVar152 = uStack_18f6 >> 4;
    uVar157 = uStack_18f4 >> 4;
    uVar162 = uStack_18f2 >> 4;
    uVar168 = uStack_18f0 >> 4;
    uVar174 = uStack_18ee >> 4;
    uVar179 = uStack_18ec >> 4;
    uVar184 = uStack_18ea >> 4;
    local_ac8 = CONCAT26(sStack_22b2,CONCAT24(sStack_22b4,CONCAT22(sStack_22b6,local_22b8)));
    uStack_ac0 = CONCAT26(sStack_22aa,CONCAT24(sStack_22ac,CONCAT22(sStack_22ae,sStack_22b0)));
    uVar35 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_13e0._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_13e0)
                              ));
    uVar36 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_13e0._2_1_,uVar35));
    uVar72 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_13e0._3_1_,uVar36));
    uVar42 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_13e0._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_13e0._4_1_)));
    uVar43 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_13e0._6_1_,uVar42));
    uVar73 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_13e0._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1320._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1320)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1320._2_1_,uVar21));
    uVar24 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1320._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1320._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1320._6_1_,uVar28));
    uVar31 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1320._7_1_,uVar29));
    local_a68._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_a68._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_a68._6_2_ = (short)((ulong)uVar72 >> 0x30);
    uStack_a60._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_a60._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_a60._6_2_ = (short)((ulong)uVar73 >> 0x30);
    local_a78._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_a78._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_a78._6_2_ = (short)((ulong)uVar24 >> 0x30);
    uStack_a70._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_a70._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_a70._6_2_ = (short)((ulong)uVar31 >> 0x30);
    local_aa8 = CONCAT11((char)uStack_1d60,(undefined1)uStack_13e0) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1320);
    sStack_aa6 = local_a68._2_2_ + local_a78._2_2_;
    sStack_aa4 = local_a68._4_2_ + local_a78._4_2_;
    sStack_aa2 = local_a68._6_2_ + local_a78._6_2_;
    sStack_aa0 = CONCAT11(uStack_1d60._4_1_,uStack_13e0._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_);
    sStack_a9e = uStack_a60._2_2_ + uStack_a70._2_2_;
    sStack_a9c = uStack_a60._4_2_ + uStack_a70._4_2_;
    sStack_a9a = uStack_a60._6_2_ + uStack_a70._6_2_;
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f68._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f68)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f68._2_1_,uVar35));
    uVar76 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f68._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f68._5_1_,CONCAT11(local_1d68._4_1_,local_1f68._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f68._6_1_,uVar42));
    uVar81 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f68._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1340._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1340)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1340._2_1_,uVar21));
    uVar37 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1340._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1340._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1340._6_1_,uVar28));
    uVar44 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1340._7_1_,uVar29));
    local_a88._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_a88._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_a88._6_2_ = (short)((ulong)uVar76 >> 0x30);
    uStack_a80._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_a80._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_a80._6_2_ = (short)((ulong)uVar81 >> 0x30);
    local_a98._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_a98._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_a98._6_2_ = (short)((ulong)uVar37 >> 0x30);
    uStack_a90._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_a90._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_a90._6_2_ = (short)((ulong)uVar44 >> 0x30);
    local_ab8 = CONCAT11((char)local_1d68,(undefined1)local_1f68) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1340);
    sStack_ab6 = local_a88._2_2_ + local_a98._2_2_;
    sStack_ab4 = local_a88._4_2_ + local_a98._4_2_;
    sStack_ab2 = local_a88._6_2_ + local_a98._6_2_;
    sStack_ab0 = CONCAT11(local_1d68._4_1_,local_1f68._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_);
    sStack_aae = uStack_a80._2_2_ + uStack_a90._2_2_;
    sStack_aac = uStack_a80._4_2_ + uStack_a90._4_2_;
    sStack_aaa = uStack_a80._6_2_ + uStack_a90._6_2_;
    local_ad8 = local_aa8 + local_ab8;
    sStack_ad6 = sStack_aa6 + sStack_ab6;
    sStack_ad4 = sStack_aa4 + sStack_ab4;
    sStack_ad2 = sStack_aa2 + sStack_ab2;
    sStack_ad0 = sStack_aa0 + sStack_ab0;
    sStack_ace = sStack_a9e + sStack_aae;
    sStack_acc = sStack_a9c + sStack_aac;
    sStack_aca = sStack_a9a + sStack_aaa;
    local_1918 = local_22b8 + local_ad8;
    uStack_1916 = sStack_22b6 + sStack_ad6;
    uStack_1914 = sStack_22b4 + sStack_ad4;
    uStack_1912 = sStack_22b2 + sStack_ad2;
    uStack_1910 = sStack_22b0 + sStack_ad0;
    uStack_190e = sStack_22ae + sStack_ace;
    uStack_190c = sStack_22ac + sStack_acc;
    uStack_190a = sStack_22aa + sStack_aca;
    local_191c = 4;
    uVar143 = local_1918 >> 4;
    uVar153 = uStack_1916 >> 4;
    uVar158 = uStack_1914 >> 4;
    uVar163 = uStack_1912 >> 4;
    uVar169 = uStack_1910 >> 4;
    uVar175 = uStack_190e >> 4;
    uVar180 = uStack_190c >> 4;
    uVar185 = uStack_190a >> 4;
    local_508 = CONCAT26(uVar162,CONCAT24(uVar157,CONCAT22(uVar152,uVar142)));
    uStack_500 = CONCAT26(uVar184,CONCAT24(uVar179,CONCAT22(uVar174,uVar168)));
    local_518 = CONCAT26(uVar163,CONCAT24(uVar158,CONCAT22(uVar153,uVar143)));
    uStack_510 = CONCAT26(uVar185,CONCAT24(uVar180,CONCAT22(uVar175,uVar169)));
    local_2168 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                          CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                   (0xff < uVar179),
                                   CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                            (0xff < uVar174),
                                            CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                     (char)uVar168 - (0xff < uVar168),
                                                     CONCAT13((uVar162 != 0) * (uVar162 < 0x100) *
                                                              (char)uVar162 - (0xff < uVar162),
                                                              CONCAT12((uVar157 != 0) *
                                                                       (uVar157 < 0x100) *
                                                                       (char)uVar157 -
                                                                       (0xff < uVar157),
                                                                       CONCAT11((uVar152 != 0) *
                                                                                (uVar152 < 0x100) *
                                                                                (char)uVar152 -
                                                                                (0xff < uVar152),
                                                                                (uVar142 != 0) *
                                                                                (uVar142 < 0x100) *
                                                                                (char)uVar142 -
                                                                                (0xff < uVar142)))))
                                           )));
    uStack_2160 = CONCAT17((uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185),
                           CONCAT16((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 -
                                    (0xff < uVar180),
                                    CONCAT15((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                             (0xff < uVar175),
                                             CONCAT14((uVar169 != 0) * (uVar169 < 0x100) *
                                                      (char)uVar169 - (0xff < uVar169),
                                                      CONCAT13((uVar163 != 0) * (uVar163 < 0x100) *
                                                               (char)uVar163 - (0xff < uVar163),
                                                               CONCAT12((uVar158 != 0) *
                                                                        (uVar158 < 0x100) *
                                                                        (char)uVar158 -
                                                                        (0xff < uVar158),
                                                                        CONCAT11((uVar153 != 0) *
                                                                                 (uVar153 < 0x100) *
                                                                                 (char)uVar153 -
                                                                                 (0xff < uVar153),
                                                                                 (uVar143 != 0) *
                                                                                 (uVar143 < 0x100) *
                                                                                 (char)uVar143 -
                                                                                 (0xff < uVar143))))
                                                     ))));
    local_b08 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_b00 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f08._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f08)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f08._2_1_,uVar35));
    uVar103 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f08._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f08._5_1_,CONCAT11(local_1d68._4_1_,local_1f08._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f08._6_1_,uVar42));
    uVar106 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f08._7_1_,uVar43));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f68._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f68)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f68._2_1_,uVar21));
    uVar77 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f68._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f68._5_1_,CONCAT11(local_1d68._4_1_,local_1f68._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f68._6_1_,uVar28));
    uVar82 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f68._7_1_,uVar29));
    local_ae8._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_ae8._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_ae8._6_2_ = (short)((ulong)uVar103 >> 0x30);
    uStack_ae0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_ae0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_ae0._6_2_ = (short)((ulong)uVar106 >> 0x30);
    local_af8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_af8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_af8._6_2_ = (short)((ulong)uVar77 >> 0x30);
    uStack_af0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_af0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_af0._6_2_ = (short)((ulong)uVar82 >> 0x30);
    local_b18 = CONCAT11((char)local_1d68,(undefined1)local_1f08) +
                CONCAT11((char)local_1d68,(undefined1)local_1f68);
    sStack_b16 = local_ae8._2_2_ + local_af8._2_2_;
    sStack_b14 = local_ae8._4_2_ + local_af8._4_2_;
    sStack_b12 = local_ae8._6_2_ + local_af8._6_2_;
    sStack_b10 = CONCAT11(local_1d68._4_1_,local_1f08._4_1_) +
                 CONCAT11(local_1d68._4_1_,local_1f68._4_1_);
    sStack_b0e = uStack_ae0._2_2_ + uStack_af0._2_2_;
    sStack_b0c = uStack_ae0._4_2_ + uStack_af0._4_2_;
    sStack_b0a = uStack_ae0._6_2_ + uStack_af0._6_2_;
    local_1938 = local_22d8 + local_b18;
    uStack_1936 = sStack_22d6 + sStack_b16;
    uStack_1934 = sStack_22d4 + sStack_b14;
    uStack_1932 = sStack_22d2 + sStack_b12;
    uStack_1930 = sStack_22d0 + sStack_b10;
    uStack_192e = sStack_22ce + sStack_b0e;
    uStack_192c = sStack_22cc + sStack_b0c;
    uStack_192a = sStack_22ca + sStack_b0a;
    local_193c = 3;
    uVar142 = local_1938 >> 3;
    uVar152 = uStack_1936 >> 3;
    uVar157 = uStack_1934 >> 3;
    uVar162 = uStack_1932 >> 3;
    uVar168 = uStack_1930 >> 3;
    uVar174 = uStack_192e >> 3;
    uVar179 = uStack_192c >> 3;
    uVar184 = uStack_192a >> 3;
    local_b48 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_b40 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    uVar35 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1380._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1380)
                              ));
    uVar36 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1380._2_1_,uVar35));
    uVar61 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1380._3_1_,uVar36));
    uVar42 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1380._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_)));
    uVar43 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1380._6_1_,uVar42));
    uVar64 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1380._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1320._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1320)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1320._2_1_,uVar21));
    uVar25 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1320._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1320._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1320._6_1_,uVar28));
    uVar32 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1320._7_1_,uVar29));
    local_b28._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_b28._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_b28._6_2_ = (short)((ulong)uVar61 >> 0x30);
    uStack_b20._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_b20._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_b20._6_2_ = (short)((ulong)uVar64 >> 0x30);
    local_b38._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_b38._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_b38._6_2_ = (short)((ulong)uVar25 >> 0x30);
    uStack_b30._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_b30._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_b30._6_2_ = (short)((ulong)uVar32 >> 0x30);
    local_b58 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1380) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1320);
    sStack_b56 = local_b28._2_2_ + local_b38._2_2_;
    sStack_b54 = local_b28._4_2_ + local_b38._4_2_;
    sStack_b52 = local_b28._6_2_ + local_b38._6_2_;
    sStack_b50 = CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_);
    sStack_b4e = uStack_b20._2_2_ + uStack_b30._2_2_;
    sStack_b4c = uStack_b20._4_2_ + uStack_b30._4_2_;
    sStack_b4a = uStack_b20._6_2_ + uStack_b30._6_2_;
    local_1958 = local_22d8 + local_b58;
    uStack_1956 = sStack_22d6 + sStack_b56;
    uStack_1954 = sStack_22d4 + sStack_b54;
    uStack_1952 = sStack_22d2 + sStack_b52;
    uStack_1950 = sStack_22d0 + sStack_b50;
    uStack_194e = sStack_22ce + sStack_b4e;
    uStack_194c = sStack_22cc + sStack_b4c;
    uStack_194a = sStack_22ca + sStack_b4a;
    local_195c = 3;
    uVar143 = local_1958 >> 3;
    uVar153 = uStack_1956 >> 3;
    uVar158 = uStack_1954 >> 3;
    uVar163 = uStack_1952 >> 3;
    uVar169 = uStack_1950 >> 3;
    uVar175 = uStack_194e >> 3;
    uVar180 = uStack_194c >> 3;
    uVar185 = uStack_194a >> 3;
    local_528 = CONCAT26(uVar162,CONCAT24(uVar157,CONCAT22(uVar152,uVar142)));
    uStack_520 = CONCAT26(uVar184,CONCAT24(uVar179,CONCAT22(uVar174,uVar168)));
    local_538 = CONCAT26(uVar163,CONCAT24(uVar158,CONCAT22(uVar153,uVar143)));
    uStack_530 = CONCAT26(uVar185,CONCAT24(uVar180,CONCAT22(uVar175,uVar169)));
    local_2198 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                          CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                   (0xff < uVar179),
                                   CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                            (0xff < uVar174),
                                            CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                     (char)uVar168 - (0xff < uVar168),
                                                     CONCAT13((uVar162 != 0) * (uVar162 < 0x100) *
                                                              (char)uVar162 - (0xff < uVar162),
                                                              CONCAT12((uVar157 != 0) *
                                                                       (uVar157 < 0x100) *
                                                                       (char)uVar157 -
                                                                       (0xff < uVar157),
                                                                       CONCAT11((uVar152 != 0) *
                                                                                (uVar152 < 0x100) *
                                                                                (char)uVar152 -
                                                                                (0xff < uVar152),
                                                                                (uVar142 != 0) *
                                                                                (uVar142 < 0x100) *
                                                                                (char)uVar142 -
                                                                                (0xff < uVar142)))))
                                           )));
    uStack_2190 = CONCAT17((uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185),
                           CONCAT16((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 -
                                    (0xff < uVar180),
                                    CONCAT15((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                             (0xff < uVar175),
                                             CONCAT14((uVar169 != 0) * (uVar169 < 0x100) *
                                                      (char)uVar169 - (0xff < uVar169),
                                                      CONCAT13((uVar163 != 0) * (uVar163 < 0x100) *
                                                               (char)uVar163 - (0xff < uVar163),
                                                               CONCAT12((uVar158 != 0) *
                                                                        (uVar158 < 0x100) *
                                                                        (char)uVar158 -
                                                                        (0xff < uVar158),
                                                                        CONCAT11((uVar153 != 0) *
                                                                                 (uVar153 < 0x100) *
                                                                                 (char)uVar153 -
                                                                                 (0xff < uVar153),
                                                                                 (uVar143 != 0) *
                                                                                 (uVar143 < 0x100) *
                                                                                 (char)uVar143 -
                                                                                 (0xff < uVar143))))
                                                     ))));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1ea8._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1ea8)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1ea8._2_1_,uVar21));
    local_b78 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1ea8._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1ea8._5_1_,CONCAT11(local_1d68._4_1_,local_1ea8._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1ea8._6_1_,uVar28));
    uStack_b70 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1ea8._7_1_,uVar29));
    local_b68._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_b68._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_b68._6_2_ = (short)((ulong)local_b78 >> 0x30);
    uStack_b60._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_b60._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_b60._6_2_ = (short)((ulong)uStack_b70 >> 0x30);
    local_22f8 = CONCAT11((char)local_1d68,(undefined1)local_1ea8) * 2;
    sStack_22f6 = local_b68._2_2_ * 2;
    sStack_22f4 = local_b68._4_2_ * 2;
    sStack_22f2 = local_b68._6_2_ * 2;
    sStack_22f0 = CONCAT11(local_1d68._4_1_,local_1ea8._4_1_) * 2;
    sStack_22ee = uStack_b60._2_2_ * 2;
    sStack_22ec = uStack_b60._4_2_ * 2;
    sStack_22ea = uStack_b60._6_2_ * 2;
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_13e0._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_13e0)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_13e0._2_1_,uVar21));
    local_b98 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_13e0._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_13e0._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_13e0._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_13e0._6_1_,uVar28));
    uStack_b90 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_13e0._7_1_,uVar29));
    local_b88._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_b88._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_b88._6_2_ = (short)((ulong)local_b98 >> 0x30);
    uStack_b80._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_b80._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_b80._6_2_ = (short)((ulong)uStack_b90 >> 0x30);
    local_2308 = CONCAT11((char)uStack_1d60,(undefined1)uStack_13e0) * 2;
    sStack_2306 = local_b88._2_2_ * 2;
    sStack_2304 = local_b88._4_2_ * 2;
    sStack_2302 = local_b88._6_2_ * 2;
    sStack_2300 = CONCAT11(uStack_1d60._4_1_,uStack_13e0._4_1_) * 2;
    sStack_22fe = uStack_b80._2_2_ * 2;
    sStack_22fc = uStack_b80._4_2_ * 2;
    sStack_22fa = uStack_b80._6_2_ * 2;
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f08._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f08)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f08._2_1_,uVar21));
    local_bb8 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f08._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f08._5_1_,CONCAT11(local_1d68._4_1_,local_1f08._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f08._6_1_,uVar28));
    uStack_bb0 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f08._7_1_,uVar29));
    local_ba8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_ba8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_ba8._6_2_ = (short)((ulong)local_bb8 >> 0x30);
    uStack_ba0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_ba0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_ba0._6_2_ = (short)((ulong)uStack_bb0 >> 0x30);
    local_2318 = CONCAT11((char)local_1d68,(undefined1)local_1f08) * 2;
    sStack_2316 = local_ba8._2_2_ * 2;
    sStack_2314 = local_ba8._4_2_ * 2;
    sStack_2312 = local_ba8._6_2_ * 2;
    sStack_2310 = CONCAT11(local_1d68._4_1_,local_1f08._4_1_) * 2;
    sStack_230e = uStack_ba0._2_2_ * 2;
    sStack_230c = uStack_ba0._4_2_ * 2;
    sStack_230a = uStack_ba0._6_2_ * 2;
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1380._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1380)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1380._2_1_,uVar21));
    local_bd8 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1380._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1380._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1380._6_1_,uVar28));
    uStack_bd0 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1380._7_1_,uVar29));
    local_bc8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_bc8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_bc8._6_2_ = (short)((ulong)local_bd8 >> 0x30);
    uStack_bc0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_bc0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_bc0._6_2_ = (short)((ulong)uStack_bd0 >> 0x30);
    local_2328 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1380) * 2;
    sStack_2326 = local_bc8._2_2_ * 2;
    sStack_2324 = local_bc8._4_2_ * 2;
    sStack_2322 = local_bc8._6_2_ * 2;
    sStack_2320 = CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_) * 2;
    sStack_231e = uStack_bc0._2_2_ * 2;
    sStack_231c = uStack_bc0._4_2_ * 2;
    sStack_231a = uStack_bc0._6_2_ * 2;
    local_668 = CONCAT26(sStack_22b2,CONCAT24(sStack_22b4,CONCAT22(sStack_22b6,local_22b8)));
    uStack_660 = CONCAT26(sStack_22aa,CONCAT24(sStack_22ac,CONCAT22(sStack_22ae,sStack_22b0)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1ec8._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1ec8)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1ec8._2_1_,uVar21));
    uVar111 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1ec8._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1ec8._5_1_,CONCAT11(local_1d68._4_1_,local_1ec8._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1ec8._6_1_,uVar28));
    uVar113 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1ec8._7_1_,uVar29));
    local_678._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_678._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_678._6_2_ = (short)((ulong)uVar111 >> 0x30);
    uStack_670._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_670._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_670._6_2_ = (short)((ulong)uVar113 >> 0x30);
    local_22c8 = local_22b8 - CONCAT11((char)local_1d68,(undefined1)local_1ec8);
    sStack_22c6 = sStack_22b6 - local_678._2_2_;
    sStack_22c4 = sStack_22b4 - local_678._4_2_;
    sStack_22c2 = sStack_22b2 - local_678._6_2_;
    sStack_22c0 = sStack_22b0 - CONCAT11(local_1d68._4_1_,local_1ec8._4_1_);
    sStack_22be = sStack_22ae - uStack_670._2_2_;
    sStack_22bc = sStack_22ac - uStack_670._4_2_;
    sStack_22ba = sStack_22aa - uStack_670._6_2_;
    local_688 = CONCAT26(sStack_22b2,CONCAT24(sStack_22b4,CONCAT22(sStack_22b6,local_22b8)));
    uStack_680 = CONCAT26(sStack_22aa,CONCAT24(sStack_22ac,CONCAT22(sStack_22ae,sStack_22b0)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_13c0._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_13c0)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_13c0._2_1_,uVar21));
    uVar69 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_13c0._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_13c0._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_13c0._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_13c0._6_1_,uVar28));
    uVar71 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_13c0._7_1_,uVar29));
    local_698._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_698._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_698._6_2_ = (short)((ulong)uVar69 >> 0x30);
    uStack_690._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_690._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_690._6_2_ = (short)((ulong)uVar71 >> 0x30);
    local_22b8 = local_22b8 - CONCAT11((char)uStack_1d60,(undefined1)uStack_13c0);
    sStack_22b6 = sStack_22b6 - local_698._2_2_;
    sStack_22b4 = sStack_22b4 - local_698._4_2_;
    sStack_22b2 = sStack_22b2 - local_698._6_2_;
    sStack_22b0 = sStack_22b0 - CONCAT11(uStack_1d60._4_1_,uStack_13c0._4_1_);
    sStack_22ae = sStack_22ae - uStack_690._2_2_;
    sStack_22ac = sStack_22ac - uStack_690._4_2_;
    sStack_22aa = sStack_22aa - uStack_690._6_2_;
    local_c48 = CONCAT26(sStack_22b2,CONCAT24(sStack_22b4,CONCAT22(sStack_22b6,local_22b8)));
    uStack_c40 = CONCAT26(sStack_22aa,CONCAT24(sStack_22ac,CONCAT22(sStack_22ae,sStack_22b0)));
    local_c28 = CONCAT26(sStack_22f2,CONCAT24(sStack_22f4,CONCAT22(sStack_22f6,local_22f8)));
    uStack_c20 = CONCAT26(sStack_22ea,CONCAT24(sStack_22ec,CONCAT22(sStack_22ee,sStack_22f0)));
    uVar35 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f48._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f48)));
    uVar36 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f48._2_1_,uVar35));
    uVar86 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f48._3_1_,uVar36));
    uVar42 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f48._5_1_,CONCAT11(local_1d68._4_1_,local_1f48._4_1_)));
    uVar43 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f48._6_1_,uVar42));
    uVar91 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f48._7_1_,uVar43));
    uVar49 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f28._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f28)));
    uVar50 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f28._2_1_,uVar49));
    uVar95 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f28._3_1_,uVar50));
    uVar55 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f28._5_1_,CONCAT11(local_1d68._4_1_,local_1f28._4_1_)));
    uVar56 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f28._6_1_,uVar55));
    uVar99 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f28._7_1_,uVar56));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f68._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f68)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f68._2_1_,uVar21));
    uVar78 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f68._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f68._5_1_,CONCAT11(local_1d68._4_1_,local_1f68._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f68._6_1_,uVar28));
    uVar83 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f68._7_1_,uVar29));
    local_be8._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_be8._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_be8._6_2_ = (short)((ulong)uVar95 >> 0x30);
    uStack_be0._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_be0._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_be0._6_2_ = (short)((ulong)uVar99 >> 0x30);
    local_bf8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_bf8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_bf8._6_2_ = (short)((ulong)uVar78 >> 0x30);
    uStack_bf0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_bf0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_bf0._6_2_ = (short)((ulong)uVar83 >> 0x30);
    local_c18 = CONCAT11((char)local_1d68,(undefined1)local_1f28) +
                CONCAT11((char)local_1d68,(undefined1)local_1f68);
    sStack_c16 = local_be8._2_2_ + local_bf8._2_2_;
    sStack_c14 = local_be8._4_2_ + local_bf8._4_2_;
    sStack_c12 = local_be8._6_2_ + local_bf8._6_2_;
    sStack_c10 = CONCAT11(local_1d68._4_1_,local_1f28._4_1_) +
                 CONCAT11(local_1d68._4_1_,local_1f68._4_1_);
    sStack_c0e = uStack_be0._2_2_ + uStack_bf0._2_2_;
    sStack_c0c = uStack_be0._4_2_ + uStack_bf0._4_2_;
    sStack_c0a = uStack_be0._6_2_ + uStack_bf0._6_2_;
    local_c08._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_c08._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_c08._6_2_ = (short)((ulong)uVar86 >> 0x30);
    uStack_c00._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_c00._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_c00._6_2_ = (short)((ulong)uVar91 >> 0x30);
    local_c38 = CONCAT11((char)local_1d68,(undefined1)local_1f48) + local_c18;
    sStack_c36 = local_c08._2_2_ + sStack_c16;
    sStack_c34 = local_c08._4_2_ + sStack_c14;
    sStack_c32 = local_c08._6_2_ + sStack_c12;
    sStack_c30 = CONCAT11(local_1d68._4_1_,local_1f48._4_1_) + sStack_c10;
    sStack_c2e = uStack_c00._2_2_ + sStack_c0e;
    sStack_c2c = uStack_c00._4_2_ + sStack_c0c;
    sStack_c2a = uStack_c00._6_2_ + sStack_c0a;
    local_c58 = local_22f8 + local_c38;
    sStack_c56 = sStack_22f6 + sStack_c36;
    sStack_c54 = sStack_22f4 + sStack_c34;
    sStack_c52 = sStack_22f2 + sStack_c32;
    sStack_c50 = sStack_22f0 + sStack_c30;
    sStack_c4e = sStack_22ee + sStack_c2e;
    sStack_c4c = sStack_22ec + sStack_c2c;
    sStack_c4a = sStack_22ea + sStack_c2a;
    local_1978 = local_22b8 + local_c58;
    uStack_1976 = sStack_22b6 + sStack_c56;
    uStack_1974 = sStack_22b4 + sStack_c54;
    uStack_1972 = sStack_22b2 + sStack_c52;
    uStack_1970 = sStack_22b0 + sStack_c50;
    uStack_196e = sStack_22ae + sStack_c4e;
    uStack_196c = sStack_22ac + sStack_c4c;
    uStack_196a = sStack_22aa + sStack_c4a;
    local_197c = 4;
    uVar142 = local_1978 >> 4;
    uVar152 = uStack_1976 >> 4;
    uVar157 = uStack_1974 >> 4;
    uVar162 = uStack_1972 >> 4;
    uVar168 = uStack_1970 >> 4;
    uVar174 = uStack_196e >> 4;
    uVar179 = uStack_196c >> 4;
    uVar184 = uStack_196a >> 4;
    local_cc8 = CONCAT26(sStack_22c2,CONCAT24(sStack_22c4,CONCAT22(sStack_22c6,local_22c8)));
    uStack_cc0 = CONCAT26(sStack_22ba,CONCAT24(sStack_22bc,CONCAT22(sStack_22be,sStack_22c0)));
    local_ca8 = CONCAT26(sStack_2302,CONCAT24(sStack_2304,CONCAT22(sStack_2306,local_2308)));
    uStack_ca0 = CONCAT26(sStack_22fa,CONCAT24(sStack_22fc,CONCAT22(sStack_22fe,sStack_2300)));
    uVar35 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1340._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1340)
                              ));
    uVar36 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1340._2_1_,uVar35));
    uVar38 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1340._3_1_,uVar36));
    uVar42 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1340._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_)));
    uVar43 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1340._6_1_,uVar42));
    uVar45 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1340._7_1_,uVar43));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1320._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1320)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1320._2_1_,uVar21));
    uVar26 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1320._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1320._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1320._6_1_,uVar28));
    uVar33 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1320._7_1_,uVar29));
    uVar49 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1360._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1360)
                              ));
    uVar50 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1360._2_1_,uVar49));
    uVar51 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1360._3_1_,uVar50));
    uVar55 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1360._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_)));
    uVar56 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1360._6_1_,uVar55));
    uVar57 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1360._7_1_,uVar56));
    local_c68._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_c68._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_c68._6_2_ = (short)((ulong)uVar26 >> 0x30);
    uStack_c60._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_c60._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_c60._6_2_ = (short)((ulong)uVar33 >> 0x30);
    local_c78._2_2_ = (short)((uint)uVar49 >> 0x10);
    local_c78._4_2_ = (short)((uint6)uVar50 >> 0x20);
    local_c78._6_2_ = (short)((ulong)uVar51 >> 0x30);
    uStack_c70._2_2_ = (short)((uint)uVar55 >> 0x10);
    uStack_c70._4_2_ = (short)((uint6)uVar56 >> 0x20);
    uStack_c70._6_2_ = (short)((ulong)uVar57 >> 0x30);
    local_c98 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1320) +
                CONCAT11((char)uStack_1d60,(undefined1)uStack_1360);
    sStack_c96 = local_c68._2_2_ + local_c78._2_2_;
    sStack_c94 = local_c68._4_2_ + local_c78._4_2_;
    sStack_c92 = local_c68._6_2_ + local_c78._6_2_;
    sStack_c90 = CONCAT11(uStack_1d60._4_1_,uStack_1320._4_1_) +
                 CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_);
    sStack_c8e = uStack_c60._2_2_ + uStack_c70._2_2_;
    sStack_c8c = uStack_c60._4_2_ + uStack_c70._4_2_;
    sStack_c8a = uStack_c60._6_2_ + uStack_c70._6_2_;
    local_c88._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_c88._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_c88._6_2_ = (short)((ulong)uVar38 >> 0x30);
    uStack_c80._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_c80._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_c80._6_2_ = (short)((ulong)uVar45 >> 0x30);
    local_cb8 = CONCAT11((char)uStack_1d60,(undefined1)uStack_1340) + local_c98;
    sStack_cb6 = local_c88._2_2_ + sStack_c96;
    sStack_cb4 = local_c88._4_2_ + sStack_c94;
    sStack_cb2 = local_c88._6_2_ + sStack_c92;
    sStack_cb0 = CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_) + sStack_c90;
    sStack_cae = uStack_c80._2_2_ + sStack_c8e;
    sStack_cac = uStack_c80._4_2_ + sStack_c8c;
    sStack_caa = uStack_c80._6_2_ + sStack_c8a;
    local_cd8 = local_2308 + local_cb8;
    sStack_cd6 = sStack_2306 + sStack_cb6;
    sStack_cd4 = sStack_2304 + sStack_cb4;
    sStack_cd2 = sStack_2302 + sStack_cb2;
    sStack_cd0 = sStack_2300 + sStack_cb0;
    sStack_cce = sStack_22fe + sStack_cae;
    sStack_ccc = sStack_22fc + sStack_cac;
    sStack_cca = sStack_22fa + sStack_caa;
    local_1998 = local_22c8 + local_cd8;
    uStack_1996 = sStack_22c6 + sStack_cd6;
    uStack_1994 = sStack_22c4 + sStack_cd4;
    uStack_1992 = sStack_22c2 + sStack_cd2;
    uStack_1990 = sStack_22c0 + sStack_cd0;
    uStack_198e = sStack_22be + sStack_cce;
    uStack_198c = sStack_22bc + sStack_ccc;
    uStack_198a = sStack_22ba + sStack_cca;
    local_199c = 4;
    uVar143 = local_1998 >> 4;
    uVar153 = uStack_1996 >> 4;
    uVar158 = uStack_1994 >> 4;
    uVar163 = uStack_1992 >> 4;
    uVar169 = uStack_1990 >> 4;
    uVar175 = uStack_198e >> 4;
    uVar180 = uStack_198c >> 4;
    uVar185 = uStack_198a >> 4;
    local_548 = CONCAT26(uVar162,CONCAT24(uVar157,CONCAT22(uVar152,uVar142)));
    uStack_540 = CONCAT26(uVar184,CONCAT24(uVar179,CONCAT22(uVar174,uVar168)));
    local_558 = CONCAT26(uVar163,CONCAT24(uVar158,CONCAT22(uVar153,uVar143)));
    uStack_550 = CONCAT26(uVar185,CONCAT24(uVar180,CONCAT22(uVar175,uVar169)));
    local_2158 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                          CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                   (0xff < uVar179),
                                   CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                            (0xff < uVar174),
                                            CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                     (char)uVar168 - (0xff < uVar168),
                                                     CONCAT13((uVar162 != 0) * (uVar162 < 0x100) *
                                                              (char)uVar162 - (0xff < uVar162),
                                                              CONCAT12((uVar157 != 0) *
                                                                       (uVar157 < 0x100) *
                                                                       (char)uVar157 -
                                                                       (0xff < uVar157),
                                                                       CONCAT11((uVar152 != 0) *
                                                                                (uVar152 < 0x100) *
                                                                                (char)uVar152 -
                                                                                (0xff < uVar152),
                                                                                (uVar142 != 0) *
                                                                                (uVar142 < 0x100) *
                                                                                (char)uVar142 -
                                                                                (0xff < uVar142)))))
                                           )));
    uStack_2150 = CONCAT17((uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185),
                           CONCAT16((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 -
                                    (0xff < uVar180),
                                    CONCAT15((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                             (0xff < uVar175),
                                             CONCAT14((uVar169 != 0) * (uVar169 < 0x100) *
                                                      (char)uVar169 - (0xff < uVar169),
                                                      CONCAT13((uVar163 != 0) * (uVar163 < 0x100) *
                                                               (char)uVar163 - (0xff < uVar163),
                                                               CONCAT12((uVar158 != 0) *
                                                                        (uVar158 < 0x100) *
                                                                        (char)uVar158 -
                                                                        (0xff < uVar158),
                                                                        CONCAT11((uVar153 != 0) *
                                                                                 (uVar153 < 0x100) *
                                                                                 (char)uVar153 -
                                                                                 (0xff < uVar153),
                                                                                 (uVar143 != 0) *
                                                                                 (uVar143 < 0x100) *
                                                                                 (char)uVar143 -
                                                                                 (0xff < uVar143))))
                                                     ))));
    local_6a8 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_6a0 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f28._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f28)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f28._2_1_,uVar21));
    uVar96 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f28._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f28._5_1_,CONCAT11(local_1d68._4_1_,local_1f28._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f28._6_1_,uVar28));
    uVar100 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f28._7_1_,uVar29));
    local_6b8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_6b8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_6b8._6_2_ = (short)((ulong)uVar96 >> 0x30);
    uStack_6b0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_6b0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_6b0._6_2_ = (short)((ulong)uVar100 >> 0x30);
    local_22e8 = local_22d8 - CONCAT11((char)local_1d68,(undefined1)local_1f28);
    local_6b8._2_2_ = sStack_22d6 - local_6b8._2_2_;
    local_6b8._4_2_ = sStack_22d4 - local_6b8._4_2_;
    local_6b8._6_2_ = sStack_22d2 - local_6b8._6_2_;
    sStack_22e0 = sStack_22d0 - CONCAT11(local_1d68._4_1_,local_1f28._4_1_);
    uStack_6b0._2_2_ = sStack_22ce - uStack_6b0._2_2_;
    uStack_6b0._4_2_ = sStack_22cc - uStack_6b0._4_2_;
    uStack_6b0._6_2_ = sStack_22ca - uStack_6b0._6_2_;
    local_6c8 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_6c0 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1360._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1360)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1360._2_1_,uVar21));
    uVar52 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1360._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1360._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1360._6_1_,uVar28));
    uVar58 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1360._7_1_,uVar29));
    local_6d8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_6d8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_6d8._6_2_ = (short)((ulong)uVar52 >> 0x30);
    uStack_6d0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_6d0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_6d0._6_2_ = (short)((ulong)uVar58 >> 0x30);
    local_22d8 = local_22d8 - CONCAT11((char)uStack_1d60,(undefined1)uStack_1360);
    sStack_22d6 = sStack_22d6 - local_6d8._2_2_;
    sStack_22d4 = sStack_22d4 - local_6d8._4_2_;
    sStack_22d2 = sStack_22d2 - local_6d8._6_2_;
    sStack_22d0 = sStack_22d0 - CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_);
    sStack_22ce = sStack_22ce - uStack_6d0._2_2_;
    sStack_22cc = sStack_22cc - uStack_6d0._4_2_;
    sStack_22ca = sStack_22ca - uStack_6d0._6_2_;
    local_d08 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_d00 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    local_ce8 = CONCAT26(sStack_2312,CONCAT24(sStack_2314,CONCAT22(sStack_2316,local_2318)));
    uStack_ce0 = CONCAT26(sStack_230a,CONCAT24(sStack_230c,CONCAT22(sStack_230e,sStack_2310)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f48._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f48)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f48._2_1_,uVar21));
    uVar87 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f48._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f48._5_1_,CONCAT11(local_1d68._4_1_,local_1f48._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f48._6_1_,uVar28));
    uVar92 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f48._7_1_,uVar29));
    local_cf8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_cf8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_cf8._6_2_ = (short)((ulong)uVar87 >> 0x30);
    uStack_cf0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_cf0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_cf0._6_2_ = (short)((ulong)uVar92 >> 0x30);
    local_d18 = local_2318 + CONCAT11((char)local_1d68,(undefined1)local_1f48);
    sStack_d16 = sStack_2316 + local_cf8._2_2_;
    sStack_d14 = sStack_2314 + local_cf8._4_2_;
    sStack_d12 = sStack_2312 + local_cf8._6_2_;
    sStack_d10 = sStack_2310 + CONCAT11(local_1d68._4_1_,local_1f48._4_1_);
    sStack_d0e = sStack_230e + uStack_cf0._2_2_;
    sStack_d0c = sStack_230c + uStack_cf0._4_2_;
    sStack_d0a = sStack_230a + uStack_cf0._6_2_;
    local_19b8 = local_22d8 + local_d18;
    uStack_19b6 = sStack_22d6 + sStack_d16;
    uStack_19b4 = sStack_22d4 + sStack_d14;
    uStack_19b2 = sStack_22d2 + sStack_d12;
    uStack_19b0 = sStack_22d0 + sStack_d10;
    uStack_19ae = sStack_22ce + sStack_d0e;
    uStack_19ac = sStack_22cc + sStack_d0c;
    uStack_19aa = sStack_22ca + sStack_d0a;
    local_19bc = 3;
    uVar142 = local_19b8 >> 3;
    uVar152 = uStack_19b6 >> 3;
    uVar157 = uStack_19b4 >> 3;
    uVar162 = uStack_19b2 >> 3;
    uVar168 = uStack_19b0 >> 3;
    uVar174 = uStack_19ae >> 3;
    uVar179 = uStack_19ac >> 3;
    uVar184 = uStack_19aa >> 3;
    local_d48 = CONCAT26(local_6b8._6_2_,
                         CONCAT24(local_6b8._4_2_,CONCAT22(local_6b8._2_2_,local_22e8)));
    uStack_d40 = CONCAT26(uStack_6b0._6_2_,
                          CONCAT24(uStack_6b0._4_2_,CONCAT22(uStack_6b0._2_2_,sStack_22e0)));
    local_d28 = CONCAT26(sStack_2322,CONCAT24(sStack_2324,CONCAT22(sStack_2326,local_2328)));
    uStack_d20 = CONCAT26(sStack_231a,CONCAT24(sStack_231c,CONCAT22(sStack_231e,sStack_2320)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1340._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1340)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1340._2_1_,uVar21));
    uVar39 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1340._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1340._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1340._6_1_,uVar28));
    uVar46 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1340._7_1_,uVar29));
    local_d38._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_d38._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_d38._6_2_ = (short)((ulong)uVar39 >> 0x30);
    uStack_d30._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_d30._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_d30._6_2_ = (short)((ulong)uVar46 >> 0x30);
    local_d58 = local_2328 + CONCAT11((char)uStack_1d60,(undefined1)uStack_1340);
    sStack_d56 = sStack_2326 + local_d38._2_2_;
    sStack_d54 = sStack_2324 + local_d38._4_2_;
    sStack_d52 = sStack_2322 + local_d38._6_2_;
    sStack_d50 = sStack_2320 + CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_);
    sStack_d4e = sStack_231e + uStack_d30._2_2_;
    sStack_d4c = sStack_231c + uStack_d30._4_2_;
    sStack_d4a = sStack_231a + uStack_d30._6_2_;
    local_19d8 = local_22e8 + local_d58;
    uStack_19d6 = local_6b8._2_2_ + sStack_d56;
    uStack_19d4 = local_6b8._4_2_ + sStack_d54;
    uStack_19d2 = local_6b8._6_2_ + sStack_d52;
    uStack_19d0 = sStack_22e0 + sStack_d50;
    uStack_19ce = uStack_6b0._2_2_ + sStack_d4e;
    uStack_19cc = uStack_6b0._4_2_ + sStack_d4c;
    uStack_19ca = uStack_6b0._6_2_ + sStack_d4a;
    local_19dc = 3;
    uVar143 = local_19d8 >> 3;
    uVar153 = uStack_19d6 >> 3;
    uVar158 = uStack_19d4 >> 3;
    uVar163 = uStack_19d2 >> 3;
    uVar169 = uStack_19d0 >> 3;
    uVar175 = uStack_19ce >> 3;
    uVar180 = uStack_19cc >> 3;
    uVar185 = uStack_19ca >> 3;
    local_568 = CONCAT26(uVar162,CONCAT24(uVar157,CONCAT22(uVar152,uVar142)));
    uStack_560 = CONCAT26(uVar184,CONCAT24(uVar179,CONCAT22(uVar174,uVar168)));
    local_578 = CONCAT26(uVar163,CONCAT24(uVar158,CONCAT22(uVar153,uVar143)));
    uStack_570 = CONCAT26(uVar185,CONCAT24(uVar180,CONCAT22(uVar175,uVar169)));
    local_2188 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                          CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                   (0xff < uVar179),
                                   CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                            (0xff < uVar174),
                                            CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                     (char)uVar168 - (0xff < uVar168),
                                                     CONCAT13((uVar162 != 0) * (uVar162 < 0x100) *
                                                              (char)uVar162 - (0xff < uVar162),
                                                              CONCAT12((uVar157 != 0) *
                                                                       (uVar157 < 0x100) *
                                                                       (char)uVar157 -
                                                                       (0xff < uVar157),
                                                                       CONCAT11((uVar152 != 0) *
                                                                                (uVar152 < 0x100) *
                                                                                (char)uVar152 -
                                                                                (0xff < uVar152),
                                                                                (uVar142 != 0) *
                                                                                (uVar142 < 0x100) *
                                                                                (char)uVar142 -
                                                                                (0xff < uVar142)))))
                                           )));
    uStack_2180 = CONCAT17((uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185),
                           CONCAT16((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 -
                                    (0xff < uVar180),
                                    CONCAT15((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                             (0xff < uVar175),
                                             CONCAT14((uVar169 != 0) * (uVar169 < 0x100) *
                                                      (char)uVar169 - (0xff < uVar169),
                                                      CONCAT13((uVar163 != 0) * (uVar163 < 0x100) *
                                                               (char)uVar163 - (0xff < uVar163),
                                                               CONCAT12((uVar158 != 0) *
                                                                        (uVar158 < 0x100) *
                                                                        (char)uVar158 -
                                                                        (0xff < uVar158),
                                                                        CONCAT11((uVar153 != 0) *
                                                                                 (uVar153 < 0x100) *
                                                                                 (char)uVar153 -
                                                                                 (0xff < uVar153),
                                                                                 (uVar143 != 0) *
                                                                                 (uVar143 < 0x100) *
                                                                                 (char)uVar143 -
                                                                                 (0xff < uVar143))))
                                                     ))));
    local_6e8 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_6e0 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1340._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1340)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1340._2_1_,uVar21));
    uVar40 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1340._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1340._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1340._6_1_,uVar28));
    uVar47 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1340._7_1_,uVar29));
    local_6f8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_6f8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_6f8._6_2_ = (short)((ulong)uVar40 >> 0x30);
    uStack_6f0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_6f0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_6f0._6_2_ = (short)((ulong)uVar47 >> 0x30);
    local_22d8 = local_22d8 - CONCAT11((char)uStack_1d60,(undefined1)uStack_1340);
    sStack_22d6 = sStack_22d6 - local_6f8._2_2_;
    sStack_22d4 = sStack_22d4 - local_6f8._4_2_;
    sStack_22d2 = sStack_22d2 - local_6f8._6_2_;
    sStack_22d0 = sStack_22d0 - CONCAT11(uStack_1d60._4_1_,uStack_1340._4_1_);
    sStack_22ce = sStack_22ce - uStack_6f0._2_2_;
    sStack_22cc = sStack_22cc - uStack_6f0._4_2_;
    sStack_22ca = sStack_22ca - uStack_6f0._6_2_;
    local_708 = CONCAT26(local_6b8._6_2_,
                         CONCAT24(local_6b8._4_2_,CONCAT22(local_6b8._2_2_,local_22e8)));
    uStack_700 = CONCAT26(uStack_6b0._6_2_,
                          CONCAT24(uStack_6b0._4_2_,CONCAT22(uStack_6b0._2_2_,sStack_22e0)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f48._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f48)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f48._2_1_,uVar21));
    uVar88 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f48._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f48._5_1_,CONCAT11(local_1d68._4_1_,local_1f48._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f48._6_1_,uVar28));
    uVar93 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f48._7_1_,uVar29));
    local_718._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_718._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_718._6_2_ = (short)((ulong)uVar88 >> 0x30);
    uStack_710._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_710._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_710._6_2_ = (short)((ulong)uVar93 >> 0x30);
    local_22e8 = local_22e8 - CONCAT11((char)local_1d68,(undefined1)local_1f48);
    sStack_22e6 = local_6b8._2_2_ - local_718._2_2_;
    sStack_22e4 = local_6b8._4_2_ - local_718._4_2_;
    sStack_22e2 = local_6b8._6_2_ - local_718._6_2_;
    sStack_22e0 = sStack_22e0 - CONCAT11(local_1d68._4_1_,local_1f48._4_1_);
    sStack_22de = uStack_6b0._2_2_ - uStack_710._2_2_;
    sStack_22dc = uStack_6b0._4_2_ - uStack_710._4_2_;
    sStack_22da = uStack_6b0._6_2_ - uStack_710._6_2_;
    local_d68 = CONCAT26(sStack_2312,CONCAT24(sStack_2314,CONCAT22(sStack_2316,local_2318)));
    uStack_d60 = CONCAT26(sStack_230a,CONCAT24(sStack_230c,CONCAT22(sStack_230e,sStack_2310)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f08._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f08)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f08._2_1_,uVar21));
    uVar104 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f08._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f08._5_1_,CONCAT11(local_1d68._4_1_,local_1f08._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f08._6_1_,uVar28));
    uVar107 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f08._7_1_,uVar29));
    local_d78._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_d78._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_d78._6_2_ = (short)((ulong)uVar104 >> 0x30);
    uStack_d70._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_d70._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_d70._6_2_ = (short)((ulong)uVar107 >> 0x30);
    local_2318 = local_2318 + CONCAT11((char)local_1d68,(undefined1)local_1f08);
    sStack_2316 = sStack_2316 + local_d78._2_2_;
    sStack_2314 = sStack_2314 + local_d78._4_2_;
    sStack_2312 = sStack_2312 + local_d78._6_2_;
    sStack_2310 = sStack_2310 + CONCAT11(local_1d68._4_1_,local_1f08._4_1_);
    sStack_230e = sStack_230e + uStack_d70._2_2_;
    sStack_230c = sStack_230c + uStack_d70._4_2_;
    sStack_230a = sStack_230a + uStack_d70._6_2_;
    local_d88 = CONCAT26(sStack_2322,CONCAT24(sStack_2324,CONCAT22(sStack_2326,local_2328)));
    uStack_d80 = CONCAT26(sStack_231a,CONCAT24(sStack_231c,CONCAT22(sStack_231e,sStack_2320)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1380._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1380)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1380._2_1_,uVar21));
    uVar62 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1380._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1380._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1380._6_1_,uVar28));
    uVar65 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1380._7_1_,uVar29));
    local_d98._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_d98._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_d98._6_2_ = (short)((ulong)uVar62 >> 0x30);
    uStack_d90._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_d90._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_d90._6_2_ = (short)((ulong)uVar65 >> 0x30);
    local_2328 = local_2328 + CONCAT11((char)uStack_1d60,(undefined1)uStack_1380);
    sStack_2326 = sStack_2326 + local_d98._2_2_;
    sStack_2324 = sStack_2324 + local_d98._4_2_;
    sStack_2322 = sStack_2322 + local_d98._6_2_;
    sStack_2320 = sStack_2320 + CONCAT11(uStack_1d60._4_1_,uStack_1380._4_1_);
    sStack_231e = sStack_231e + uStack_d90._2_2_;
    sStack_231c = sStack_231c + uStack_d90._4_2_;
    sStack_231a = sStack_231a + uStack_d90._6_2_;
    local_dc8 = CONCAT26(sStack_22d2,CONCAT24(sStack_22d4,CONCAT22(sStack_22d6,local_22d8)));
    uStack_dc0 = CONCAT26(sStack_22ca,CONCAT24(sStack_22cc,CONCAT22(sStack_22ce,sStack_22d0)));
    local_da8 = CONCAT26(sStack_2312,CONCAT24(sStack_2314,CONCAT22(sStack_2316,local_2318)));
    uStack_da0 = CONCAT26(sStack_230a,CONCAT24(sStack_230c,CONCAT22(sStack_230e,sStack_2310)));
    uVar21 = CONCAT13(local_1d68._1_1_,
                      CONCAT12(local_1f28._1_1_,CONCAT11((char)local_1d68,(undefined1)local_1f28)));
    uVar22 = CONCAT15(local_1d68._2_1_,CONCAT14(local_1f28._2_1_,uVar21));
    uVar97 = CONCAT17(local_1d68._3_1_,CONCAT16(local_1f28._3_1_,uVar22));
    uVar28 = CONCAT13(local_1d68._5_1_,
                      CONCAT12(local_1f28._5_1_,CONCAT11(local_1d68._4_1_,local_1f28._4_1_)));
    uVar29 = CONCAT15(local_1d68._6_1_,CONCAT14(local_1f28._6_1_,uVar28));
    uVar101 = CONCAT17(local_1d68._7_1_,CONCAT16(local_1f28._7_1_,uVar29));
    local_db8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_db8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_db8._6_2_ = (short)((ulong)uVar97 >> 0x30);
    uStack_db0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_db0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_db0._6_2_ = (short)((ulong)uVar101 >> 0x30);
    local_dd8 = local_2318 + CONCAT11((char)local_1d68,(undefined1)local_1f28);
    sStack_dd6 = sStack_2316 + local_db8._2_2_;
    sStack_dd4 = sStack_2314 + local_db8._4_2_;
    sStack_dd2 = sStack_2312 + local_db8._6_2_;
    sStack_dd0 = sStack_2310 + CONCAT11(local_1d68._4_1_,local_1f28._4_1_);
    sStack_dce = sStack_230e + uStack_db0._2_2_;
    sStack_dcc = sStack_230c + uStack_db0._4_2_;
    sStack_dca = sStack_230a + uStack_db0._6_2_;
    local_19f8 = local_22d8 + local_dd8;
    uStack_19f6 = sStack_22d6 + sStack_dd6;
    uStack_19f4 = sStack_22d4 + sStack_dd4;
    uStack_19f2 = sStack_22d2 + sStack_dd2;
    uStack_19f0 = sStack_22d0 + sStack_dd0;
    uStack_19ee = sStack_22ce + sStack_dce;
    uStack_19ec = sStack_22cc + sStack_dcc;
    uStack_19ea = sStack_22ca + sStack_dca;
    local_19fc = 3;
    local_2338 = local_19f8 >> 3;
    uStack_2336 = uStack_19f6 >> 3;
    uStack_2334 = uStack_19f4 >> 3;
    uStack_2332 = uStack_19f2 >> 3;
    uStack_2330 = uStack_19f0 >> 3;
    uStack_232e = uStack_19ee >> 3;
    uStack_232c = uStack_19ec >> 3;
    uStack_232a = uStack_19ea >> 3;
    local_e08 = CONCAT26(sStack_22e2,CONCAT24(sStack_22e4,CONCAT22(sStack_22e6,local_22e8)));
    uStack_e00 = CONCAT26(sStack_22da,CONCAT24(sStack_22dc,CONCAT22(sStack_22de,sStack_22e0)));
    local_de8 = CONCAT26(sStack_2322,CONCAT24(sStack_2324,CONCAT22(sStack_2326,local_2328)));
    uStack_de0 = CONCAT26(sStack_231a,CONCAT24(sStack_231c,CONCAT22(sStack_231e,sStack_2320)));
    uVar21 = CONCAT13(uStack_1d60._1_1_,
                      CONCAT12(uStack_1360._1_1_,CONCAT11((char)uStack_1d60,(undefined1)uStack_1360)
                              ));
    uVar22 = CONCAT15(uStack_1d60._2_1_,CONCAT14(uStack_1360._2_1_,uVar21));
    uVar53 = CONCAT17(uStack_1d60._3_1_,CONCAT16(uStack_1360._3_1_,uVar22));
    uVar28 = CONCAT13(uStack_1d60._5_1_,
                      CONCAT12(uStack_1360._5_1_,CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_)));
    uVar29 = CONCAT15(uStack_1d60._6_1_,CONCAT14(uStack_1360._6_1_,uVar28));
    uVar59 = CONCAT17(uStack_1d60._7_1_,CONCAT16(uStack_1360._7_1_,uVar29));
    local_df8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_df8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_df8._6_2_ = (short)((ulong)uVar53 >> 0x30);
    uStack_df0._2_2_ = (short)((uint)uVar28 >> 0x10);
    uStack_df0._4_2_ = (short)((uint6)uVar29 >> 0x20);
    uStack_df0._6_2_ = (short)((ulong)uVar59 >> 0x30);
    local_e18 = local_2328 + CONCAT11((char)uStack_1d60,(undefined1)uStack_1360);
    sStack_e16 = sStack_2326 + local_df8._2_2_;
    sStack_e14 = sStack_2324 + local_df8._4_2_;
    sStack_e12 = sStack_2322 + local_df8._6_2_;
    sStack_e10 = sStack_2320 + CONCAT11(uStack_1d60._4_1_,uStack_1360._4_1_);
    sStack_e0e = sStack_231e + uStack_df0._2_2_;
    sStack_e0c = sStack_231c + uStack_df0._4_2_;
    sStack_e0a = sStack_231a + uStack_df0._6_2_;
    local_1a18 = local_22e8 + local_e18;
    uStack_1a16 = sStack_22e6 + sStack_e16;
    uStack_1a14 = sStack_22e4 + sStack_e14;
    uStack_1a12 = sStack_22e2 + sStack_e12;
    uStack_1a10 = sStack_22e0 + sStack_e10;
    uStack_1a0e = sStack_22de + sStack_e0e;
    uStack_1a0c = sStack_22dc + sStack_e0c;
    uStack_1a0a = sStack_22da + sStack_e0a;
    local_1a1c = 3;
    local_2348 = local_1a18 >> 3;
    uStack_2346 = uStack_1a16 >> 3;
    uStack_2344 = uStack_1a14 >> 3;
    uStack_2342 = uStack_1a12 >> 3;
    uStack_2340 = uStack_1a10 >> 3;
    uStack_233e = uStack_1a0e >> 3;
    uStack_233c = uStack_1a0c >> 3;
    uStack_233a = uStack_1a0a >> 3;
    local_588 = CONCAT26(uStack_2332,CONCAT24(uStack_2334,CONCAT22(uStack_2336,local_2338)));
    uStack_580 = CONCAT26(uStack_232a,CONCAT24(uStack_232c,CONCAT22(uStack_232e,uStack_2330)));
    local_598 = CONCAT26(uStack_2342,CONCAT24(uStack_2344,CONCAT22(uStack_2346,local_2348)));
    uStack_590 = CONCAT26(uStack_233a,CONCAT24(uStack_233c,CONCAT22(uStack_233e,uStack_2340)));
    local_2178 = CONCAT17((uStack_232a != 0) * (uStack_232a < 0x100) * (char)uStack_232a -
                          (0xff < uStack_232a),
                          CONCAT16((uStack_232c != 0) * (uStack_232c < 0x100) * (char)uStack_232c -
                                   (0xff < uStack_232c),
                                   CONCAT15((uStack_232e != 0) * (uStack_232e < 0x100) *
                                            (char)uStack_232e - (0xff < uStack_232e),
                                            CONCAT14((uStack_2330 != 0) * (uStack_2330 < 0x100) *
                                                     (char)uStack_2330 - (0xff < uStack_2330),
                                                     CONCAT13((uStack_2332 != 0) *
                                                              (uStack_2332 < 0x100) *
                                                              (char)uStack_2332 -
                                                              (0xff < uStack_2332),
                                                              CONCAT12((uStack_2334 != 0) *
                                                                       (uStack_2334 < 0x100) *
                                                                       (char)uStack_2334 -
                                                                       (0xff < uStack_2334),
                                                                       CONCAT11((uStack_2336 != 0) *
                                                                                (uStack_2336 < 0x100
                                                                                ) * (char)
                                                  uStack_2336 - (0xff < uStack_2336),
                                                  (local_2338 != 0) * (local_2338 < 0x100) *
                                                  (char)local_2338 - (0xff < local_2338))))))));
    uStack_2170 = CONCAT17((uStack_233a != 0) * (uStack_233a < 0x100) * (char)uStack_233a -
                           (0xff < uStack_233a),
                           CONCAT16((uStack_233c != 0) * (uStack_233c < 0x100) * (char)uStack_233c -
                                    (0xff < uStack_233c),
                                    CONCAT15((uStack_233e != 0) * (uStack_233e < 0x100) *
                                             (char)uStack_233e - (0xff < uStack_233e),
                                             CONCAT14((uStack_2340 != 0) * (uStack_2340 < 0x100) *
                                                      (char)uStack_2340 - (0xff < uStack_2340),
                                                      CONCAT13((uStack_2342 != 0) *
                                                               (uStack_2342 < 0x100) *
                                                               (char)uStack_2342 -
                                                               (0xff < uStack_2342),
                                                               CONCAT12((uStack_2344 != 0) *
                                                                        (uStack_2344 < 0x100) *
                                                                        (char)uStack_2344 -
                                                                        (0xff < uStack_2344),
                                                                        CONCAT11((uStack_2346 != 0)
                                                                                 * (uStack_2346 <
                                                                                   0x100) *
                                                                                 (char)uStack_2346 -
                                                                                 (0xff < uStack_2346
                                                                                 ),(local_2348 != 0)
                                                                                   * (local_2348 <
                                                                                     0x100) *
                                                                                   (char)local_2348
                                                                                   - (0xff < 
                                                  local_2348))))))));
    b_04[1]._0_2_ = uVar144;
    b_04[1]._2_6_ = 0;
    uVar138 = (ulong)uVar144;
    a_05[1] = in_RSI;
    a_05[0] = (longlong)in_RDI;
    local_1f68 = uVar10;
    local_1f48 = uVar9;
    local_1f28 = uVar170;
    local_1f08 = uVar146;
    local_1ee8 = uVar145;
    local_1ec8 = uVar8;
    local_1ea8 = uVar7;
    local_1d78 = local_2028;
    uStack_1d70 = uStack_2020;
    local_1d68 = uVar1;
    uStack_1d60 = uVar2;
    local_1d58 = uVar3;
    uStack_1d50 = uVar4;
    local_1c38 = uVar5;
    uStack_1c30 = uVar6;
    uStack_13e0 = uVar17;
    uStack_13c0 = uVar16;
    uStack_13a0 = uVar15;
    uStack_1380 = uVar14;
    uStack_1360 = uVar13;
    uStack_1340 = uVar12;
    uStack_1320 = uVar11;
    local_df8 = uVar53;
    uStack_df0 = uVar59;
    local_db8 = uVar97;
    uStack_db0 = uVar101;
    local_d98 = uVar62;
    uStack_d90 = uVar65;
    local_d78 = uVar104;
    uStack_d70 = uVar107;
    local_d38 = uVar39;
    uStack_d30 = uVar46;
    local_cf8 = uVar87;
    uStack_cf0 = uVar92;
    local_c88 = uVar38;
    uStack_c80 = uVar45;
    local_c78 = uVar51;
    uStack_c70 = uVar57;
    local_c68 = uVar26;
    uStack_c60 = uVar33;
    local_c08 = uVar86;
    uStack_c00 = uVar91;
    local_bf8 = uVar78;
    uStack_bf0 = uVar83;
    local_be8 = uVar95;
    uStack_be0 = uVar99;
    local_bc8 = local_bd8;
    uStack_bc0 = uStack_bd0;
    local_ba8 = local_bb8;
    uStack_ba0 = uStack_bb0;
    local_b88 = local_b98;
    uStack_b80 = uStack_b90;
    local_b68 = local_b78;
    uStack_b60 = uStack_b70;
    local_b38 = uVar25;
    uStack_b30 = uVar32;
    local_b28 = uVar61;
    uStack_b20 = uVar64;
    local_af8 = uVar77;
    uStack_af0 = uVar82;
    local_ae8 = uVar103;
    uStack_ae0 = uVar106;
    local_a98 = uVar37;
    uStack_a90 = uVar44;
    local_a88 = uVar76;
    uStack_a80 = uVar81;
    local_a78 = uVar24;
    uStack_a70 = uVar31;
    local_a68 = uVar72;
    uStack_a60 = uVar73;
    local_a18 = uVar23;
    uStack_a10 = uVar30;
    local_a08 = uVar85;
    uStack_a00 = uVar90;
    local_9f8 = uVar75;
    uStack_9f0 = uVar80;
    local_9e8 = uVar114;
    uStack_9e0 = uVar115;
    local_9c8 = local_21c8;
    uStack_9c0 = uStack_21c0;
    local_988 = local_21b8;
    uStack_980 = uStack_21b0;
    local_928 = uVar20;
    uStack_920 = uVar27;
    local_918 = uVar34;
    uStack_910 = uVar41;
    local_908 = uVar48;
    uStack_900 = uVar54;
    local_8c8 = uVar74;
    uStack_8c0 = uVar79;
    local_8b8 = uVar84;
    uStack_8b0 = uVar89;
    local_8a8 = uVar94;
    uStack_8a0 = uVar98;
    local_888 = uVar68;
    uStack_880 = uVar70;
    local_878 = uVar60;
    uStack_870 = uVar63;
    local_868 = uVar66;
    uStack_860 = uVar67;
    local_848 = uVar110;
    uStack_840 = uVar112;
    local_838 = uVar102;
    uStack_830 = uVar105;
    local_828 = uVar108;
    uStack_820 = uVar109;
    local_718 = uVar88;
    uStack_710 = uVar93;
    local_6f8 = uVar40;
    uStack_6f0 = uVar47;
    local_6d8 = uVar52;
    uStack_6d0 = uVar58;
    local_6b8 = uVar96;
    uStack_6b0 = uVar100;
    local_698 = uVar69;
    uStack_690 = uVar71;
    local_678 = uVar111;
    uStack_670 = uVar113;
    local_48 = local_21b8;
    uStack_40 = uStack_21b0;
    local_28 = local_21c8;
    uStack_20 = uStack_21c0;
    alVar187 = abs_diff(a_05,b_04);
    b_05[0] = alVar187[1];
    b_05[1] = uVar138;
    a_06[1] = in_RSI;
    a_06[0] = (longlong)in_RDI;
    alVar187 = abs_diff(a_06,b_05);
    b_06[0] = alVar187[1];
    local_1c78 = (byte)extraout_XMM0_Qa_05;
    bStack_1c77 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
    bStack_1c76 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
    bStack_1c75 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
    bStack_1c74 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    bStack_1c73 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
    bStack_1c72 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
    bStack_1c71 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
    bStack_1c70 = (byte)extraout_XMM0_Qb_05;
    bStack_1c6f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
    bStack_1c6e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    bStack_1c6d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
    bStack_1c6c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    bStack_1c6b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
    bStack_1c6a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    bStack_1c69 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
    local_1c88 = (byte)extraout_XMM0_Qa_06;
    bStack_1c87 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
    bStack_1c86 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    bStack_1c85 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
    bStack_1c84 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    bStack_1c83 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
    bStack_1c82 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    bStack_1c81 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
    bStack_1c80 = (byte)extraout_XMM0_Qb_06;
    bStack_1c7f = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
    bStack_1c7e = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    bStack_1c7d = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
    bStack_1c7c = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    bStack_1c7b = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
    bStack_1c7a = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    bStack_1c79 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
    local_2038._1_1_ =
         (bStack_1c77 < bStack_1c87) * bStack_1c87 | (bStack_1c77 >= bStack_1c87) * bStack_1c77;
    local_2038._0_1_ =
         (local_1c78 < local_1c88) * local_1c88 | (local_1c78 >= local_1c88) * local_1c78;
    local_2038._2_1_ =
         (bStack_1c76 < bStack_1c86) * bStack_1c86 | (bStack_1c76 >= bStack_1c86) * bStack_1c76;
    local_2038._3_1_ =
         (bStack_1c75 < bStack_1c85) * bStack_1c85 | (bStack_1c75 >= bStack_1c85) * bStack_1c75;
    local_2038._4_1_ =
         (bStack_1c74 < bStack_1c84) * bStack_1c84 | (bStack_1c74 >= bStack_1c84) * bStack_1c74;
    local_2038._5_1_ =
         (bStack_1c73 < bStack_1c83) * bStack_1c83 | (bStack_1c73 >= bStack_1c83) * bStack_1c73;
    local_2038._6_1_ =
         (bStack_1c72 < bStack_1c82) * bStack_1c82 | (bStack_1c72 >= bStack_1c82) * bStack_1c72;
    local_2038._7_1_ =
         (bStack_1c71 < bStack_1c81) * bStack_1c81 | (bStack_1c71 >= bStack_1c81) * bStack_1c71;
    uStack_2030._0_1_ =
         (bStack_1c70 < bStack_1c80) * bStack_1c80 | (bStack_1c70 >= bStack_1c80) * bStack_1c70;
    uStack_2030._1_1_ =
         (bStack_1c6f < bStack_1c7f) * bStack_1c7f | (bStack_1c6f >= bStack_1c7f) * bStack_1c6f;
    uStack_2030._2_1_ =
         (bStack_1c6e < bStack_1c7e) * bStack_1c7e | (bStack_1c6e >= bStack_1c7e) * bStack_1c6e;
    uStack_2030._3_1_ =
         (bStack_1c6d < bStack_1c7d) * bStack_1c7d | (bStack_1c6d >= bStack_1c7d) * bStack_1c6d;
    uStack_2030._4_1_ =
         (bStack_1c6c < bStack_1c7c) * bStack_1c7c | (bStack_1c6c >= bStack_1c7c) * bStack_1c6c;
    uStack_2030._5_1_ =
         (bStack_1c6b < bStack_1c7b) * bStack_1c7b | (bStack_1c6b >= bStack_1c7b) * bStack_1c6b;
    uStack_2030._6_1_ =
         (bStack_1c6a < bStack_1c7a) * bStack_1c7a | (bStack_1c6a >= bStack_1c7a) * bStack_1c6a;
    uStack_2030._7_1_ =
         (bStack_1c69 < bStack_1c79) * bStack_1c79 | (bStack_1c69 >= bStack_1c79) * bStack_1c69;
    b_06[1] = uVar138;
    a_07[1] = in_RSI;
    a_07[0] = (longlong)in_RDI;
    abs_diff(a_07,b_06);
    puVar19 = local_1fb0;
    local_1c98 = (byte)extraout_XMM0_Qa_07;
    bStack_1c97 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
    bStack_1c96 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    bStack_1c95 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    bStack_1c94 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    bStack_1c93 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    bStack_1c92 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    bStack_1c91 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    bStack_1c90 = (byte)extraout_XMM0_Qb_07;
    bStack_1c8f = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_1c8e = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_1c8d = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_1c8c = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_1c8b = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_1c8a = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_1c89 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_1ca8 = (byte)local_2038;
    bStack_1ca7 = local_2038._1_1_;
    bStack_1ca6 = local_2038._2_1_;
    bStack_1ca5 = local_2038._3_1_;
    bStack_1ca4 = local_2038._4_1_;
    bStack_1ca3 = local_2038._5_1_;
    bStack_1ca2 = local_2038._6_1_;
    bStack_1ca1 = local_2038._7_1_;
    bStack_1ca0 = local_2038._8_1_;
    bStack_1c9f = local_2038._9_1_;
    bStack_1c9e = local_2038._10_1_;
    bStack_1c9d = local_2038._11_1_;
    bStack_1c9c = local_2038._12_1_;
    bStack_1c9b = local_2038._13_1_;
    bStack_1c9a = local_2038._14_1_;
    bStack_1c99 = local_2038._15_1_;
    bVar139 = (local_1c98 < local_1ca8) * local_1ca8 | (local_1c98 >= local_1ca8) * local_1c98;
    bVar149 = (bStack_1c97 < bStack_1ca7) * bStack_1ca7 | (bStack_1c97 >= bStack_1ca7) * bStack_1c97
    ;
    bVar150 = (bStack_1c96 < bStack_1ca6) * bStack_1ca6 | (bStack_1c96 >= bStack_1ca6) * bStack_1c96
    ;
    bVar154 = (bStack_1c95 < bStack_1ca5) * bStack_1ca5 | (bStack_1c95 >= bStack_1ca5) * bStack_1c95
    ;
    bVar155 = (bStack_1c94 < bStack_1ca4) * bStack_1ca4 | (bStack_1c94 >= bStack_1ca4) * bStack_1c94
    ;
    bVar159 = (bStack_1c93 < bStack_1ca3) * bStack_1ca3 | (bStack_1c93 >= bStack_1ca3) * bStack_1c93
    ;
    bVar160 = (bStack_1c92 < bStack_1ca2) * bStack_1ca2 | (bStack_1c92 >= bStack_1ca2) * bStack_1c92
    ;
    bVar164 = (bStack_1c91 < bStack_1ca1) * bStack_1ca1 | (bStack_1c91 >= bStack_1ca1) * bStack_1c91
    ;
    uStack_2030._0_1_ =
         (bStack_1c90 < bStack_1ca0) * bStack_1ca0 | (bStack_1c90 >= bStack_1ca0) * bStack_1c90;
    uStack_2030._1_1_ =
         (bStack_1c8f < bStack_1c9f) * bStack_1c9f | (bStack_1c8f >= bStack_1c9f) * bStack_1c8f;
    uStack_2030._2_1_ =
         (bStack_1c8e < bStack_1c9e) * bStack_1c9e | (bStack_1c8e >= bStack_1c9e) * bStack_1c8e;
    uStack_2030._3_1_ =
         (bStack_1c8d < bStack_1c9d) * bStack_1c9d | (bStack_1c8d >= bStack_1c9d) * bStack_1c8d;
    uStack_2030._4_1_ =
         (bStack_1c8c < bStack_1c9c) * bStack_1c9c | (bStack_1c8c >= bStack_1c9c) * bStack_1c8c;
    uStack_2030._5_1_ =
         (bStack_1c8b < bStack_1c9b) * bStack_1c9b | (bStack_1c8b >= bStack_1c9b) * bStack_1c8b;
    uStack_2030._6_1_ =
         (bStack_1c8a < bStack_1c9a) * bStack_1c9a | (bStack_1c8a >= bStack_1c9a) * bStack_1c8a;
    uStack_2030._7_1_ =
         (bStack_1c89 < bStack_1c99) * bStack_1c99 | (bStack_1c89 >= bStack_1c99) * bStack_1c89;
    local_2038._0_2_ =
         CONCAT11((bVar149 < uStack_2030._1_1_) * uStack_2030._1_1_ |
                  (bVar149 >= uStack_2030._1_1_) * bVar149,
                  (bVar139 < (byte)uStack_2030) * (byte)uStack_2030 |
                  (bVar139 >= (byte)uStack_2030) * bVar139);
    local_2038._0_3_ =
         CONCAT12((bVar150 < uStack_2030._2_1_) * uStack_2030._2_1_ |
                  (bVar150 >= uStack_2030._2_1_) * bVar150,(undefined2)local_2038);
    local_2038._0_4_ =
         CONCAT13((bVar154 < uStack_2030._3_1_) * uStack_2030._3_1_ |
                  (bVar154 >= uStack_2030._3_1_) * bVar154,(undefined3)local_2038);
    local_2038._0_5_ =
         CONCAT14((bVar155 < uStack_2030._4_1_) * uStack_2030._4_1_ |
                  (bVar155 >= uStack_2030._4_1_) * bVar155,(undefined4)local_2038);
    local_2038._0_6_ =
         CONCAT15((bVar159 < uStack_2030._5_1_) * uStack_2030._5_1_ |
                  (bVar159 >= uStack_2030._5_1_) * bVar159,(undefined5)local_2038);
    local_2038._0_7_ =
         CONCAT16((bVar160 < uStack_2030._6_1_) * uStack_2030._6_1_ |
                  (bVar160 >= uStack_2030._6_1_) * bVar160,(undefined6)local_2038);
    local_2038 = CONCAT17((bVar164 < uStack_2030._7_1_) * uStack_2030._7_1_ |
                          (bVar164 >= uStack_2030._7_1_) * bVar164,(undefined7)local_2038);
    auVar118._8_8_ = uStack_2030;
    auVar118._0_8_ = local_2038;
    auVar117._8_8_ = uStack_1ff0;
    auVar117._0_8_ = local_1ff8;
    auVar147 = psubusb(auVar118,auVar117);
    local_1d98 = auVar147[0];
    cStack_1d97 = auVar147[1];
    cStack_1d96 = auVar147[2];
    cStack_1d95 = auVar147[3];
    cStack_1d94 = auVar147[4];
    cStack_1d93 = auVar147[5];
    cStack_1d92 = auVar147[6];
    cStack_1d91 = auVar147[7];
    cStack_1d90 = auVar147[8];
    cStack_1d8f = auVar147[9];
    cStack_1d8e = auVar147[10];
    cStack_1d8d = auVar147[0xb];
    cStack_1d8c = auVar147[0xc];
    cStack_1d8b = auVar147[0xd];
    cStack_1d8a = auVar147[0xe];
    cStack_1d89 = auVar147[0xf];
    local_1da8 = (char)local_1fe8;
    cStack_1da7 = (char)((ulong)local_1fe8 >> 8);
    cStack_1da6 = (char)((ulong)local_1fe8 >> 0x10);
    cStack_1da5 = (char)((ulong)local_1fe8 >> 0x18);
    cStack_1da4 = (char)((ulong)local_1fe8 >> 0x20);
    cStack_1da3 = (char)((ulong)local_1fe8 >> 0x28);
    cStack_1da2 = (char)((ulong)local_1fe8 >> 0x30);
    cStack_1da1 = (char)((ulong)local_1fe8 >> 0x38);
    cStack_1da0 = (char)uStack_1fe0;
    cStack_1d9f = (char)((ulong)uStack_1fe0 >> 8);
    cStack_1d9e = (char)((ulong)uStack_1fe0 >> 0x10);
    cStack_1d9d = (char)((ulong)uStack_1fe0 >> 0x18);
    cStack_1d9c = (char)((ulong)uStack_1fe0 >> 0x20);
    cStack_1d9b = (char)((ulong)uStack_1fe0 >> 0x28);
    cStack_1d9a = (char)((ulong)uStack_1fe0 >> 0x30);
    cStack_1d99 = (char)((ulong)uStack_1fe0 >> 0x38);
    local_2038._0_2_ = CONCAT11(-(cStack_1d97 == cStack_1da7),-(local_1d98 == local_1da8));
    local_2038._0_3_ = CONCAT12(-(cStack_1d96 == cStack_1da6),(undefined2)local_2038);
    local_2038._0_4_ = CONCAT13(-(cStack_1d95 == cStack_1da5),(undefined3)local_2038);
    local_2038._0_5_ = CONCAT14(-(cStack_1d94 == cStack_1da4),(undefined4)local_2038);
    local_2038._0_6_ = CONCAT15(-(cStack_1d93 == cStack_1da3),(undefined5)local_2038);
    local_2038._0_7_ = CONCAT16(-(cStack_1d92 == cStack_1da2),(undefined6)local_2038);
    local_2038 = CONCAT17(-(cStack_1d91 == cStack_1da1),(undefined7)local_2038);
    uStack_2030._0_1_ = -(cStack_1d90 == cStack_1da0);
    uStack_2030._1_1_ = -(cStack_1d8f == cStack_1d9f);
    uStack_2030._2_1_ = -(cStack_1d8e == cStack_1d9e);
    uStack_2030._3_1_ = -(cStack_1d8d == cStack_1d9d);
    uStack_2030._4_1_ = -(cStack_1d8c == cStack_1d9c);
    uStack_2030._5_1_ = -(cStack_1d8b == cStack_1d9b);
    uStack_2030._6_1_ = -(cStack_1d8a == cStack_1d9a);
    uStack_2030._7_1_ = -(cStack_1d89 == cStack_1d99);
    uStack_2030 = uStack_2030 & uStack_2020;
    local_2038 = local_2038 & local_2028;
    uStack_2020 = local_2028;
    puVar18 = local_1fb0 + 1;
    uVar8 = ~local_2028;
    *local_1fb0 = ~local_2028 & *local_1fb0;
    puVar19[1] = uVar8 & *puVar18;
    puVar19 = local_1fb0;
    uStack_2170 = uStack_2020 & uStack_2170;
    puVar18 = local_1fb0 + 1;
    *local_1fb0 = *local_1fb0 | local_2028 & local_2178;
    puVar19[1] = *puVar18 | uStack_2170;
    puVar18 = local_1fb8;
    uVar8 = ~uStack_2020;
    uStack_2180 = uStack_2020 & uStack_2180;
    *local_1fb8 = ~local_2028 & local_2058 | local_2028 & local_2188;
    puVar18[1] = uVar8 & uStack_2050 | uStack_2180;
    puVar18 = local_1fc0;
    *local_1fc0 = ~local_2028 & local_2048 | local_2028 & local_2198;
    puVar18[1] = ~uStack_2020 & uStack_2040 | uStack_2020 & uStack_2190;
    puVar18 = local_1f98;
    local_1db8 = (char)local_2038;
    cStack_1db7 = local_2038._1_1_;
    cStack_1db6 = local_2038._2_1_;
    cStack_1db5 = local_2038._3_1_;
    cStack_1db4 = local_2038._4_1_;
    cStack_1db3 = local_2038._5_1_;
    cStack_1db2 = local_2038._6_1_;
    cStack_1db1 = local_2038._7_1_;
    cStack_1db0 = local_2038._8_1_;
    cStack_1daf = local_2038._9_1_;
    cStack_1dae = local_2038._10_1_;
    cStack_1dad = local_2038._11_1_;
    cStack_1dac = local_2038._12_1_;
    cStack_1dab = local_2038._13_1_;
    cStack_1daa = local_2038._14_1_;
    cStack_1da9 = local_2038._15_1_;
    local_1dc8 = (char)local_1fe8;
    cStack_1dc7 = (char)((ulong)local_1fe8 >> 8);
    cStack_1dc6 = (char)((ulong)local_1fe8 >> 0x10);
    cStack_1dc5 = (char)((ulong)local_1fe8 >> 0x18);
    cStack_1dc4 = (char)((ulong)local_1fe8 >> 0x20);
    cStack_1dc3 = (char)((ulong)local_1fe8 >> 0x28);
    cStack_1dc2 = (char)((ulong)local_1fe8 >> 0x30);
    cStack_1dc1 = (char)((ulong)local_1fe8 >> 0x38);
    cStack_1dc0 = (char)uStack_1fe0;
    cStack_1dbf = (char)((ulong)uStack_1fe0 >> 8);
    cStack_1dbe = (char)((ulong)uStack_1fe0 >> 0x10);
    cStack_1dbd = (char)((ulong)uStack_1fe0 >> 0x18);
    cStack_1dbc = (char)((ulong)uStack_1fe0 >> 0x20);
    cStack_1dbb = (char)((ulong)uStack_1fe0 >> 0x28);
    cStack_1dba = (char)((ulong)uStack_1fe0 >> 0x30);
    cStack_1db9 = (char)((ulong)uStack_1fe0 >> 0x38);
    auVar123[1] = -(cStack_1db7 == cStack_1dc7);
    auVar123[0] = -(local_1db8 == local_1dc8);
    auVar123[2] = -(cStack_1db6 == cStack_1dc6);
    auVar123[3] = -(cStack_1db5 == cStack_1dc5);
    auVar123[4] = -(cStack_1db4 == cStack_1dc4);
    auVar123[5] = -(cStack_1db3 == cStack_1dc3);
    auVar123[6] = -(cStack_1db2 == cStack_1dc2);
    auVar123[7] = -(cStack_1db1 == cStack_1dc1);
    auVar123[8] = -(cStack_1db0 == cStack_1dc0);
    auVar123[9] = -(cStack_1daf == cStack_1dbf);
    auVar123[10] = -(cStack_1dae == cStack_1dbe);
    auVar123[0xb] = -(cStack_1dad == cStack_1dbd);
    auVar123[0xc] = -(cStack_1dac == cStack_1dbc);
    auVar123[0xd] = -(cStack_1dab == cStack_1dbb);
    auVar123[0xe] = -(cStack_1daa == cStack_1dba);
    auVar123[0xf] = -(cStack_1da9 == cStack_1db9);
    if ((ushort)((ushort)(SUB161(auVar123 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar123 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar123 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar123 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar123 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar123 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar123 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar123 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar123 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar123 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar123 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar123 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar123 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar123 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar123 >> 0x77,0) & 1) << 0xe |
                (ushort)((byte)-(cStack_1da9 == cStack_1db9) >> 7) << 0xf) != 0xffff) {
      uVar21 = CONCAT13(cStack_2265,CONCAT12(uStack_2266,CONCAT11(cStack_2267,local_2268)));
      uVar22 = CONCAT15(cStack_2263,CONCAT14(uStack_2264,uVar21));
      uVar28 = CONCAT13(cStack_225d,CONCAT12(uStack_225e,CONCAT11(cStack_225f,uStack_2260)));
      uVar29 = CONCAT15(cStack_225b,CONCAT14(uStack_225c,uVar28));
      sStack_736 = (short)((uint)uVar21 >> 0x10);
      sStack_734 = (short)((uint6)uVar22 >> 0x20);
      sStack_732 = (short)(CONCAT17(cStack_2261,CONCAT16(uStack_2262,uVar22)) >> 0x30);
      sStack_72e = (short)((uint)uVar28 >> 0x10);
      sStack_72c = (short)((uint6)uVar29 >> 0x20);
      sStack_72a = (short)(CONCAT17(cStack_2259,CONCAT16(uStack_225a,uVar29)) >> 0x30);
      local_22b8 = local_22b8 - CONCAT11(cStack_2267,local_2268);
      sStack_22b0 = sStack_22b0 - CONCAT11(cStack_225f,uStack_2260);
      uVar21 = CONCAT13(cStack_21f5,CONCAT12(uStack_21f6,CONCAT11(cStack_21f7,local_21f8)));
      uVar22 = CONCAT15(cStack_21f3,CONCAT14(uStack_21f4,uVar21));
      uVar28 = CONCAT13(cStack_21ed,CONCAT12(uStack_21ee,CONCAT11(cStack_21ef,uStack_21f0)));
      uVar29 = CONCAT15(cStack_21eb,CONCAT14(uStack_21ec,uVar28));
      sStack_756 = (short)((uint)uVar21 >> 0x10);
      sStack_754 = (short)((uint6)uVar22 >> 0x20);
      sStack_752 = (short)(CONCAT17(cStack_21f1,CONCAT16(uStack_21f2,uVar22)) >> 0x30);
      sStack_74e = (short)((uint)uVar28 >> 0x10);
      sStack_74c = (short)((uint6)uVar29 >> 0x20);
      sStack_74a = (short)(CONCAT17(cStack_21e9,CONCAT16(uStack_21ea,uVar29)) >> 0x30);
      local_22c8 = local_22c8 - CONCAT11(cStack_21f7,local_21f8);
      sStack_22c0 = sStack_22c0 - CONCAT11(cStack_21ef,uStack_21f0);
      uVar21 = CONCAT13(cStack_21d5,CONCAT12(uStack_21d6,CONCAT11(cStack_21d7,local_21d8)));
      uVar22 = CONCAT15(cStack_21d3,CONCAT14(uStack_21d4,uVar21));
      uVar28 = CONCAT13(cStack_21cd,CONCAT12(uStack_21ce,CONCAT11(cStack_21cf,uStack_21d0)));
      uVar29 = CONCAT15(cStack_21cb,CONCAT14(uStack_21cc,uVar28));
      sStack_e36 = (short)((uint)uVar21 >> 0x10);
      sStack_e34 = (short)((uint6)uVar22 >> 0x20);
      sStack_e32 = (short)(CONCAT17(cStack_21d1,CONCAT16(uStack_21d2,uVar22)) >> 0x30);
      sStack_e2e = (short)((uint)uVar28 >> 0x10);
      sStack_e2c = (short)((uint6)uVar29 >> 0x20);
      sStack_e2a = (short)(CONCAT17(cStack_21c9,CONCAT16(uStack_21ca,uVar29)) >> 0x30);
      local_22f8 = local_22f8 + CONCAT11(cStack_21d7,local_21d8);
      sStack_22f0 = sStack_22f0 + CONCAT11(cStack_21cf,uStack_21d0);
      uVar21 = CONCAT13(cStack_2245,CONCAT12(uStack_2246,CONCAT11(cStack_2247,local_2248)));
      uVar22 = CONCAT15(cStack_2243,CONCAT14(uStack_2244,uVar21));
      uVar28 = CONCAT13(cStack_223d,CONCAT12(uStack_223e,CONCAT11(cStack_223f,uStack_2240)));
      uVar29 = CONCAT15(cStack_223b,CONCAT14(uStack_223c,uVar28));
      sStack_e56 = (short)((uint)uVar21 >> 0x10);
      sStack_e54 = (short)((uint6)uVar22 >> 0x20);
      sStack_e52 = (short)(CONCAT17(cStack_2241,CONCAT16(uStack_2242,uVar22)) >> 0x30);
      sStack_e4e = (short)((uint)uVar28 >> 0x10);
      sStack_e4c = (short)((uint6)uVar29 >> 0x20);
      sStack_e4a = (short)(CONCAT17(cStack_2239,CONCAT16(uStack_223a,uVar29)) >> 0x30);
      local_2308 = local_2308 + CONCAT11(cStack_2247,local_2248);
      sStack_2300 = sStack_2300 + CONCAT11(cStack_223f,uStack_2240);
      uVar35 = CONCAT13(cStack_2215,CONCAT12(uStack_2216,CONCAT11(cStack_2217,local_2218)));
      uVar36 = CONCAT15(cStack_2213,CONCAT14(uStack_2214,uVar35));
      uVar42 = CONCAT13(cStack_220d,CONCAT12(uStack_220e,CONCAT11(cStack_220f,uStack_2210)));
      uVar43 = CONCAT15(cStack_220b,CONCAT14(uStack_220c,uVar42));
      uVar49 = CONCAT13(cStack_2205,CONCAT12(uStack_2206,CONCAT11(cStack_2207,local_2208)));
      uVar50 = CONCAT15(cStack_2203,CONCAT14(uStack_2204,uVar49));
      uVar55 = CONCAT13(cStack_21fd,CONCAT12(uStack_21fe,CONCAT11(cStack_21ff,uStack_2200)));
      uVar56 = CONCAT15(cStack_21fb,CONCAT14(uStack_21fc,uVar55));
      uVar21 = CONCAT13(cStack_2225,CONCAT12(uStack_2226,CONCAT11(cStack_2227,local_2228)));
      uVar22 = CONCAT15(cStack_2223,CONCAT14(uStack_2224,uVar21));
      uVar28 = CONCAT13(cStack_221d,CONCAT12(uStack_221e,CONCAT11(cStack_221f,uStack_2220)));
      uVar29 = CONCAT15(cStack_221b,CONCAT14(uStack_221c,uVar28));
      sStack_e66 = (short)((uint)uVar49 >> 0x10);
      sStack_e64 = (short)((uint6)uVar50 >> 0x20);
      sStack_e62 = (short)(CONCAT17(cStack_2201,CONCAT16(uStack_2202,uVar50)) >> 0x30);
      sStack_e5e = (short)((uint)uVar55 >> 0x10);
      sStack_e5c = (short)((uint6)uVar56 >> 0x20);
      sStack_e5a = (short)(CONCAT17(cStack_21f9,CONCAT16(uStack_21fa,uVar56)) >> 0x30);
      sStack_e76 = (short)((uint)uVar21 >> 0x10);
      sStack_e74 = (short)((uint6)uVar22 >> 0x20);
      sStack_e72 = (short)(CONCAT17(cStack_2221,CONCAT16(uStack_2222,uVar22)) >> 0x30);
      sStack_e6e = (short)((uint)uVar28 >> 0x10);
      sStack_e6c = (short)((uint6)uVar29 >> 0x20);
      sStack_e6a = (short)(CONCAT17(cStack_2219,CONCAT16(uStack_221a,uVar29)) >> 0x30);
      sStack_e86 = (short)((uint)uVar35 >> 0x10);
      sStack_e84 = (short)((uint6)uVar36 >> 0x20);
      sStack_e82 = (short)(CONCAT17(cStack_2211,CONCAT16(uStack_2212,uVar36)) >> 0x30);
      sStack_e7e = (short)((uint)uVar42 >> 0x10);
      sStack_e7c = (short)((uint6)uVar43 >> 0x20);
      sStack_e7a = (short)(CONCAT17(cStack_2209,CONCAT16(uStack_220a,uVar43)) >> 0x30);
      uVar144 = (ushort)(local_22b8 +
                        local_22f8 +
                        CONCAT11(cStack_2217,local_2218) +
                        CONCAT11(cStack_2207,local_2208) + CONCAT11(cStack_2227,local_2228)) >> 4;
      uVar143 = (ushort)((sStack_22b6 - sStack_736) +
                        sStack_22f6 + sStack_e36 + sStack_e86 + sStack_e66 + sStack_e76) >> 4;
      uVar153 = (ushort)((sStack_22b4 - sStack_734) +
                        sStack_22f4 + sStack_e34 + sStack_e84 + sStack_e64 + sStack_e74) >> 4;
      uVar158 = (ushort)((sStack_22b2 - sStack_732) +
                        sStack_22f2 + sStack_e32 + sStack_e82 + sStack_e62 + sStack_e72) >> 4;
      uVar163 = (ushort)(sStack_22b0 +
                        sStack_22f0 +
                        CONCAT11(cStack_220f,uStack_2210) +
                        CONCAT11(cStack_21ff,uStack_2200) + CONCAT11(cStack_221f,uStack_2220)) >> 4;
      uVar169 = (ushort)((sStack_22ae - sStack_72e) +
                        sStack_22ee + sStack_e2e + sStack_e7e + sStack_e5e + sStack_e6e) >> 4;
      uVar175 = (ushort)((sStack_22ac - sStack_72c) +
                        sStack_22ec + sStack_e2c + sStack_e7c + sStack_e5c + sStack_e6c) >> 4;
      uVar180 = (ushort)((sStack_22aa - sStack_72a) +
                        sStack_22ea + sStack_e2a + sStack_e7a + sStack_e5a + sStack_e6a) >> 4;
      uVar35 = CONCAT13(cStack_2285,CONCAT12(uStack_2286,CONCAT11(cStack_2287,local_2288)));
      uVar36 = CONCAT15(cStack_2283,CONCAT14(uStack_2284,uVar35));
      uVar42 = CONCAT13(cStack_227d,CONCAT12(uStack_227e,CONCAT11(cStack_227f,uStack_2280)));
      uVar43 = CONCAT15(cStack_227b,CONCAT14(uStack_227c,uVar42));
      uVar21 = CONCAT13(cStack_2295,CONCAT12(uStack_2296,CONCAT11(cStack_2297,local_2298)));
      uVar22 = CONCAT15(cStack_2293,CONCAT14(uStack_2294,uVar21));
      uVar28 = CONCAT13(cStack_228d,CONCAT12(uStack_228e,CONCAT11(cStack_228f,uStack_2290)));
      uVar29 = CONCAT15(cStack_228b,CONCAT14(uStack_228c,uVar28));
      uVar49 = CONCAT13(cStack_2275,CONCAT12(uStack_2276,CONCAT11(cStack_2277,local_2278)));
      uVar50 = CONCAT15(cStack_2273,CONCAT14(uStack_2274,uVar49));
      uVar55 = CONCAT13(cStack_226d,CONCAT12(uStack_226e,CONCAT11(cStack_226f,uStack_2270)));
      uVar56 = CONCAT15(cStack_226b,CONCAT14(uStack_226c,uVar55));
      sStack_ee6 = (short)((uint)uVar21 >> 0x10);
      sStack_ee4 = (short)((uint6)uVar22 >> 0x20);
      sStack_ee2 = (short)(CONCAT17(cStack_2291,CONCAT16(uStack_2292,uVar22)) >> 0x30);
      sStack_ede = (short)((uint)uVar28 >> 0x10);
      sStack_edc = (short)((uint6)uVar29 >> 0x20);
      sStack_eda = (short)(CONCAT17(cStack_2289,CONCAT16(uStack_228a,uVar29)) >> 0x30);
      sStack_ef6 = (short)((uint)uVar49 >> 0x10);
      sStack_ef4 = (short)((uint6)uVar50 >> 0x20);
      sStack_ef2 = (short)(CONCAT17(cStack_2271,CONCAT16(uStack_2272,uVar50)) >> 0x30);
      sStack_eee = (short)((uint)uVar55 >> 0x10);
      sStack_eec = (short)((uint6)uVar56 >> 0x20);
      sStack_eea = (short)(CONCAT17(cStack_2269,CONCAT16(uStack_226a,uVar56)) >> 0x30);
      sStack_f06 = (short)((uint)uVar35 >> 0x10);
      sStack_f04 = (short)((uint6)uVar36 >> 0x20);
      sStack_f02 = (short)(CONCAT17(cStack_2281,CONCAT16(uStack_2282,uVar36)) >> 0x30);
      sStack_efe = (short)((uint)uVar42 >> 0x10);
      sStack_efc = (short)((uint6)uVar43 >> 0x20);
      sStack_efa = (short)(CONCAT17(cStack_2279,CONCAT16(uStack_227a,uVar43)) >> 0x30);
      uVar142 = (ushort)(local_22c8 +
                        local_2308 +
                        CONCAT11(cStack_2287,local_2288) +
                        CONCAT11(cStack_2297,local_2298) + CONCAT11(cStack_2277,local_2278)) >> 4;
      uVar152 = (ushort)((sStack_22c6 - sStack_756) +
                        sStack_2306 + sStack_e56 + sStack_f06 + sStack_ee6 + sStack_ef6) >> 4;
      uVar157 = (ushort)((sStack_22c4 - sStack_754) +
                        sStack_2304 + sStack_e54 + sStack_f04 + sStack_ee4 + sStack_ef4) >> 4;
      uVar162 = (ushort)((sStack_22c2 - sStack_752) +
                        sStack_2302 + sStack_e52 + sStack_f02 + sStack_ee2 + sStack_ef2) >> 4;
      uVar168 = (ushort)(sStack_22c0 +
                        sStack_2300 +
                        CONCAT11(cStack_227f,uStack_2280) +
                        CONCAT11(cStack_228f,uStack_2290) + CONCAT11(cStack_226f,uStack_2270)) >> 4;
      uVar174 = (ushort)((sStack_22be - sStack_74e) +
                        sStack_22fe + sStack_e4e + sStack_efe + sStack_ede + sStack_eee) >> 4;
      uVar179 = (ushort)((sStack_22bc - sStack_74c) +
                        sStack_22fc + sStack_e4c + sStack_efc + sStack_edc + sStack_eec) >> 4;
      uVar184 = (ushort)((sStack_22ba - sStack_74a) +
                        sStack_22fa + sStack_e4a + sStack_efa + sStack_eda + sStack_eea) >> 4;
      local_2148 = CONCAT17((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 - (0xff < uVar180),
                            CONCAT16((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                     (0xff < uVar175),
                                     CONCAT15((uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                              (0xff < uVar169),
                                              CONCAT14((uVar163 != 0) * (uVar163 < 0x100) *
                                                       (char)uVar163 - (0xff < uVar163),
                                                       CONCAT13((uVar158 != 0) * (uVar158 < 0x100) *
                                                                (char)uVar158 - (0xff < uVar158),
                                                                CONCAT12((uVar153 != 0) *
                                                                         (uVar153 < 0x100) *
                                                                         (char)uVar153 -
                                                                         (0xff < uVar153),
                                                                         CONCAT11((uVar143 != 0) *
                                                                                  (uVar143 < 0x100)
                                                                                  * (char)uVar143 -
                                                                                  (0xff < uVar143),
                                                                                  (uVar144 != 0) *
                                                                                  (uVar144 < 0x100)
                                                                                  * (char)uVar144 -
                                                                                  (0xff < uVar144)))
                                                               )))));
      uStack_2140 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                             CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                      (0xff < uVar179),
                                      CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                               (0xff < uVar174),
                                               CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                        (char)uVar168 - (0xff < uVar168),
                                                        CONCAT13((uVar162 != 0) * (uVar162 < 0x100)
                                                                 * (char)uVar162 - (0xff < uVar162),
                                                                 CONCAT12((uVar157 != 0) *
                                                                          (uVar157 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < uVar157),
                                                                          CONCAT11((uVar152 != 0) *
                                                                                   (uVar152 < 0x100)
                                                                                   * (char)uVar152 -
                                                                                   (0xff < uVar152),
                                                                                   (uVar142 != 0) *
                                                                                   (uVar142 < 0x100)
                                                                                   * (char)uVar142 -
                                                                                   (0xff < uVar142))
                                                                         ))))));
      uVar21 = CONCAT13(cStack_21d5,CONCAT12(uStack_21d6,CONCAT11(cStack_21d7,local_21d8)));
      uVar22 = CONCAT15(cStack_21d3,CONCAT14(uStack_21d4,uVar21));
      uVar28 = CONCAT13(cStack_21cd,CONCAT12(uStack_21ce,CONCAT11(cStack_21cf,uStack_21d0)));
      uVar29 = CONCAT15(cStack_21cb,CONCAT14(uStack_21cc,uVar28));
      sStack_f76 = (short)((uint)uVar21 >> 0x10);
      sStack_f74 = (short)((uint6)uVar22 >> 0x20);
      sStack_f72 = (short)(CONCAT17(cStack_21d1,CONCAT16(uStack_21d2,uVar22)) >> 0x30);
      sStack_f6e = (short)((uint)uVar28 >> 0x10);
      sStack_f6c = (short)((uint6)uVar29 >> 0x20);
      sStack_f6a = (short)(CONCAT17(cStack_21c9,CONCAT16(uStack_21ca,uVar29)) >> 0x30);
      local_22f8 = local_22f8 + CONCAT11(cStack_21d7,local_21d8);
      sStack_f76 = sStack_22f6 + sStack_e36 + sStack_f76;
      sStack_f74 = sStack_22f4 + sStack_e34 + sStack_f74;
      sStack_f72 = sStack_22f2 + sStack_e32 + sStack_f72;
      sStack_22f0 = sStack_22f0 + CONCAT11(cStack_21cf,uStack_21d0);
      sStack_f6e = sStack_22ee + sStack_e2e + sStack_f6e;
      sStack_f6c = sStack_22ec + sStack_e2c + sStack_f6c;
      sStack_f6a = sStack_22ea + sStack_e2a + sStack_f6a;
      uVar21 = CONCAT13(cStack_2245,CONCAT12(uStack_2246,CONCAT11(cStack_2247,local_2248)));
      uVar22 = CONCAT15(cStack_2243,CONCAT14(uStack_2244,uVar21));
      uVar28 = CONCAT13(cStack_223d,CONCAT12(uStack_223e,CONCAT11(cStack_223f,uStack_2240)));
      uVar29 = CONCAT15(cStack_223b,CONCAT14(uStack_223c,uVar28));
      sStack_f96 = (short)((uint)uVar21 >> 0x10);
      sStack_f94 = (short)((uint6)uVar22 >> 0x20);
      sStack_f92 = (short)(CONCAT17(cStack_2241,CONCAT16(uStack_2242,uVar22)) >> 0x30);
      sStack_f8e = (short)((uint)uVar28 >> 0x10);
      sStack_f8c = (short)((uint6)uVar29 >> 0x20);
      sStack_f8a = (short)(CONCAT17(cStack_2239,CONCAT16(uStack_223a,uVar29)) >> 0x30);
      local_2308 = local_2308 + CONCAT11(cStack_2247,local_2248);
      sStack_f96 = sStack_2306 + sStack_e56 + sStack_f96;
      sStack_f94 = sStack_2304 + sStack_e54 + sStack_f94;
      sStack_f92 = sStack_2302 + sStack_e52 + sStack_f92;
      sStack_2300 = sStack_2300 + CONCAT11(cStack_223f,uStack_2240);
      sStack_f8e = sStack_22fe + sStack_e4e + sStack_f8e;
      sStack_f8c = sStack_22fc + sStack_e4c + sStack_f8c;
      sStack_f8a = sStack_22fa + sStack_e4a + sStack_f8a;
      uVar21 = CONCAT13(cStack_2275,CONCAT12(uStack_2276,CONCAT11(cStack_2277,local_2278)));
      uVar22 = CONCAT15(cStack_2273,CONCAT14(uStack_2274,uVar21));
      uVar28 = CONCAT13(cStack_226d,CONCAT12(uStack_226e,CONCAT11(cStack_226f,uStack_2270)));
      uVar29 = CONCAT15(cStack_226b,CONCAT14(uStack_226c,uVar28));
      sStack_776 = (short)((uint)uVar21 >> 0x10);
      sStack_774 = (short)((uint6)uVar22 >> 0x20);
      sStack_772 = (short)(CONCAT17(cStack_2271,CONCAT16(uStack_2272,uVar22)) >> 0x30);
      sStack_76e = (short)((uint)uVar28 >> 0x10);
      sStack_76c = (short)((uint6)uVar29 >> 0x20);
      sStack_76a = (short)(CONCAT17(cStack_2269,CONCAT16(uStack_226a,uVar29)) >> 0x30);
      local_22b8 = local_22b8 - CONCAT11(cStack_2277,local_2278);
      sStack_776 = (sStack_22b6 - sStack_736) - sStack_776;
      sStack_774 = (sStack_22b4 - sStack_734) - sStack_774;
      sStack_772 = (sStack_22b2 - sStack_732) - sStack_772;
      sStack_22b0 = sStack_22b0 - CONCAT11(cStack_226f,uStack_2270);
      sStack_76e = (sStack_22ae - sStack_72e) - sStack_76e;
      sStack_76c = (sStack_22ac - sStack_72c) - sStack_76c;
      sStack_76a = (sStack_22aa - sStack_72a) - sStack_76a;
      uVar21 = CONCAT13(cStack_2205,CONCAT12(uStack_2206,CONCAT11(cStack_2207,local_2208)));
      uVar22 = CONCAT15(cStack_2203,CONCAT14(uStack_2204,uVar21));
      uVar28 = CONCAT13(cStack_21fd,CONCAT12(uStack_21fe,CONCAT11(cStack_21ff,uStack_2200)));
      uVar29 = CONCAT15(cStack_21fb,CONCAT14(uStack_21fc,uVar28));
      sStack_796 = (short)((uint)uVar21 >> 0x10);
      sStack_794 = (short)((uint6)uVar22 >> 0x20);
      sStack_792 = (short)(CONCAT17(cStack_2201,CONCAT16(uStack_2202,uVar22)) >> 0x30);
      sStack_78e = (short)((uint)uVar28 >> 0x10);
      sStack_78c = (short)((uint6)uVar29 >> 0x20);
      sStack_78a = (short)(CONCAT17(cStack_21f9,CONCAT16(uStack_21fa,uVar29)) >> 0x30);
      local_22c8 = local_22c8 - CONCAT11(cStack_2207,local_2208);
      sStack_796 = (sStack_22c6 - sStack_756) - sStack_796;
      sStack_794 = (sStack_22c4 - sStack_754) - sStack_794;
      sStack_792 = (sStack_22c2 - sStack_752) - sStack_792;
      sStack_22c0 = sStack_22c0 - CONCAT11(cStack_21ff,uStack_2200);
      sStack_78e = (sStack_22be - sStack_74e) - sStack_78e;
      sStack_78c = (sStack_22bc - sStack_74c) - sStack_78c;
      sStack_78a = (sStack_22ba - sStack_74a) - sStack_78a;
      uVar35 = CONCAT13(cStack_2205,CONCAT12(uStack_2206,CONCAT11(cStack_2207,local_2208)));
      uVar36 = CONCAT15(cStack_2203,CONCAT14(uStack_2204,uVar35));
      uVar42 = CONCAT13(cStack_21fd,CONCAT12(uStack_21fe,CONCAT11(cStack_21ff,uStack_2200)));
      uVar43 = CONCAT15(cStack_21fb,CONCAT14(uStack_21fc,uVar42));
      uVar49 = CONCAT13(cStack_21f5,CONCAT12(uStack_21f6,CONCAT11(cStack_21f7,local_21f8)));
      uVar50 = CONCAT15(cStack_21f3,CONCAT14(uStack_21f4,uVar49));
      uVar55 = CONCAT13(cStack_21ed,CONCAT12(uStack_21ee,CONCAT11(cStack_21ef,uStack_21f0)));
      uVar56 = CONCAT15(cStack_21eb,CONCAT14(uStack_21ec,uVar55));
      uVar21 = CONCAT13(cStack_2215,CONCAT12(uStack_2216,CONCAT11(cStack_2217,local_2218)));
      uVar22 = CONCAT15(cStack_2213,CONCAT14(uStack_2214,uVar21));
      uVar28 = CONCAT13(cStack_220d,CONCAT12(uStack_220e,CONCAT11(cStack_220f,uStack_2210)));
      uVar29 = CONCAT15(cStack_220b,CONCAT14(uStack_220c,uVar28));
      sStack_fa6 = (short)((uint)uVar49 >> 0x10);
      sStack_fa4 = (short)((uint6)uVar50 >> 0x20);
      sStack_fa2 = (short)(CONCAT17(cStack_21f1,CONCAT16(uStack_21f2,uVar50)) >> 0x30);
      sStack_f9e = (short)((uint)uVar55 >> 0x10);
      sStack_f9c = (short)((uint6)uVar56 >> 0x20);
      sStack_f9a = (short)(CONCAT17(cStack_21e9,CONCAT16(uStack_21ea,uVar56)) >> 0x30);
      sStack_fb6 = (short)((uint)uVar21 >> 0x10);
      sStack_fb4 = (short)((uint6)uVar22 >> 0x20);
      sStack_fb2 = (short)(CONCAT17(cStack_2211,CONCAT16(uStack_2212,uVar22)) >> 0x30);
      sStack_fae = (short)((uint)uVar28 >> 0x10);
      sStack_fac = (short)((uint6)uVar29 >> 0x20);
      sStack_faa = (short)(CONCAT17(cStack_2209,CONCAT16(uStack_220a,uVar29)) >> 0x30);
      sStack_fc6 = (short)((uint)uVar35 >> 0x10);
      sStack_fc4 = (short)((uint6)uVar36 >> 0x20);
      sStack_fc2 = (short)(CONCAT17(cStack_2201,CONCAT16(uStack_2202,uVar36)) >> 0x30);
      sStack_fbe = (short)((uint)uVar42 >> 0x10);
      sStack_fbc = (short)((uint6)uVar43 >> 0x20);
      sStack_fba = (short)(CONCAT17(cStack_21f9,CONCAT16(uStack_21fa,uVar43)) >> 0x30);
      uVar144 = (ushort)(local_22b8 +
                        local_22f8 +
                        CONCAT11(cStack_2207,local_2208) +
                        CONCAT11(cStack_21f7,local_21f8) + CONCAT11(cStack_2217,local_2218)) >> 4;
      uVar143 = (ushort)(sStack_776 + sStack_f76 + sStack_fc6 + sStack_fa6 + sStack_fb6) >> 4;
      uVar153 = (ushort)(sStack_774 + sStack_f74 + sStack_fc4 + sStack_fa4 + sStack_fb4) >> 4;
      uVar158 = (ushort)(sStack_772 + sStack_f72 + sStack_fc2 + sStack_fa2 + sStack_fb2) >> 4;
      uVar163 = (ushort)(sStack_22b0 +
                        sStack_22f0 +
                        CONCAT11(cStack_21ff,uStack_2200) +
                        CONCAT11(cStack_21ef,uStack_21f0) + CONCAT11(cStack_220f,uStack_2210)) >> 4;
      uVar169 = (ushort)(sStack_76e + sStack_f6e + sStack_fbe + sStack_f9e + sStack_fae) >> 4;
      uVar175 = (ushort)(sStack_76c + sStack_f6c + sStack_fbc + sStack_f9c + sStack_fac) >> 4;
      uVar180 = (ushort)(sStack_76a + sStack_f6a + sStack_fba + sStack_f9a + sStack_faa) >> 4;
      uVar35 = CONCAT13(cStack_2275,CONCAT12(uStack_2276,CONCAT11(cStack_2277,local_2278)));
      uVar36 = CONCAT15(cStack_2273,CONCAT14(uStack_2274,uVar35));
      uVar42 = CONCAT13(cStack_226d,CONCAT12(uStack_226e,CONCAT11(cStack_226f,uStack_2270)));
      uVar43 = CONCAT15(cStack_226b,CONCAT14(uStack_226c,uVar42));
      uVar21 = CONCAT13(cStack_2285,CONCAT12(uStack_2286,CONCAT11(cStack_2287,local_2288)));
      uVar22 = CONCAT15(cStack_2283,CONCAT14(uStack_2284,uVar21));
      uVar28 = CONCAT13(cStack_227d,CONCAT12(uStack_227e,CONCAT11(cStack_227f,uStack_2280)));
      uVar29 = CONCAT15(cStack_227b,CONCAT14(uStack_227c,uVar28));
      uVar49 = CONCAT13(cStack_2265,CONCAT12(uStack_2266,CONCAT11(cStack_2267,local_2268)));
      uVar50 = CONCAT15(cStack_2263,CONCAT14(uStack_2264,uVar49));
      uVar55 = CONCAT13(cStack_225d,CONCAT12(uStack_225e,CONCAT11(cStack_225f,uStack_2260)));
      uVar56 = CONCAT15(cStack_225b,CONCAT14(uStack_225c,uVar55));
      sStack_1026 = (short)((uint)uVar21 >> 0x10);
      sStack_1024 = (short)((uint6)uVar22 >> 0x20);
      sStack_1022 = (short)(CONCAT17(cStack_2281,CONCAT16(uStack_2282,uVar22)) >> 0x30);
      sStack_101e = (short)((uint)uVar28 >> 0x10);
      sStack_101c = (short)((uint6)uVar29 >> 0x20);
      sStack_101a = (short)(CONCAT17(cStack_2279,CONCAT16(uStack_227a,uVar29)) >> 0x30);
      sStack_1036 = (short)((uint)uVar49 >> 0x10);
      sStack_1034 = (short)((uint6)uVar50 >> 0x20);
      sStack_1032 = (short)(CONCAT17(cStack_2261,CONCAT16(uStack_2262,uVar50)) >> 0x30);
      sStack_102e = (short)((uint)uVar55 >> 0x10);
      sStack_102c = (short)((uint6)uVar56 >> 0x20);
      sStack_102a = (short)(CONCAT17(cStack_2259,CONCAT16(uStack_225a,uVar56)) >> 0x30);
      sStack_1046 = (short)((uint)uVar35 >> 0x10);
      sStack_1044 = (short)((uint6)uVar36 >> 0x20);
      sStack_1042 = (short)(CONCAT17(cStack_2271,CONCAT16(uStack_2272,uVar36)) >> 0x30);
      sStack_103e = (short)((uint)uVar42 >> 0x10);
      sStack_103c = (short)((uint6)uVar43 >> 0x20);
      sStack_103a = (short)(CONCAT17(cStack_2269,CONCAT16(uStack_226a,uVar43)) >> 0x30);
      uVar142 = (ushort)(local_22c8 +
                        local_2308 +
                        CONCAT11(cStack_2277,local_2278) +
                        CONCAT11(cStack_2287,local_2288) + CONCAT11(cStack_2267,local_2268)) >> 4;
      uVar152 = (ushort)(sStack_796 + sStack_f96 + sStack_1046 + sStack_1026 + sStack_1036) >> 4;
      uVar157 = (ushort)(sStack_794 + sStack_f94 + sStack_1044 + sStack_1024 + sStack_1034) >> 4;
      uVar162 = (ushort)(sStack_792 + sStack_f92 + sStack_1042 + sStack_1022 + sStack_1032) >> 4;
      uVar168 = (ushort)(sStack_22c0 +
                        sStack_2300 +
                        CONCAT11(cStack_226f,uStack_2270) +
                        CONCAT11(cStack_227f,uStack_2280) + CONCAT11(cStack_225f,uStack_2260)) >> 4;
      uVar174 = (ushort)(sStack_78e + sStack_f8e + sStack_103e + sStack_101e + sStack_102e) >> 4;
      uVar179 = (ushort)(sStack_78c + sStack_f8c + sStack_103c + sStack_101c + sStack_102c) >> 4;
      uVar184 = (ushort)(sStack_78a + sStack_f8a + sStack_103a + sStack_101a + sStack_102a) >> 4;
      local_2138 = CONCAT17((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 - (0xff < uVar180),
                            CONCAT16((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                     (0xff < uVar175),
                                     CONCAT15((uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                              (0xff < uVar169),
                                              CONCAT14((uVar163 != 0) * (uVar163 < 0x100) *
                                                       (char)uVar163 - (0xff < uVar163),
                                                       CONCAT13((uVar158 != 0) * (uVar158 < 0x100) *
                                                                (char)uVar158 - (0xff < uVar158),
                                                                CONCAT12((uVar153 != 0) *
                                                                         (uVar153 < 0x100) *
                                                                         (char)uVar153 -
                                                                         (0xff < uVar153),
                                                                         CONCAT11((uVar143 != 0) *
                                                                                  (uVar143 < 0x100)
                                                                                  * (char)uVar143 -
                                                                                  (0xff < uVar143),
                                                                                  (uVar144 != 0) *
                                                                                  (uVar144 < 0x100)
                                                                                  * (char)uVar144 -
                                                                                  (0xff < uVar144)))
                                                               )))));
      uStack_2130 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                             CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                      (0xff < uVar179),
                                      CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                               (0xff < uVar174),
                                               CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                        (char)uVar168 - (0xff < uVar168),
                                                        CONCAT13((uVar162 != 0) * (uVar162 < 0x100)
                                                                 * (char)uVar162 - (0xff < uVar162),
                                                                 CONCAT12((uVar157 != 0) *
                                                                          (uVar157 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < uVar157),
                                                                          CONCAT11((uVar152 != 0) *
                                                                                   (uVar152 < 0x100)
                                                                                   * (char)uVar152 -
                                                                                   (0xff < uVar152),
                                                                                   (uVar142 != 0) *
                                                                                   (uVar142 < 0x100)
                                                                                   * (char)uVar142 -
                                                                                   (0xff < uVar142))
                                                                         ))))));
      uVar21 = CONCAT13(cStack_21d5,CONCAT12(uStack_21d6,CONCAT11(cStack_21d7,local_21d8)));
      uVar22 = CONCAT15(cStack_21d3,CONCAT14(uStack_21d4,uVar21));
      uVar28 = CONCAT13(cStack_21cd,CONCAT12(uStack_21ce,CONCAT11(cStack_21cf,uStack_21d0)));
      uVar29 = CONCAT15(cStack_21cb,CONCAT14(uStack_21cc,uVar28));
      sStack_10b6 = (short)((uint)uVar21 >> 0x10);
      sStack_10b4 = (short)((uint6)uVar22 >> 0x20);
      sStack_10b2 = (short)(CONCAT17(cStack_21d1,CONCAT16(uStack_21d2,uVar22)) >> 0x30);
      sStack_10ae = (short)((uint)uVar28 >> 0x10);
      sStack_10ac = (short)((uint6)uVar29 >> 0x20);
      sStack_10aa = (short)(CONCAT17(cStack_21c9,CONCAT16(uStack_21ca,uVar29)) >> 0x30);
      local_22f8 = local_22f8 + CONCAT11(cStack_21d7,local_21d8);
      sStack_f76 = sStack_f76 + sStack_10b6;
      sStack_f74 = sStack_f74 + sStack_10b4;
      sStack_f72 = sStack_f72 + sStack_10b2;
      sStack_22f0 = sStack_22f0 + CONCAT11(cStack_21cf,uStack_21d0);
      sStack_f6e = sStack_f6e + sStack_10ae;
      sStack_f6c = sStack_f6c + sStack_10ac;
      sStack_f6a = sStack_f6a + sStack_10aa;
      uVar21 = CONCAT13(cStack_2245,CONCAT12(uStack_2246,CONCAT11(cStack_2247,local_2248)));
      uVar22 = CONCAT15(cStack_2243,CONCAT14(uStack_2244,uVar21));
      uVar28 = CONCAT13(cStack_223d,CONCAT12(uStack_223e,CONCAT11(cStack_223f,uStack_2240)));
      uVar29 = CONCAT15(cStack_223b,CONCAT14(uStack_223c,uVar28));
      sStack_10d6 = (short)((uint)uVar21 >> 0x10);
      sStack_10d4 = (short)((uint6)uVar22 >> 0x20);
      sStack_10d2 = (short)(CONCAT17(cStack_2241,CONCAT16(uStack_2242,uVar22)) >> 0x30);
      sStack_10ce = (short)((uint)uVar28 >> 0x10);
      sStack_10cc = (short)((uint6)uVar29 >> 0x20);
      sStack_10ca = (short)(CONCAT17(cStack_2239,CONCAT16(uStack_223a,uVar29)) >> 0x30);
      local_2308 = local_2308 + CONCAT11(cStack_2247,local_2248);
      sStack_f96 = sStack_f96 + sStack_10d6;
      sStack_f94 = sStack_f94 + sStack_10d4;
      sStack_f92 = sStack_f92 + sStack_10d2;
      sStack_2300 = sStack_2300 + CONCAT11(cStack_223f,uStack_2240);
      sStack_f8e = sStack_f8e + sStack_10ce;
      sStack_f8c = sStack_f8c + sStack_10cc;
      sStack_f8a = sStack_f8a + sStack_10ca;
      uVar21 = CONCAT13(cStack_2285,CONCAT12(uStack_2286,CONCAT11(cStack_2287,local_2288)));
      uVar22 = CONCAT15(cStack_2283,CONCAT14(uStack_2284,uVar21));
      uVar28 = CONCAT13(cStack_227d,CONCAT12(uStack_227e,CONCAT11(cStack_227f,uStack_2280)));
      uVar29 = CONCAT15(cStack_227b,CONCAT14(uStack_227c,uVar28));
      sStack_7b6 = (short)((uint)uVar21 >> 0x10);
      sStack_7b4 = (short)((uint6)uVar22 >> 0x20);
      sStack_7b2 = (short)(CONCAT17(cStack_2281,CONCAT16(uStack_2282,uVar22)) >> 0x30);
      sStack_7ae = (short)((uint)uVar28 >> 0x10);
      sStack_7ac = (short)((uint6)uVar29 >> 0x20);
      sStack_7aa = (short)(CONCAT17(cStack_2279,CONCAT16(uStack_227a,uVar29)) >> 0x30);
      local_22b8 = local_22b8 - CONCAT11(cStack_2287,local_2288);
      sStack_776 = sStack_776 - sStack_7b6;
      sStack_774 = sStack_774 - sStack_7b4;
      sStack_772 = sStack_772 - sStack_7b2;
      sStack_22b0 = sStack_22b0 - CONCAT11(cStack_227f,uStack_2280);
      sStack_76e = sStack_76e - sStack_7ae;
      sStack_76c = sStack_76c - sStack_7ac;
      sStack_76a = sStack_76a - sStack_7aa;
      uVar21 = CONCAT13(cStack_2215,CONCAT12(uStack_2216,CONCAT11(cStack_2217,local_2218)));
      uVar22 = CONCAT15(cStack_2213,CONCAT14(uStack_2214,uVar21));
      uVar28 = CONCAT13(cStack_220d,CONCAT12(uStack_220e,CONCAT11(cStack_220f,uStack_2210)));
      uVar29 = CONCAT15(cStack_220b,CONCAT14(uStack_220c,uVar28));
      sStack_7d6 = (short)((uint)uVar21 >> 0x10);
      sStack_7d4 = (short)((uint6)uVar22 >> 0x20);
      sStack_7d2 = (short)(CONCAT17(cStack_2211,CONCAT16(uStack_2212,uVar22)) >> 0x30);
      sStack_7ce = (short)((uint)uVar28 >> 0x10);
      sStack_7cc = (short)((uint6)uVar29 >> 0x20);
      sStack_7ca = (short)(CONCAT17(cStack_2209,CONCAT16(uStack_220a,uVar29)) >> 0x30);
      local_22c8 = local_22c8 - CONCAT11(cStack_2217,local_2218);
      sStack_796 = sStack_796 - sStack_7d6;
      sStack_794 = sStack_794 - sStack_7d4;
      sStack_792 = sStack_792 - sStack_7d2;
      sStack_22c0 = sStack_22c0 - CONCAT11(cStack_220f,uStack_2210);
      sStack_78e = sStack_78e - sStack_7ce;
      sStack_78c = sStack_78c - sStack_7cc;
      sStack_78a = sStack_78a - sStack_7ca;
      uVar35 = CONCAT13(cStack_21f5,CONCAT12(uStack_21f6,CONCAT11(cStack_21f7,local_21f8)));
      uVar36 = CONCAT15(cStack_21f3,CONCAT14(uStack_21f4,uVar35));
      uVar42 = CONCAT13(cStack_21ed,CONCAT12(uStack_21ee,CONCAT11(cStack_21ef,uStack_21f0)));
      uVar43 = CONCAT15(cStack_21eb,CONCAT14(uStack_21ec,uVar42));
      uVar49 = CONCAT13(cStack_21e5,CONCAT12(uStack_21e6,CONCAT11(cStack_21e7,local_21e8)));
      uVar50 = CONCAT15(cStack_21e3,CONCAT14(uStack_21e4,uVar49));
      uVar55 = CONCAT13(cStack_21dd,CONCAT12(uStack_21de,CONCAT11(cStack_21df,uStack_21e0)));
      uVar56 = CONCAT15(cStack_21db,CONCAT14(uStack_21dc,uVar55));
      uVar21 = CONCAT13(cStack_2205,CONCAT12(uStack_2206,CONCAT11(cStack_2207,local_2208)));
      uVar22 = CONCAT15(cStack_2203,CONCAT14(uStack_2204,uVar21));
      uVar28 = CONCAT13(cStack_21fd,CONCAT12(uStack_21fe,CONCAT11(cStack_21ff,uStack_2200)));
      uVar29 = CONCAT15(cStack_21fb,CONCAT14(uStack_21fc,uVar28));
      sStack_10e6 = (short)((uint)uVar49 >> 0x10);
      sStack_10e4 = (short)((uint6)uVar50 >> 0x20);
      sStack_10e2 = (short)(CONCAT17(cStack_21e1,CONCAT16(uStack_21e2,uVar50)) >> 0x30);
      sStack_10de = (short)((uint)uVar55 >> 0x10);
      sStack_10dc = (short)((uint6)uVar56 >> 0x20);
      sStack_10da = (short)(CONCAT17(cStack_21d9,CONCAT16(uStack_21da,uVar56)) >> 0x30);
      sStack_10f6 = (short)((uint)uVar21 >> 0x10);
      sStack_10f4 = (short)((uint6)uVar22 >> 0x20);
      sStack_10f2 = (short)(CONCAT17(cStack_2201,CONCAT16(uStack_2202,uVar22)) >> 0x30);
      sStack_10ee = (short)((uint)uVar28 >> 0x10);
      sStack_10ec = (short)((uint6)uVar29 >> 0x20);
      sStack_10ea = (short)(CONCAT17(cStack_21f9,CONCAT16(uStack_21fa,uVar29)) >> 0x30);
      sStack_1106 = (short)((uint)uVar35 >> 0x10);
      sStack_1104 = (short)((uint6)uVar36 >> 0x20);
      sStack_1102 = (short)(CONCAT17(cStack_21f1,CONCAT16(uStack_21f2,uVar36)) >> 0x30);
      sStack_10fe = (short)((uint)uVar42 >> 0x10);
      sStack_10fc = (short)((uint6)uVar43 >> 0x20);
      sStack_10fa = (short)(CONCAT17(cStack_21e9,CONCAT16(uStack_21ea,uVar43)) >> 0x30);
      uVar144 = (ushort)(local_22b8 +
                        local_22f8 +
                        CONCAT11(cStack_21f7,local_21f8) +
                        CONCAT11(cStack_21e7,local_21e8) + CONCAT11(cStack_2207,local_2208)) >> 4;
      uVar143 = (ushort)(sStack_776 + sStack_f76 + sStack_1106 + sStack_10e6 + sStack_10f6) >> 4;
      uVar153 = (ushort)(sStack_774 + sStack_f74 + sStack_1104 + sStack_10e4 + sStack_10f4) >> 4;
      uVar158 = (ushort)(sStack_772 + sStack_f72 + sStack_1102 + sStack_10e2 + sStack_10f2) >> 4;
      uVar163 = (ushort)(sStack_22b0 +
                        sStack_22f0 +
                        CONCAT11(cStack_21ef,uStack_21f0) +
                        CONCAT11(cStack_21df,uStack_21e0) + CONCAT11(cStack_21ff,uStack_2200)) >> 4;
      uVar169 = (ushort)(sStack_76e + sStack_f6e + sStack_10fe + sStack_10de + sStack_10ee) >> 4;
      uVar175 = (ushort)(sStack_76c + sStack_f6c + sStack_10fc + sStack_10dc + sStack_10ec) >> 4;
      uVar180 = (ushort)(sStack_76a + sStack_f6a + sStack_10fa + sStack_10da + sStack_10ea) >> 4;
      uVar35 = CONCAT13(cStack_2265,CONCAT12(uStack_2266,CONCAT11(cStack_2267,local_2268)));
      uVar36 = CONCAT15(cStack_2263,CONCAT14(uStack_2264,uVar35));
      uVar42 = CONCAT13(cStack_225d,CONCAT12(uStack_225e,CONCAT11(cStack_225f,uStack_2260)));
      uVar43 = CONCAT15(cStack_225b,CONCAT14(uStack_225c,uVar42));
      uVar21 = CONCAT13(cStack_2275,CONCAT12(uStack_2276,CONCAT11(cStack_2277,local_2278)));
      uVar22 = CONCAT15(cStack_2273,CONCAT14(uStack_2274,uVar21));
      uVar28 = CONCAT13(cStack_226d,CONCAT12(uStack_226e,CONCAT11(cStack_226f,uStack_2270)));
      uVar29 = CONCAT15(cStack_226b,CONCAT14(uStack_226c,uVar28));
      uVar49 = CONCAT13(cStack_2255,CONCAT12(uStack_2256,CONCAT11(cStack_2257,local_2258)));
      uVar50 = CONCAT15(cStack_2253,CONCAT14(uStack_2254,uVar49));
      uVar55 = CONCAT13(cStack_224d,CONCAT12(uStack_224e,CONCAT11(cStack_224f,uStack_2250)));
      uVar56 = CONCAT15(cStack_224b,CONCAT14(uStack_224c,uVar55));
      sStack_1166 = (short)((uint)uVar21 >> 0x10);
      sStack_1164 = (short)((uint6)uVar22 >> 0x20);
      sStack_1162 = (short)(CONCAT17(cStack_2271,CONCAT16(uStack_2272,uVar22)) >> 0x30);
      sStack_115e = (short)((uint)uVar28 >> 0x10);
      sStack_115c = (short)((uint6)uVar29 >> 0x20);
      sStack_115a = (short)(CONCAT17(cStack_2269,CONCAT16(uStack_226a,uVar29)) >> 0x30);
      sStack_1176 = (short)((uint)uVar49 >> 0x10);
      sStack_1174 = (short)((uint6)uVar50 >> 0x20);
      sStack_1172 = (short)(CONCAT17(cStack_2251,CONCAT16(uStack_2252,uVar50)) >> 0x30);
      sStack_116e = (short)((uint)uVar55 >> 0x10);
      sStack_116c = (short)((uint6)uVar56 >> 0x20);
      sStack_116a = (short)(CONCAT17(cStack_2249,CONCAT16(uStack_224a,uVar56)) >> 0x30);
      sStack_1186 = (short)((uint)uVar35 >> 0x10);
      sStack_1184 = (short)((uint6)uVar36 >> 0x20);
      sStack_1182 = (short)(CONCAT17(cStack_2261,CONCAT16(uStack_2262,uVar36)) >> 0x30);
      sStack_117e = (short)((uint)uVar42 >> 0x10);
      sStack_117c = (short)((uint6)uVar43 >> 0x20);
      sStack_117a = (short)(CONCAT17(cStack_2259,CONCAT16(uStack_225a,uVar43)) >> 0x30);
      uVar142 = (ushort)(local_22c8 +
                        local_2308 +
                        CONCAT11(cStack_2267,local_2268) +
                        CONCAT11(cStack_2277,local_2278) + CONCAT11(cStack_2257,local_2258)) >> 4;
      uVar152 = (ushort)(sStack_796 + sStack_f96 + sStack_1186 + sStack_1166 + sStack_1176) >> 4;
      uVar157 = (ushort)(sStack_794 + sStack_f94 + sStack_1184 + sStack_1164 + sStack_1174) >> 4;
      uVar162 = (ushort)(sStack_792 + sStack_f92 + sStack_1182 + sStack_1162 + sStack_1172) >> 4;
      uVar168 = (ushort)(sStack_22c0 +
                        sStack_2300 +
                        CONCAT11(cStack_225f,uStack_2260) +
                        CONCAT11(cStack_226f,uStack_2270) + CONCAT11(cStack_224f,uStack_2250)) >> 4;
      uVar174 = (ushort)(sStack_78e + sStack_f8e + sStack_117e + sStack_115e + sStack_116e) >> 4;
      uVar179 = (ushort)(sStack_78c + sStack_f8c + sStack_117c + sStack_115c + sStack_116c) >> 4;
      uVar184 = (ushort)(sStack_78a + sStack_f8a + sStack_117a + sStack_115a + sStack_116a) >> 4;
      local_2128 = CONCAT17((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 - (0xff < uVar180),
                            CONCAT16((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                     (0xff < uVar175),
                                     CONCAT15((uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                              (0xff < uVar169),
                                              CONCAT14((uVar163 != 0) * (uVar163 < 0x100) *
                                                       (char)uVar163 - (0xff < uVar163),
                                                       CONCAT13((uVar158 != 0) * (uVar158 < 0x100) *
                                                                (char)uVar158 - (0xff < uVar158),
                                                                CONCAT12((uVar153 != 0) *
                                                                         (uVar153 < 0x100) *
                                                                         (char)uVar153 -
                                                                         (0xff < uVar153),
                                                                         CONCAT11((uVar143 != 0) *
                                                                                  (uVar143 < 0x100)
                                                                                  * (char)uVar143 -
                                                                                  (0xff < uVar143),
                                                                                  (uVar144 != 0) *
                                                                                  (uVar144 < 0x100)
                                                                                  * (char)uVar144 -
                                                                                  (0xff < uVar144)))
                                                               )))));
      uStack_2120 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                             CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                      (0xff < uVar179),
                                      CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                               (0xff < uVar174),
                                               CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                        (char)uVar168 - (0xff < uVar168),
                                                        CONCAT13((uVar162 != 0) * (uVar162 < 0x100)
                                                                 * (char)uVar162 - (0xff < uVar162),
                                                                 CONCAT12((uVar157 != 0) *
                                                                          (uVar157 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < uVar157),
                                                                          CONCAT11((uVar152 != 0) *
                                                                                   (uVar152 < 0x100)
                                                                                   * (char)uVar152 -
                                                                                   (0xff < uVar152),
                                                                                   (uVar142 != 0) *
                                                                                   (uVar142 < 0x100)
                                                                                   * (char)uVar142 -
                                                                                   (0xff < uVar142))
                                                                         ))))));
      uVar21 = CONCAT13(cStack_21d5,CONCAT12(uStack_21d6,CONCAT11(cStack_21d7,local_21d8)));
      uVar22 = CONCAT15(cStack_21d3,CONCAT14(uStack_21d4,uVar21));
      uVar28 = CONCAT13(cStack_21cd,CONCAT12(uStack_21ce,CONCAT11(cStack_21cf,uStack_21d0)));
      uVar29 = CONCAT15(cStack_21cb,CONCAT14(uStack_21cc,uVar28));
      sStack_11f6 = (short)((uint)uVar21 >> 0x10);
      sStack_11f4 = (short)((uint6)uVar22 >> 0x20);
      sStack_11f2 = (short)(CONCAT17(cStack_21d1,CONCAT16(uStack_21d2,uVar22)) >> 0x30);
      sStack_11ee = (short)((uint)uVar28 >> 0x10);
      sStack_11ec = (short)((uint6)uVar29 >> 0x20);
      sStack_11ea = (short)(CONCAT17(cStack_21c9,CONCAT16(uStack_21ca,uVar29)) >> 0x30);
      uVar21 = CONCAT13(cStack_2245,CONCAT12(uStack_2246,CONCAT11(cStack_2247,local_2248)));
      uVar22 = CONCAT15(cStack_2243,CONCAT14(uStack_2244,uVar21));
      uVar28 = CONCAT13(cStack_223d,CONCAT12(uStack_223e,CONCAT11(cStack_223f,uStack_2240)));
      uVar29 = CONCAT15(cStack_223b,CONCAT14(uStack_223c,uVar28));
      sStack_1216 = (short)((uint)uVar21 >> 0x10);
      sStack_1214 = (short)((uint6)uVar22 >> 0x20);
      sStack_1212 = (short)(CONCAT17(cStack_2241,CONCAT16(uStack_2242,uVar22)) >> 0x30);
      sStack_120e = (short)((uint)uVar28 >> 0x10);
      sStack_120c = (short)((uint6)uVar29 >> 0x20);
      sStack_120a = (short)(CONCAT17(cStack_2239,CONCAT16(uStack_223a,uVar29)) >> 0x30);
      uVar21 = CONCAT13(cStack_2295,CONCAT12(uStack_2296,CONCAT11(cStack_2297,local_2298)));
      uVar22 = CONCAT15(cStack_2293,CONCAT14(uStack_2294,uVar21));
      uVar28 = CONCAT13(cStack_228d,CONCAT12(uStack_228e,CONCAT11(cStack_228f,uStack_2290)));
      uVar29 = CONCAT15(cStack_228b,CONCAT14(uStack_228c,uVar28));
      sStack_7f6 = (short)((uint)uVar21 >> 0x10);
      sStack_7f4 = (short)((uint6)uVar22 >> 0x20);
      sStack_7f2 = (short)(CONCAT17(cStack_2291,CONCAT16(uStack_2292,uVar22)) >> 0x30);
      sStack_7ee = (short)((uint)uVar28 >> 0x10);
      sStack_7ec = (short)((uint6)uVar29 >> 0x20);
      sStack_7ea = (short)(CONCAT17(cStack_2289,CONCAT16(uStack_228a,uVar29)) >> 0x30);
      uVar21 = CONCAT13(cStack_2225,CONCAT12(uStack_2226,CONCAT11(cStack_2227,local_2228)));
      uVar22 = CONCAT15(cStack_2223,CONCAT14(uStack_2224,uVar21));
      uVar28 = CONCAT13(cStack_221d,CONCAT12(uStack_221e,CONCAT11(cStack_221f,uStack_2220)));
      uVar29 = CONCAT15(cStack_221b,CONCAT14(uStack_221c,uVar28));
      sStack_816 = (short)((uint)uVar21 >> 0x10);
      sStack_814 = (short)((uint6)uVar22 >> 0x20);
      sStack_812 = (short)(CONCAT17(cStack_2221,CONCAT16(uStack_2222,uVar22)) >> 0x30);
      sStack_80e = (short)((uint)uVar28 >> 0x10);
      sStack_80c = (short)((uint6)uVar29 >> 0x20);
      sStack_80a = (short)(CONCAT17(cStack_2219,CONCAT16(uStack_221a,uVar29)) >> 0x30);
      uVar35 = CONCAT13(cStack_21e5,CONCAT12(uStack_21e6,CONCAT11(cStack_21e7,local_21e8)));
      uVar36 = CONCAT15(cStack_21e3,CONCAT14(uStack_21e4,uVar35));
      uVar42 = CONCAT13(cStack_21dd,CONCAT12(uStack_21de,CONCAT11(cStack_21df,uStack_21e0)));
      uVar43 = CONCAT15(cStack_21db,CONCAT14(uStack_21dc,uVar42));
      uVar49 = CONCAT13(cStack_21d5,CONCAT12(uStack_21d6,CONCAT11(cStack_21d7,local_21d8)));
      uVar50 = CONCAT15(cStack_21d3,CONCAT14(uStack_21d4,uVar49));
      uVar55 = CONCAT13(cStack_21cd,CONCAT12(uStack_21ce,CONCAT11(cStack_21cf,uStack_21d0)));
      uVar56 = CONCAT15(cStack_21cb,CONCAT14(uStack_21cc,uVar55));
      uVar21 = CONCAT13(cStack_21f5,CONCAT12(uStack_21f6,CONCAT11(cStack_21f7,local_21f8)));
      uVar22 = CONCAT15(cStack_21f3,CONCAT14(uStack_21f4,uVar21));
      uVar28 = CONCAT13(cStack_21ed,CONCAT12(uStack_21ee,CONCAT11(cStack_21ef,uStack_21f0)));
      uVar29 = CONCAT15(cStack_21eb,CONCAT14(uStack_21ec,uVar28));
      sStack_1226 = (short)((uint)uVar49 >> 0x10);
      sStack_1224 = (short)((uint6)uVar50 >> 0x20);
      sStack_1222 = (short)(CONCAT17(cStack_21d1,CONCAT16(uStack_21d2,uVar50)) >> 0x30);
      sStack_121e = (short)((uint)uVar55 >> 0x10);
      sStack_121c = (short)((uint6)uVar56 >> 0x20);
      sStack_121a = (short)(CONCAT17(cStack_21c9,CONCAT16(uStack_21ca,uVar56)) >> 0x30);
      sStack_1236 = (short)((uint)uVar21 >> 0x10);
      sStack_1234 = (short)((uint6)uVar22 >> 0x20);
      sStack_1232 = (short)(CONCAT17(cStack_21f1,CONCAT16(uStack_21f2,uVar22)) >> 0x30);
      sStack_122e = (short)((uint)uVar28 >> 0x10);
      sStack_122c = (short)((uint6)uVar29 >> 0x20);
      sStack_122a = (short)(CONCAT17(cStack_21e9,CONCAT16(uStack_21ea,uVar29)) >> 0x30);
      sStack_1246 = (short)((uint)uVar35 >> 0x10);
      sStack_1244 = (short)((uint6)uVar36 >> 0x20);
      sStack_1242 = (short)(CONCAT17(cStack_21e1,CONCAT16(uStack_21e2,uVar36)) >> 0x30);
      sStack_123e = (short)((uint)uVar42 >> 0x10);
      sStack_123c = (short)((uint6)uVar43 >> 0x20);
      sStack_123a = (short)(CONCAT17(cStack_21d9,CONCAT16(uStack_21da,uVar43)) >> 0x30);
      uVar144 = (ushort)((local_22b8 - CONCAT11(cStack_2297,local_2298)) +
                        local_22f8 + CONCAT11(cStack_21d7,local_21d8) +
                        CONCAT11(cStack_21e7,local_21e8) +
                        CONCAT11(cStack_21d7,local_21d8) + CONCAT11(cStack_21f7,local_21f8)) >> 4;
      uVar143 = (ushort)((sStack_776 - sStack_7f6) +
                        sStack_f76 + sStack_11f6 + sStack_1246 + sStack_1226 + sStack_1236) >> 4;
      uVar153 = (ushort)((sStack_774 - sStack_7f4) +
                        sStack_f74 + sStack_11f4 + sStack_1244 + sStack_1224 + sStack_1234) >> 4;
      uVar158 = (ushort)((sStack_772 - sStack_7f2) +
                        sStack_f72 + sStack_11f2 + sStack_1242 + sStack_1222 + sStack_1232) >> 4;
      uVar163 = (ushort)((sStack_22b0 - CONCAT11(cStack_228f,uStack_2290)) +
                        sStack_22f0 + CONCAT11(cStack_21cf,uStack_21d0) +
                        CONCAT11(cStack_21df,uStack_21e0) +
                        CONCAT11(cStack_21cf,uStack_21d0) + CONCAT11(cStack_21ef,uStack_21f0)) >> 4;
      uVar169 = (ushort)((sStack_76e - sStack_7ee) +
                        sStack_f6e + sStack_11ee + sStack_123e + sStack_121e + sStack_122e) >> 4;
      uVar175 = (ushort)((sStack_76c - sStack_7ec) +
                        sStack_f6c + sStack_11ec + sStack_123c + sStack_121c + sStack_122c) >> 4;
      uVar180 = (ushort)((sStack_76a - sStack_7ea) +
                        sStack_f6a + sStack_11ea + sStack_123a + sStack_121a + sStack_122a) >> 4;
      uVar35 = CONCAT13(cStack_2255,CONCAT12(uStack_2256,CONCAT11(cStack_2257,local_2258)));
      uVar36 = CONCAT15(cStack_2253,CONCAT14(uStack_2254,uVar35));
      uVar42 = CONCAT13(cStack_224d,CONCAT12(uStack_224e,CONCAT11(cStack_224f,uStack_2250)));
      uVar43 = CONCAT15(cStack_224b,CONCAT14(uStack_224c,uVar42));
      uVar49 = CONCAT13(cStack_2245,CONCAT12(uStack_2246,CONCAT11(cStack_2247,local_2248)));
      uVar50 = CONCAT15(cStack_2243,CONCAT14(uStack_2244,uVar49));
      uVar55 = CONCAT13(cStack_223d,CONCAT12(uStack_223e,CONCAT11(cStack_223f,uStack_2240)));
      uVar56 = CONCAT15(cStack_223b,CONCAT14(uStack_223c,uVar55));
      uVar21 = CONCAT13(cStack_2265,CONCAT12(uStack_2266,CONCAT11(cStack_2267,local_2268)));
      uVar22 = CONCAT15(cStack_2263,CONCAT14(uStack_2264,uVar21));
      uVar28 = CONCAT13(cStack_225d,CONCAT12(uStack_225e,CONCAT11(cStack_225f,uStack_2260)));
      uVar29 = CONCAT15(cStack_225b,CONCAT14(uStack_225c,uVar28));
      sStack_12a6 = (short)((uint)uVar49 >> 0x10);
      sStack_12a4 = (short)((uint6)uVar50 >> 0x20);
      sStack_12a2 = (short)(CONCAT17(cStack_2241,CONCAT16(uStack_2242,uVar50)) >> 0x30);
      sStack_129e = (short)((uint)uVar55 >> 0x10);
      sStack_129c = (short)((uint6)uVar56 >> 0x20);
      sStack_129a = (short)(CONCAT17(cStack_2239,CONCAT16(uStack_223a,uVar56)) >> 0x30);
      sStack_12b6 = (short)((uint)uVar21 >> 0x10);
      sStack_12b4 = (short)((uint6)uVar22 >> 0x20);
      sStack_12b2 = (short)(CONCAT17(cStack_2261,CONCAT16(uStack_2262,uVar22)) >> 0x30);
      sStack_12ae = (short)((uint)uVar28 >> 0x10);
      sStack_12ac = (short)((uint6)uVar29 >> 0x20);
      sStack_12aa = (short)(CONCAT17(cStack_2259,CONCAT16(uStack_225a,uVar29)) >> 0x30);
      sStack_12c6 = (short)((uint)uVar35 >> 0x10);
      sStack_12c4 = (short)((uint6)uVar36 >> 0x20);
      sStack_12c2 = (short)(CONCAT17(cStack_2251,CONCAT16(uStack_2252,uVar36)) >> 0x30);
      sStack_12be = (short)((uint)uVar42 >> 0x10);
      sStack_12bc = (short)((uint6)uVar43 >> 0x20);
      sStack_12ba = (short)(CONCAT17(cStack_2249,CONCAT16(uStack_224a,uVar43)) >> 0x30);
      uVar142 = (ushort)((local_22c8 - CONCAT11(cStack_2227,local_2228)) +
                        local_2308 + CONCAT11(cStack_2247,local_2248) +
                        CONCAT11(cStack_2257,local_2258) +
                        CONCAT11(cStack_2247,local_2248) + CONCAT11(cStack_2267,local_2268)) >> 4;
      uVar152 = (ushort)((sStack_796 - sStack_816) +
                        sStack_f96 + sStack_1216 + sStack_12c6 + sStack_12a6 + sStack_12b6) >> 4;
      uVar157 = (ushort)((sStack_794 - sStack_814) +
                        sStack_f94 + sStack_1214 + sStack_12c4 + sStack_12a4 + sStack_12b4) >> 4;
      uVar162 = (ushort)((sStack_792 - sStack_812) +
                        sStack_f92 + sStack_1212 + sStack_12c2 + sStack_12a2 + sStack_12b2) >> 4;
      uVar168 = (ushort)((sStack_22c0 - CONCAT11(cStack_221f,uStack_2220)) +
                        sStack_2300 + CONCAT11(cStack_223f,uStack_2240) +
                        CONCAT11(cStack_224f,uStack_2250) +
                        CONCAT11(cStack_223f,uStack_2240) + CONCAT11(cStack_225f,uStack_2260)) >> 4;
      uVar174 = (ushort)((sStack_78e - sStack_80e) +
                        sStack_f8e + sStack_120e + sStack_12be + sStack_129e + sStack_12ae) >> 4;
      uVar179 = (ushort)((sStack_78c - sStack_80c) +
                        sStack_f8c + sStack_120c + sStack_12bc + sStack_129c + sStack_12ac) >> 4;
      uVar184 = (ushort)((sStack_78a - sStack_80a) +
                        sStack_f8a + sStack_120a + sStack_12ba + sStack_129a + sStack_12aa) >> 4;
      local_2118 = CONCAT17((uVar180 != 0) * (uVar180 < 0x100) * (char)uVar180 - (0xff < uVar180),
                            CONCAT16((uVar175 != 0) * (uVar175 < 0x100) * (char)uVar175 -
                                     (0xff < uVar175),
                                     CONCAT15((uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                              (0xff < uVar169),
                                              CONCAT14((uVar163 != 0) * (uVar163 < 0x100) *
                                                       (char)uVar163 - (0xff < uVar163),
                                                       CONCAT13((uVar158 != 0) * (uVar158 < 0x100) *
                                                                (char)uVar158 - (0xff < uVar158),
                                                                CONCAT12((uVar153 != 0) *
                                                                         (uVar153 < 0x100) *
                                                                         (char)uVar153 -
                                                                         (0xff < uVar153),
                                                                         CONCAT11((uVar143 != 0) *
                                                                                  (uVar143 < 0x100)
                                                                                  * (char)uVar143 -
                                                                                  (0xff < uVar143),
                                                                                  (uVar144 != 0) *
                                                                                  (uVar144 < 0x100)
                                                                                  * (char)uVar144 -
                                                                                  (0xff < uVar144)))
                                                               )))));
      uStack_2110 = CONCAT17((uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184),
                             CONCAT16((uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 -
                                      (0xff < uVar179),
                                      CONCAT15((uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 -
                                               (0xff < uVar174),
                                               CONCAT14((uVar168 != 0) * (uVar168 < 0x100) *
                                                        (char)uVar168 - (0xff < uVar168),
                                                        CONCAT13((uVar162 != 0) * (uVar162 < 0x100)
                                                                 * (char)uVar162 - (0xff < uVar162),
                                                                 CONCAT12((uVar157 != 0) *
                                                                          (uVar157 < 0x100) *
                                                                          (char)uVar157 -
                                                                          (0xff < uVar157),
                                                                          CONCAT11((uVar152 != 0) *
                                                                                   (uVar152 < 0x100)
                                                                                   * (char)uVar152 -
                                                                                   (0xff < uVar152),
                                                                                   (uVar142 != 0) *
                                                                                   (uVar142 < 0x100)
                                                                                   * (char)uVar142 -
                                                                                   (0xff < uVar142))
                                                                         ))))));
      uStack_2030 = local_2038;
      puVar19 = local_1f98 + 1;
      uVar8 = ~local_2038;
      *local_1f98 = ~local_2038 & *local_1f98;
      puVar18[1] = uVar8 & *puVar19;
      uStack_2110 = uStack_2030 & uStack_2110;
      *local_1f98 = *local_1f98 | local_2038 & local_2118;
      local_1f98[1] = local_1f98[1] | uStack_2110;
      puVar19 = local_1fa0;
      puVar18 = local_1fa0 + 1;
      uVar8 = ~uStack_2030;
      *local_1fa0 = ~local_2038 & *local_1fa0;
      puVar19[1] = uVar8 & *puVar18;
      uStack_2120 = uStack_2030 & uStack_2120;
      *local_1fa0 = *local_1fa0 | local_2038 & local_2128;
      local_1fa0[1] = local_1fa0[1] | uStack_2120;
      puVar19 = local_1fa8;
      puVar18 = local_1fa8 + 1;
      uVar8 = ~uStack_2030;
      *local_1fa8 = ~local_2038 & *local_1fa8;
      puVar19[1] = uVar8 & *puVar18;
      uStack_2130 = uStack_2030 & uStack_2130;
      *local_1fa8 = *local_1fa8 | local_2038 & local_2138;
      local_1fa8[1] = local_1fa8[1] | uStack_2130;
      puVar19 = local_1fb0;
      puVar18 = local_1fb0 + 1;
      uVar8 = ~uStack_2030;
      *local_1fb0 = ~local_2038 & *local_1fb0;
      puVar19[1] = uVar8 & *puVar18;
      uStack_2140 = uStack_2030 & uStack_2140;
      *local_1fb0 = *local_1fb0 | local_2038 & local_2148;
      local_1fb0[1] = local_1fb0[1] | uStack_2140;
      puVar19 = local_1fb8;
      puVar18 = local_1fb8 + 1;
      uVar8 = ~uStack_2030;
      *local_1fb8 = ~local_2038 & *local_1fb8;
      puVar19[1] = uVar8 & *puVar18;
      uStack_2150 = uStack_2030 & uStack_2150;
      *local_1fb8 = *local_1fb8 | local_2038 & local_2158;
      local_1fb8[1] = local_1fb8[1] | uStack_2150;
      puVar18 = local_1fc0;
      local_1518 = (uint)local_2038;
      uStack_1514 = local_2038._4_4_;
      uStack_1510 = local_2038._8_4_;
      uStack_150c = local_2038._12_4_;
      local_1528 = (uint)*local_1fc0;
      uStack_1524 = (uint)(*local_1fc0 >> 0x20);
      uStack_1520 = (uint)local_1fc0[1];
      uStack_151c = (uint)(local_1fc0[1] >> 0x20);
      *(uint *)local_1fc0 = (local_1518 ^ 0xffffffff) & local_1528;
      *(uint *)((long)puVar18 + 4) = (uStack_1514 ^ 0xffffffff) & uStack_1524;
      *(uint *)(puVar18 + 1) = (uStack_1510 ^ 0xffffffff) & uStack_1520;
      *(uint *)((long)puVar18 + 0xc) = (uStack_150c ^ 0xffffffff) & uStack_151c;
      *local_1fc0 = *local_1fc0 | local_2038 & local_2168;
      local_1fc0[1] = local_1fc0[1] | uStack_2030 & uStack_2160;
    }
  }
  *(ulong *)((long)local_2800 - (long)local_2804) = local_2898;
  *local_2800 = uStack_2890;
  *(ulong *)((long)local_2800 - (long)(local_2804 * 2)) = local_2888;
  *(undefined8 *)((long)local_2800 + (long)local_2804) = uStack_2880;
  *(ulong *)((long)local_2800 - (long)(local_2804 * 3)) = local_2878;
  *(undefined8 *)((long)local_2800 + (long)(local_2804 * 2)) = uStack_2870;
  *(ulong *)((long)local_2800 - (long)(local_2804 << 2)) = local_2868;
  *(undefined8 *)((long)local_2800 + (long)(local_2804 * 3)) = uStack_2860;
  *(ulong *)((long)local_2800 - (long)(local_2804 * 5)) = local_2858;
  *(undefined8 *)((long)local_2800 + (long)(local_2804 << 2)) = uStack_2850;
  *(ulong *)((long)local_2800 - (long)(local_2804 * 6)) = local_2848;
  *(undefined8 *)((long)local_2800 + (long)(local_2804 * 5)) = uStack_2840;
  return;
}

Assistant:

void aom_lpf_horizontal_14_dual_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0,
                                     const unsigned char *_blimit1,
                                     const unsigned char *_limit1,
                                     const unsigned char *_thresh1) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_blimit0),
                         _mm_load_si128((const __m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_limit0),
                                     _mm_load_si128((const __m128i *)_limit1));
  __m128i thresh =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_thresh0),
                         _mm_load_si128((const __m128i *)_thresh1));

  q4p4 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 5 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 4 * p)));
  q3p3 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 4 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 3 * p)));
  q2p2 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 3 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 2 * p)));
  q1p1 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 2 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 1 * p)));

  q0p0 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 1 * p)),
                            _mm_loadl_epi64((__m128i *)(s - 0 * p)));

  q5p5 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 6 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 5 * p)));

  q6p6 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 7 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 6 * p)));

  lpf_internal_14_dual_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0,
                            &blimit, &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), q0p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), _mm_srli_si128(q0p0, 8));
  _mm_storel_epi64((__m128i *)(s - 2 * p), q1p1);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1p1, 8));
  _mm_storel_epi64((__m128i *)(s - 3 * p), q2p2);
  _mm_storel_epi64((__m128i *)(s + 2 * p), _mm_srli_si128(q2p2, 8));
  _mm_storel_epi64((__m128i *)(s - 4 * p), q3p3);
  _mm_storel_epi64((__m128i *)(s + 3 * p), _mm_srli_si128(q3p3, 8));
  _mm_storel_epi64((__m128i *)(s - 5 * p), q4p4);
  _mm_storel_epi64((__m128i *)(s + 4 * p), _mm_srli_si128(q4p4, 8));
  _mm_storel_epi64((__m128i *)(s - 6 * p), q5p5);
  _mm_storel_epi64((__m128i *)(s + 5 * p), _mm_srli_si128(q5p5, 8));
}